

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx::CurveNiIntersectorK<8,4>::
     intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [12];
  undefined1 (*pauVar2) [28];
  float *pfVar3;
  undefined1 (*pauVar4) [28];
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Primitive PVar16;
  uint uVar17;
  uint uVar18;
  undefined4 uVar19;
  Geometry *pGVar20;
  RTCFilterFunctionN p_Var21;
  uint uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined8 uVar114;
  undefined8 uVar115;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [28];
  undefined1 auVar121 [28];
  undefined1 auVar122 [28];
  undefined1 auVar123 [28];
  undefined1 auVar124 [28];
  undefined1 auVar125 [28];
  undefined1 auVar126 [24];
  undefined8 uVar127;
  undefined8 uVar128;
  undefined8 uVar129;
  undefined8 uVar130;
  uint uVar131;
  uint uVar132;
  long lVar133;
  ulong uVar134;
  LinearSpace3fa *pLVar135;
  long lVar136;
  ulong uVar137;
  float fVar138;
  undefined1 auVar140 [16];
  float fVar157;
  float fVar158;
  float fVar162;
  float fVar164;
  float fVar166;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar160;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar141 [16];
  float fVar139;
  float fVar159;
  float fVar161;
  float fVar163;
  float fVar165;
  float fVar167;
  float fVar168;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  float fVar169;
  float fVar185;
  float fVar186;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar187;
  float fVar191;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar210 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar206;
  undefined1 auVar204 [32];
  float fVar207;
  undefined1 auVar205 [32];
  float fVar208;
  float fVar223;
  undefined1 auVar209 [16];
  float fVar221;
  float fVar222;
  float fVar224;
  float fVar226;
  float fVar228;
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar225;
  float fVar227;
  float fVar229;
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  float fVar230;
  float fVar231;
  undefined1 auVar233 [16];
  float fVar239;
  float fVar241;
  float fVar243;
  undefined1 auVar232 [16];
  float fVar240;
  float fVar242;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  float fVar248;
  float fVar249;
  float fVar258;
  float fVar260;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar253 [32];
  float fVar262;
  undefined1 auVar254 [32];
  float fVar259;
  float fVar261;
  float fVar263;
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar268 [16];
  float fVar267;
  float fVar277;
  float fVar278;
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  float fVar279;
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  float fVar280;
  undefined1 auVar276 [32];
  float fVar281;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [64];
  undefined1 auVar296 [16];
  float fVar304;
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  float fVar303;
  float fVar305;
  undefined1 auVar301 [32];
  undefined1 auVar302 [64];
  float fVar306;
  float fVar307;
  float fVar313;
  float fVar315;
  float fVar317;
  undefined1 auVar308 [32];
  float fVar314;
  float fVar316;
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  float fVar318;
  float fVar319;
  float fVar326;
  float fVar328;
  float fVar330;
  undefined1 auVar320 [32];
  float fVar327;
  float fVar329;
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  float fVar331;
  undefined1 auVar324 [32];
  undefined1 auVar325 [64];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  float in_register_0000151c;
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  float fVar341;
  undefined1 auVar342 [16];
  float fVar347;
  float fVar348;
  undefined1 auVar343 [32];
  float fVar349;
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  float fVar350;
  float fVar354;
  float fVar355;
  float fVar356;
  float in_register_0000159c;
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  float fVar357;
  float fVar361;
  float fVar362;
  float fVar363;
  float in_register_000015dc;
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float local_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  float local_840;
  float fStack_83c;
  float fStack_838;
  float fStack_834;
  undefined1 local_830 [16];
  LinearSpace3fa *local_818;
  Precalculations *local_810;
  Primitive *local_808;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  RTCFilterFunctionNArguments local_7d0;
  undefined1 local_7a0 [16];
  undefined1 auStack_790 [16];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 (*local_748) [16];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  undefined1 auStack_710 [8];
  float fStack_708;
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  undefined1 auStack_6f0 [8];
  float fStack_6e8;
  undefined1 local_6e0 [8];
  undefined8 uStack_6d8;
  undefined1 auStack_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [2] [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 auStack_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  RTCHitN local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [8];
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [8];
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  uint local_2a0;
  uint local_29c;
  undefined1 local_290 [16];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  float local_220 [4];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  undefined1 auVar353 [64];
  
  PVar16 = prim[1];
  uVar137 = (ulong)(byte)PVar16;
  lVar133 = uVar137 * 5;
  auVar27 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar27 = vinsertps_avx(auVar27,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar233 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar233 = vinsertps_avx(auVar233,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar208 = *(float *)(prim + uVar137 * 0x19 + 0x12);
  auVar27 = vsubps_avx(auVar27,*(undefined1 (*) [16])(prim + uVar137 * 0x19 + 6));
  auVar170._0_4_ = fVar208 * auVar27._0_4_;
  auVar170._4_4_ = fVar208 * auVar27._4_4_;
  auVar170._8_4_ = fVar208 * auVar27._8_4_;
  auVar170._12_4_ = fVar208 * auVar27._12_4_;
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 4 + 6)));
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 4 + 10)));
  auVar250._0_4_ = fVar208 * auVar233._0_4_;
  auVar250._4_4_ = fVar208 * auVar233._4_4_;
  auVar250._8_4_ = fVar208 * auVar233._8_4_;
  auVar250._12_4_ = fVar208 * auVar233._12_4_;
  auVar148._16_16_ = auVar196;
  auVar148._0_16_ = auVar27;
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar133 + 6)));
  auVar148 = vcvtdq2ps_avx(auVar148);
  auVar233 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar133 + 10)));
  auVar201._16_16_ = auVar233;
  auVar201._0_16_ = auVar27;
  auVar154 = vcvtdq2ps_avx(auVar201);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 6 + 6)));
  auVar233 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 6 + 10)));
  auVar211._16_16_ = auVar233;
  auVar211._0_16_ = auVar27;
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 0xb + 6)));
  auVar233 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 0xb + 10)));
  auVar219 = vcvtdq2ps_avx(auVar211);
  auVar212._16_16_ = auVar233;
  auVar212._0_16_ = auVar27;
  auVar23 = vcvtdq2ps_avx(auVar212);
  uVar134 = (ulong)((uint)(byte)PVar16 * 0xc);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 + 6)));
  auVar233 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 + 10)));
  auVar269._16_16_ = auVar233;
  auVar269._0_16_ = auVar27;
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 + uVar137 + 6)));
  auVar322 = vcvtdq2ps_avx(auVar269);
  auVar233 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 + uVar137 + 10)));
  auVar282._16_16_ = auVar233;
  auVar282._0_16_ = auVar27;
  lVar136 = uVar137 * 9;
  uVar134 = (ulong)(uint)((int)lVar136 * 2);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 + 6)));
  auVar24 = vcvtdq2ps_avx(auVar282);
  auVar233 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 + 10)));
  auVar283._16_16_ = auVar233;
  auVar283._0_16_ = auVar27;
  auVar360 = vcvtdq2ps_avx(auVar283);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 + uVar137 + 6)));
  auVar233 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 + uVar137 + 10)));
  auVar308._16_16_ = auVar233;
  auVar308._0_16_ = auVar27;
  uVar134 = (ulong)(uint)((int)lVar133 << 2);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 + 6)));
  auVar233 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 + 10)));
  auVar25 = vcvtdq2ps_avx(auVar308);
  auVar320._16_16_ = auVar233;
  auVar320._0_16_ = auVar27;
  auVar26 = vcvtdq2ps_avx(auVar320);
  auVar27 = vshufps_avx(auVar250,auVar250,0);
  auVar233 = vshufps_avx(auVar250,auVar250,0x55);
  auVar196 = vshufps_avx(auVar250,auVar250,0xaa);
  fVar208 = auVar196._0_4_;
  fVar221 = auVar196._4_4_;
  fVar222 = auVar196._8_4_;
  fVar223 = auVar196._12_4_;
  fVar224 = auVar233._0_4_;
  fVar226 = auVar233._4_4_;
  fVar228 = auVar233._8_4_;
  fVar230 = auVar233._12_4_;
  fVar239 = auVar27._0_4_;
  fVar241 = auVar27._4_4_;
  fVar243 = auVar27._8_4_;
  fVar245 = auVar27._12_4_;
  auVar335._0_4_ = fVar239 * auVar148._0_4_ + fVar224 * auVar154._0_4_ + fVar208 * auVar219._0_4_;
  auVar335._4_4_ = fVar241 * auVar148._4_4_ + fVar226 * auVar154._4_4_ + fVar221 * auVar219._4_4_;
  auVar335._8_4_ = fVar243 * auVar148._8_4_ + fVar228 * auVar154._8_4_ + fVar222 * auVar219._8_4_;
  auVar335._12_4_ =
       fVar245 * auVar148._12_4_ + fVar230 * auVar154._12_4_ + fVar223 * auVar219._12_4_;
  auVar335._16_4_ =
       fVar239 * auVar148._16_4_ + fVar224 * auVar154._16_4_ + fVar208 * auVar219._16_4_;
  auVar335._20_4_ =
       fVar241 * auVar148._20_4_ + fVar226 * auVar154._20_4_ + fVar221 * auVar219._20_4_;
  auVar335._24_4_ =
       fVar243 * auVar148._24_4_ + fVar228 * auVar154._24_4_ + fVar222 * auVar219._24_4_;
  auVar335._28_4_ = fVar230 + in_register_000015dc + in_register_0000151c;
  auVar332._0_4_ = fVar239 * auVar23._0_4_ + fVar224 * auVar322._0_4_ + auVar24._0_4_ * fVar208;
  auVar332._4_4_ = fVar241 * auVar23._4_4_ + fVar226 * auVar322._4_4_ + auVar24._4_4_ * fVar221;
  auVar332._8_4_ = fVar243 * auVar23._8_4_ + fVar228 * auVar322._8_4_ + auVar24._8_4_ * fVar222;
  auVar332._12_4_ = fVar245 * auVar23._12_4_ + fVar230 * auVar322._12_4_ + auVar24._12_4_ * fVar223;
  auVar332._16_4_ = fVar239 * auVar23._16_4_ + fVar224 * auVar322._16_4_ + auVar24._16_4_ * fVar208;
  auVar332._20_4_ = fVar241 * auVar23._20_4_ + fVar226 * auVar322._20_4_ + auVar24._20_4_ * fVar221;
  auVar332._24_4_ = fVar243 * auVar23._24_4_ + fVar228 * auVar322._24_4_ + auVar24._24_4_ * fVar222;
  auVar332._28_4_ = fVar230 + in_register_000015dc + in_register_0000159c;
  auVar253._0_4_ = fVar239 * auVar360._0_4_ + fVar224 * auVar25._0_4_ + auVar26._0_4_ * fVar208;
  auVar253._4_4_ = fVar241 * auVar360._4_4_ + fVar226 * auVar25._4_4_ + auVar26._4_4_ * fVar221;
  auVar253._8_4_ = fVar243 * auVar360._8_4_ + fVar228 * auVar25._8_4_ + auVar26._8_4_ * fVar222;
  auVar253._12_4_ = fVar245 * auVar360._12_4_ + fVar230 * auVar25._12_4_ + auVar26._12_4_ * fVar223;
  auVar253._16_4_ = fVar239 * auVar360._16_4_ + fVar224 * auVar25._16_4_ + auVar26._16_4_ * fVar208;
  auVar253._20_4_ = fVar241 * auVar360._20_4_ + fVar226 * auVar25._20_4_ + auVar26._20_4_ * fVar221;
  auVar253._24_4_ = fVar243 * auVar360._24_4_ + fVar228 * auVar25._24_4_ + auVar26._24_4_ * fVar222;
  auVar253._28_4_ = fVar245 + fVar230 + fVar223;
  auVar27 = vshufps_avx(auVar170,auVar170,0);
  auVar233 = vshufps_avx(auVar170,auVar170,0x55);
  auVar196 = vshufps_avx(auVar170,auVar170,0xaa);
  fVar221 = auVar196._0_4_;
  fVar222 = auVar196._4_4_;
  fVar223 = auVar196._8_4_;
  fVar224 = auVar196._12_4_;
  fVar241 = auVar233._0_4_;
  fVar243 = auVar233._4_4_;
  fVar245 = auVar233._8_4_;
  fVar246 = auVar233._12_4_;
  fVar226 = auVar27._0_4_;
  fVar228 = auVar27._4_4_;
  fVar230 = auVar27._8_4_;
  fVar239 = auVar27._12_4_;
  fVar208 = auVar148._28_4_;
  auVar270._0_4_ = fVar226 * auVar148._0_4_ + fVar241 * auVar154._0_4_ + fVar221 * auVar219._0_4_;
  auVar270._4_4_ = fVar228 * auVar148._4_4_ + fVar243 * auVar154._4_4_ + fVar222 * auVar219._4_4_;
  auVar270._8_4_ = fVar230 * auVar148._8_4_ + fVar245 * auVar154._8_4_ + fVar223 * auVar219._8_4_;
  auVar270._12_4_ =
       fVar239 * auVar148._12_4_ + fVar246 * auVar154._12_4_ + fVar224 * auVar219._12_4_;
  auVar270._16_4_ =
       fVar226 * auVar148._16_4_ + fVar241 * auVar154._16_4_ + fVar221 * auVar219._16_4_;
  auVar270._20_4_ =
       fVar228 * auVar148._20_4_ + fVar243 * auVar154._20_4_ + fVar222 * auVar219._20_4_;
  auVar270._24_4_ =
       fVar230 * auVar148._24_4_ + fVar245 * auVar154._24_4_ + fVar223 * auVar219._24_4_;
  auVar270._28_4_ = fVar208 + auVar154._28_4_ + auVar219._28_4_;
  auVar175._0_4_ = fVar226 * auVar23._0_4_ + auVar24._0_4_ * fVar221 + fVar241 * auVar322._0_4_;
  auVar175._4_4_ = fVar228 * auVar23._4_4_ + auVar24._4_4_ * fVar222 + fVar243 * auVar322._4_4_;
  auVar175._8_4_ = fVar230 * auVar23._8_4_ + auVar24._8_4_ * fVar223 + fVar245 * auVar322._8_4_;
  auVar175._12_4_ = fVar239 * auVar23._12_4_ + auVar24._12_4_ * fVar224 + fVar246 * auVar322._12_4_;
  auVar175._16_4_ = fVar226 * auVar23._16_4_ + auVar24._16_4_ * fVar221 + fVar241 * auVar322._16_4_;
  auVar175._20_4_ = fVar228 * auVar23._20_4_ + auVar24._20_4_ * fVar222 + fVar243 * auVar322._20_4_;
  auVar175._24_4_ = fVar230 * auVar23._24_4_ + auVar24._24_4_ * fVar223 + fVar245 * auVar322._24_4_;
  auVar175._28_4_ = fVar208 + auVar24._28_4_ + auVar219._28_4_;
  auVar284._8_4_ = 0x7fffffff;
  auVar284._0_8_ = 0x7fffffff7fffffff;
  auVar284._12_4_ = 0x7fffffff;
  auVar284._16_4_ = 0x7fffffff;
  auVar284._20_4_ = 0x7fffffff;
  auVar284._24_4_ = 0x7fffffff;
  auVar284._28_4_ = 0x7fffffff;
  auVar202._8_4_ = 0x219392ef;
  auVar202._0_8_ = 0x219392ef219392ef;
  auVar202._12_4_ = 0x219392ef;
  auVar202._16_4_ = 0x219392ef;
  auVar202._20_4_ = 0x219392ef;
  auVar202._24_4_ = 0x219392ef;
  auVar202._28_4_ = 0x219392ef;
  auVar148 = vandps_avx(auVar335,auVar284);
  auVar148 = vcmpps_avx(auVar148,auVar202,1);
  auVar154 = vblendvps_avx(auVar335,auVar202,auVar148);
  auVar148 = vandps_avx(auVar332,auVar284);
  auVar148 = vcmpps_avx(auVar148,auVar202,1);
  auVar219 = vblendvps_avx(auVar332,auVar202,auVar148);
  auVar148 = vandps_avx(auVar253,auVar284);
  auVar148 = vcmpps_avx(auVar148,auVar202,1);
  auVar148 = vblendvps_avx(auVar253,auVar202,auVar148);
  auVar203._0_4_ = fVar241 * auVar25._0_4_ + auVar26._0_4_ * fVar221 + fVar226 * auVar360._0_4_;
  auVar203._4_4_ = fVar243 * auVar25._4_4_ + auVar26._4_4_ * fVar222 + fVar228 * auVar360._4_4_;
  auVar203._8_4_ = fVar245 * auVar25._8_4_ + auVar26._8_4_ * fVar223 + fVar230 * auVar360._8_4_;
  auVar203._12_4_ = fVar246 * auVar25._12_4_ + auVar26._12_4_ * fVar224 + fVar239 * auVar360._12_4_;
  auVar203._16_4_ = fVar241 * auVar25._16_4_ + auVar26._16_4_ * fVar221 + fVar226 * auVar360._16_4_;
  auVar203._20_4_ = fVar243 * auVar25._20_4_ + auVar26._20_4_ * fVar222 + fVar228 * auVar360._20_4_;
  auVar203._24_4_ = fVar245 * auVar25._24_4_ + auVar26._24_4_ * fVar223 + fVar230 * auVar360._24_4_;
  auVar203._28_4_ = auVar322._28_4_ + fVar224 + fVar208;
  auVar23 = vrcpps_avx(auVar154);
  fVar208 = auVar23._0_4_;
  fVar221 = auVar23._4_4_;
  auVar322._4_4_ = auVar154._4_4_ * fVar221;
  auVar322._0_4_ = auVar154._0_4_ * fVar208;
  fVar222 = auVar23._8_4_;
  auVar322._8_4_ = auVar154._8_4_ * fVar222;
  fVar223 = auVar23._12_4_;
  auVar322._12_4_ = auVar154._12_4_ * fVar223;
  fVar224 = auVar23._16_4_;
  auVar322._16_4_ = auVar154._16_4_ * fVar224;
  fVar226 = auVar23._20_4_;
  auVar322._20_4_ = auVar154._20_4_ * fVar226;
  fVar228 = auVar23._24_4_;
  auVar322._24_4_ = auVar154._24_4_ * fVar228;
  auVar322._28_4_ = auVar154._28_4_;
  auVar297._8_4_ = 0x3f800000;
  auVar297._0_8_ = 0x3f8000003f800000;
  auVar297._12_4_ = 0x3f800000;
  auVar297._16_4_ = 0x3f800000;
  auVar297._20_4_ = 0x3f800000;
  auVar297._24_4_ = 0x3f800000;
  auVar297._28_4_ = 0x3f800000;
  auVar322 = vsubps_avx(auVar297,auVar322);
  auVar154 = vrcpps_avx(auVar219);
  fVar208 = fVar208 + fVar208 * auVar322._0_4_;
  fVar221 = fVar221 + fVar221 * auVar322._4_4_;
  fVar222 = fVar222 + fVar222 * auVar322._8_4_;
  fVar223 = fVar223 + fVar223 * auVar322._12_4_;
  fVar224 = fVar224 + fVar224 * auVar322._16_4_;
  fVar226 = fVar226 + fVar226 * auVar322._20_4_;
  fVar228 = fVar228 + fVar228 * auVar322._24_4_;
  fVar248 = auVar154._0_4_;
  fVar258 = auVar154._4_4_;
  auVar24._4_4_ = fVar258 * auVar219._4_4_;
  auVar24._0_4_ = fVar248 * auVar219._0_4_;
  fVar260 = auVar154._8_4_;
  auVar24._8_4_ = fVar260 * auVar219._8_4_;
  fVar262 = auVar154._12_4_;
  auVar24._12_4_ = fVar262 * auVar219._12_4_;
  fVar264 = auVar154._16_4_;
  auVar24._16_4_ = fVar264 * auVar219._16_4_;
  fVar265 = auVar154._20_4_;
  auVar24._20_4_ = fVar265 * auVar219._20_4_;
  fVar266 = auVar154._24_4_;
  auVar24._24_4_ = fVar266 * auVar219._24_4_;
  auVar24._28_4_ = auVar23._28_4_;
  auVar154 = vsubps_avx(auVar297,auVar24);
  fVar248 = fVar248 + fVar248 * auVar154._0_4_;
  fVar258 = fVar258 + fVar258 * auVar154._4_4_;
  fVar260 = fVar260 + fVar260 * auVar154._8_4_;
  fVar262 = fVar262 + fVar262 * auVar154._12_4_;
  fVar264 = fVar264 + fVar264 * auVar154._16_4_;
  fVar265 = fVar265 + fVar265 * auVar154._20_4_;
  fVar266 = fVar266 + fVar266 * auVar154._24_4_;
  auVar154 = vrcpps_avx(auVar148);
  fVar230 = auVar154._0_4_;
  fVar239 = auVar154._4_4_;
  auVar360._4_4_ = fVar239 * auVar148._4_4_;
  auVar360._0_4_ = fVar230 * auVar148._0_4_;
  fVar241 = auVar154._8_4_;
  auVar360._8_4_ = fVar241 * auVar148._8_4_;
  fVar243 = auVar154._12_4_;
  auVar360._12_4_ = fVar243 * auVar148._12_4_;
  fVar245 = auVar154._16_4_;
  auVar360._16_4_ = fVar245 * auVar148._16_4_;
  fVar246 = auVar154._20_4_;
  auVar360._20_4_ = fVar246 * auVar148._20_4_;
  fVar247 = auVar154._24_4_;
  auVar360._24_4_ = fVar247 * auVar148._24_4_;
  auVar360._28_4_ = auVar219._28_4_;
  auVar148 = vsubps_avx(auVar297,auVar360);
  fVar230 = fVar230 + fVar230 * auVar148._0_4_;
  fVar239 = fVar239 + fVar239 * auVar148._4_4_;
  fVar241 = fVar241 + fVar241 * auVar148._8_4_;
  fVar243 = fVar243 + fVar243 * auVar148._12_4_;
  fVar245 = fVar245 + fVar245 * auVar148._16_4_;
  fVar246 = fVar246 + fVar246 * auVar148._20_4_;
  fVar247 = fVar247 + fVar247 * auVar148._24_4_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar137 * 7 + 6);
  auVar27 = vpmovsxwd_avx(auVar27);
  auVar233._8_8_ = 0;
  auVar233._0_8_ = *(ulong *)(prim + uVar137 * 7 + 0xe);
  auVar233 = vpmovsxwd_avx(auVar233);
  auVar142._16_16_ = auVar233;
  auVar142._0_16_ = auVar27;
  auVar148 = vcvtdq2ps_avx(auVar142);
  auVar148 = vsubps_avx(auVar148,auVar270);
  auVar140._0_4_ = fVar208 * auVar148._0_4_;
  auVar140._4_4_ = fVar221 * auVar148._4_4_;
  auVar140._8_4_ = fVar222 * auVar148._8_4_;
  auVar140._12_4_ = fVar223 * auVar148._12_4_;
  auVar219._16_4_ = fVar224 * auVar148._16_4_;
  auVar219._0_16_ = auVar140;
  auVar219._20_4_ = fVar226 * auVar148._20_4_;
  auVar219._24_4_ = fVar228 * auVar148._24_4_;
  auVar219._28_4_ = auVar148._28_4_;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = *(ulong *)(prim + lVar136 + 6);
  auVar27 = vpmovsxwd_avx(auVar196);
  auVar210._8_8_ = 0;
  auVar210._0_8_ = *(ulong *)(prim + lVar136 + 0xe);
  auVar233 = vpmovsxwd_avx(auVar210);
  auVar285._16_16_ = auVar233;
  auVar285._0_16_ = auVar27;
  auVar148 = vcvtdq2ps_avx(auVar285);
  auVar148 = vsubps_avx(auVar148,auVar270);
  auVar209._0_4_ = fVar208 * auVar148._0_4_;
  auVar209._4_4_ = fVar221 * auVar148._4_4_;
  auVar209._8_4_ = fVar222 * auVar148._8_4_;
  auVar209._12_4_ = fVar223 * auVar148._12_4_;
  auVar25._16_4_ = fVar224 * auVar148._16_4_;
  auVar25._0_16_ = auVar209;
  auVar25._20_4_ = fVar226 * auVar148._20_4_;
  auVar25._24_4_ = fVar228 * auVar148._24_4_;
  auVar25._28_4_ = auVar23._28_4_ + auVar322._28_4_;
  lVar133 = (ulong)(byte)PVar16 * 0x10;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = *(ulong *)(prim + lVar133 + 6);
  auVar27 = vpmovsxwd_avx(auVar198);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + lVar133 + 0xe);
  auVar233 = vpmovsxwd_avx(auVar9);
  lVar133 = lVar133 + uVar137 * -2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + lVar133 + 6);
  auVar196 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + lVar133 + 0xe);
  auVar210 = vpmovsxwd_avx(auVar11);
  auVar271._16_16_ = auVar210;
  auVar271._0_16_ = auVar196;
  auVar148 = vcvtdq2ps_avx(auVar271);
  auVar148 = vsubps_avx(auVar148,auVar175);
  auVar268._0_4_ = fVar248 * auVar148._0_4_;
  auVar268._4_4_ = fVar258 * auVar148._4_4_;
  auVar268._8_4_ = fVar260 * auVar148._8_4_;
  auVar268._12_4_ = fVar262 * auVar148._12_4_;
  auVar23._16_4_ = fVar264 * auVar148._16_4_;
  auVar23._0_16_ = auVar268;
  auVar23._20_4_ = fVar265 * auVar148._20_4_;
  auVar23._24_4_ = fVar266 * auVar148._24_4_;
  auVar23._28_4_ = auVar148._28_4_;
  auVar286._16_16_ = auVar233;
  auVar286._0_16_ = auVar27;
  auVar148 = vcvtdq2ps_avx(auVar286);
  auVar148 = vsubps_avx(auVar148,auVar175);
  auVar171._0_4_ = fVar248 * auVar148._0_4_;
  auVar171._4_4_ = fVar258 * auVar148._4_4_;
  auVar171._8_4_ = fVar260 * auVar148._8_4_;
  auVar171._12_4_ = fVar262 * auVar148._12_4_;
  auVar26._16_4_ = fVar264 * auVar148._16_4_;
  auVar26._0_16_ = auVar171;
  auVar26._20_4_ = fVar265 * auVar148._20_4_;
  auVar26._24_4_ = fVar266 * auVar148._24_4_;
  auVar26._28_4_ = auVar148._28_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar134 + uVar137 + 6);
  auVar27 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar134 + uVar137 + 0xe);
  auVar233 = vpmovsxwd_avx(auVar13);
  auVar254._16_16_ = auVar233;
  auVar254._0_16_ = auVar27;
  auVar148 = vcvtdq2ps_avx(auVar254);
  auVar148 = vsubps_avx(auVar148,auVar203);
  auVar251._0_4_ = fVar230 * auVar148._0_4_;
  auVar251._4_4_ = fVar239 * auVar148._4_4_;
  auVar251._8_4_ = fVar241 * auVar148._8_4_;
  auVar251._12_4_ = fVar243 * auVar148._12_4_;
  auVar28._16_4_ = fVar245 * auVar148._16_4_;
  auVar28._0_16_ = auVar251;
  auVar28._20_4_ = fVar246 * auVar148._20_4_;
  auVar28._24_4_ = fVar247 * auVar148._24_4_;
  auVar28._28_4_ = auVar148._28_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar137 * 0x17 + 6);
  auVar27 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar137 * 0x17 + 0xe);
  auVar233 = vpmovsxwd_avx(auVar15);
  auVar287._16_16_ = auVar233;
  auVar287._0_16_ = auVar27;
  auVar148 = vcvtdq2ps_avx(auVar287);
  auVar148 = vsubps_avx(auVar148,auVar203);
  auVar192._0_4_ = fVar230 * auVar148._0_4_;
  auVar192._4_4_ = fVar239 * auVar148._4_4_;
  auVar192._8_4_ = fVar241 * auVar148._8_4_;
  auVar192._12_4_ = fVar243 * auVar148._12_4_;
  auVar29._16_4_ = fVar245 * auVar148._16_4_;
  auVar29._0_16_ = auVar192;
  auVar29._20_4_ = fVar246 * auVar148._20_4_;
  auVar29._24_4_ = fVar247 * auVar148._24_4_;
  auVar29._28_4_ = auVar148._28_4_;
  auVar27 = vpminsd_avx(auVar219._16_16_,auVar25._16_16_);
  auVar233 = vpminsd_avx(auVar140,auVar209);
  auVar298._16_16_ = auVar27;
  auVar298._0_16_ = auVar233;
  auVar27 = vpminsd_avx(auVar23._16_16_,auVar26._16_16_);
  auVar233 = vpminsd_avx(auVar268,auVar171);
  auVar333._16_16_ = auVar27;
  auVar333._0_16_ = auVar233;
  auVar148 = vmaxps_avx(auVar298,auVar333);
  auVar27 = vpminsd_avx(auVar28._16_16_,auVar29._16_16_);
  auVar233 = vpminsd_avx(auVar251,auVar192);
  auVar343._16_16_ = auVar27;
  auVar343._0_16_ = auVar233;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar351._4_4_ = uVar8;
  auVar351._0_4_ = uVar8;
  auVar351._8_4_ = uVar8;
  auVar351._12_4_ = uVar8;
  auVar351._16_4_ = uVar8;
  auVar351._20_4_ = uVar8;
  auVar351._24_4_ = uVar8;
  auVar351._28_4_ = uVar8;
  auVar353 = ZEXT3264(auVar351);
  auVar154 = vmaxps_avx(auVar343,auVar351);
  auVar148 = vmaxps_avx(auVar148,auVar154);
  local_80._4_4_ = auVar148._4_4_ * 0.99999964;
  local_80._0_4_ = auVar148._0_4_ * 0.99999964;
  local_80._8_4_ = auVar148._8_4_ * 0.99999964;
  local_80._12_4_ = auVar148._12_4_ * 0.99999964;
  local_80._16_4_ = auVar148._16_4_ * 0.99999964;
  local_80._20_4_ = auVar148._20_4_ * 0.99999964;
  local_80._24_4_ = auVar148._24_4_ * 0.99999964;
  local_80._28_4_ = auVar148._28_4_;
  auVar27 = vpmaxsd_avx(auVar219._16_16_,auVar25._16_16_);
  auVar233 = vpmaxsd_avx(auVar140,auVar209);
  auVar143._16_16_ = auVar27;
  auVar143._0_16_ = auVar233;
  auVar27 = vpmaxsd_avx(auVar23._16_16_,auVar26._16_16_);
  auVar233 = vpmaxsd_avx(auVar268,auVar171);
  auVar176._16_16_ = auVar27;
  auVar176._0_16_ = auVar233;
  auVar148 = vminps_avx(auVar143,auVar176);
  auVar27 = vpmaxsd_avx(auVar28._16_16_,auVar29._16_16_);
  auVar233 = vpmaxsd_avx(auVar251,auVar192);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar213._4_4_ = uVar8;
  auVar213._0_4_ = uVar8;
  auVar213._8_4_ = uVar8;
  auVar213._12_4_ = uVar8;
  auVar213._16_4_ = uVar8;
  auVar213._20_4_ = uVar8;
  auVar213._24_4_ = uVar8;
  auVar213._28_4_ = uVar8;
  auVar177._16_16_ = auVar27;
  auVar177._0_16_ = auVar233;
  auVar154 = vminps_avx(auVar177,auVar213);
  auVar148 = vminps_avx(auVar148,auVar154);
  auVar154._4_4_ = auVar148._4_4_ * 1.0000004;
  auVar154._0_4_ = auVar148._0_4_ * 1.0000004;
  auVar154._8_4_ = auVar148._8_4_ * 1.0000004;
  auVar154._12_4_ = auVar148._12_4_ * 1.0000004;
  auVar154._16_4_ = auVar148._16_4_ * 1.0000004;
  auVar154._20_4_ = auVar148._20_4_ * 1.0000004;
  auVar154._24_4_ = auVar148._24_4_ * 1.0000004;
  auVar154._28_4_ = auVar148._28_4_;
  auVar148 = vcmpps_avx(local_80,auVar154,2);
  auVar27 = vpshufd_avx(ZEXT116((byte)PVar16),0);
  auVar178._16_16_ = auVar27;
  auVar178._0_16_ = auVar27;
  auVar154 = vcvtdq2ps_avx(auVar178);
  auVar154 = vcmpps_avx(_DAT_01faff40,auVar154,1);
  auVar148 = vandps_avx(auVar148,auVar154);
  uVar131 = vmovmskps_avx(auVar148);
  if (uVar131 != 0) {
    uVar131 = uVar131 & 0xff;
    pLVar135 = pre->ray_space + k;
    local_5c0[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_5c0[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_5c0[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_5c0[1]._24_8_ = mm_lookupmask_ps._24_8_;
    local_748 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_818 = pLVar135;
    local_810 = pre;
    local_808 = prim;
    do {
      uVar137 = (ulong)uVar131;
      auVar148 = auVar353._0_32_;
      lVar133 = 0;
      if (uVar137 != 0) {
        for (; (uVar131 >> lVar133 & 1) == 0; lVar133 = lVar133 + 1) {
        }
      }
      uVar137 = uVar137 - 1 & uVar137;
      uVar131 = *(uint *)(prim + 2);
      uVar17 = *(uint *)(prim + lVar133 * 4 + 6);
      pGVar20 = (context->scene->geometries).items[uVar131].ptr;
      uVar134 = (ulong)*(uint *)(*(long *)&pGVar20->field_0x58 +
                                pGVar20[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i * (ulong)uVar17);
      p_Var21 = pGVar20[1].intersectionFilterN;
      lVar133 = *(long *)&pGVar20[1].time_range.upper;
      auVar27 = *(undefined1 (*) [16])(lVar133 + (long)p_Var21 * uVar134);
      pauVar1 = (undefined1 (*) [12])(lVar133 + (uVar134 + 1) * (long)p_Var21);
      uVar114 = *(undefined8 *)*pauVar1;
      uVar115 = *(undefined8 *)(*pauVar1 + 8);
      local_840 = (float)uVar114;
      fStack_83c = (float)((ulong)uVar114 >> 0x20);
      fStack_838 = (float)uVar115;
      fStack_834 = (float)((ulong)uVar115 >> 0x20);
      auVar233 = *(undefined1 (*) [16])(lVar133 + (uVar134 + 2) * (long)p_Var21);
      lVar136 = 0;
      if (uVar137 != 0) {
        for (; (uVar137 >> lVar136 & 1) == 0; lVar136 = lVar136 + 1) {
        }
      }
      auVar196 = *(undefined1 (*) [16])(lVar133 + (uVar134 + 3) * (long)p_Var21);
      if (((uVar137 != 0) && (uVar134 = uVar137 - 1 & uVar137, uVar134 != 0)) &&
         (lVar133 = 0, uVar134 != 0)) {
        for (; (uVar134 >> lVar133 & 1) == 0; lVar133 = lVar133 + 1) {
        }
      }
      uVar18 = (uint)pGVar20[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar210 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar10 = vinsertps_avx(auVar210,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar9 = vsubps_avx(auVar27,auVar10);
      auVar210 = vshufps_avx(auVar9,auVar9,0);
      auVar198 = vshufps_avx(auVar9,auVar9,0x55);
      auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
      fVar208 = (pLVar135->vx).field_0.m128[0];
      fVar221 = (pLVar135->vx).field_0.m128[1];
      fVar222 = (pLVar135->vx).field_0.m128[2];
      fVar223 = (pLVar135->vx).field_0.m128[3];
      fVar224 = (pLVar135->vy).field_0.m128[0];
      fVar226 = (pLVar135->vy).field_0.m128[1];
      fVar228 = (pLVar135->vy).field_0.m128[2];
      fVar230 = (pLVar135->vy).field_0.m128[3];
      fVar239 = (pLVar135->vz).field_0.m128[0];
      fVar241 = (pLVar135->vz).field_0.m128[1];
      fVar243 = (pLVar135->vz).field_0.m128[2];
      fVar245 = (pLVar135->vz).field_0.m128[3];
      auVar172._0_4_ = auVar210._0_4_ * fVar208 + auVar198._0_4_ * fVar224 + fVar239 * auVar9._0_4_;
      auVar172._4_4_ = auVar210._4_4_ * fVar221 + auVar198._4_4_ * fVar226 + fVar241 * auVar9._4_4_;
      auVar172._8_4_ = auVar210._8_4_ * fVar222 + auVar198._8_4_ * fVar228 + fVar243 * auVar9._8_4_;
      auVar172._12_4_ =
           auVar210._12_4_ * fVar223 + auVar198._12_4_ * fVar230 + fVar245 * auVar9._12_4_;
      auVar210 = vblendps_avx(auVar172,auVar27,8);
      auVar118._12_4_ = fStack_834;
      auVar118._0_12_ = *pauVar1;
      auVar11 = vsubps_avx(auVar118,auVar10);
      auVar198 = vshufps_avx(auVar11,auVar11,0);
      auVar9 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      auVar342._0_4_ = auVar198._0_4_ * fVar208 + auVar9._0_4_ * fVar224 + fVar239 * auVar11._0_4_;
      auVar342._4_4_ = auVar198._4_4_ * fVar221 + auVar9._4_4_ * fVar226 + fVar241 * auVar11._4_4_;
      auVar342._8_4_ = auVar198._8_4_ * fVar222 + auVar9._8_4_ * fVar228 + fVar243 * auVar11._8_4_;
      auVar342._12_4_ =
           auVar198._12_4_ * fVar223 + auVar9._12_4_ * fVar230 + fVar245 * auVar11._12_4_;
      auVar198 = vblendps_avx(auVar342,auVar118,8);
      auVar12 = vsubps_avx(auVar233,auVar10);
      auVar9 = vshufps_avx(auVar12,auVar12,0);
      auVar11 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar252._0_4_ = auVar9._0_4_ * fVar208 + auVar11._0_4_ * fVar224 + fVar239 * auVar12._0_4_;
      auVar252._4_4_ = auVar9._4_4_ * fVar221 + auVar11._4_4_ * fVar226 + fVar241 * auVar12._4_4_;
      auVar252._8_4_ = auVar9._8_4_ * fVar222 + auVar11._8_4_ * fVar228 + fVar243 * auVar12._8_4_;
      auVar252._12_4_ =
           auVar9._12_4_ * fVar223 + auVar11._12_4_ * fVar230 + fVar245 * auVar12._12_4_;
      auVar12 = vshufps_avx(auVar233,auVar233,0xff);
      auVar9 = vblendps_avx(auVar252,auVar233,8);
      auVar13 = vsubps_avx(auVar196,auVar10);
      auVar10 = vshufps_avx(auVar13,auVar13,0);
      auVar11 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar296._0_4_ = auVar10._0_4_ * fVar208 + auVar11._0_4_ * fVar224 + fVar239 * auVar13._0_4_;
      auVar296._4_4_ = auVar10._4_4_ * fVar221 + auVar11._4_4_ * fVar226 + fVar241 * auVar13._4_4_;
      auVar296._8_4_ = auVar10._8_4_ * fVar222 + auVar11._8_4_ * fVar228 + fVar243 * auVar13._8_4_;
      auVar296._12_4_ =
           auVar10._12_4_ * fVar223 + auVar11._12_4_ * fVar230 + fVar245 * auVar13._12_4_;
      auVar13 = vshufps_avx(auVar196,auVar196,0xff);
      auVar10 = vblendps_avx(auVar296,auVar196,8);
      auVar232._8_4_ = 0x7fffffff;
      auVar232._0_8_ = 0x7fffffff7fffffff;
      auVar232._12_4_ = 0x7fffffff;
      auVar210 = vandps_avx(auVar210,auVar232);
      auVar198 = vandps_avx(auVar198,auVar232);
      auVar11 = vmaxps_avx(auVar210,auVar198);
      auVar210 = vandps_avx(auVar9,auVar232);
      auVar198 = vandps_avx(auVar10,auVar232);
      auVar210 = vmaxps_avx(auVar210,auVar198);
      auVar210 = vmaxps_avx(auVar11,auVar210);
      auVar198 = vmovshdup_avx(auVar210);
      auVar198 = vmaxss_avx(auVar198,auVar210);
      auVar210 = vshufpd_avx(auVar210,auVar210,1);
      auVar210 = vmaxss_avx(auVar210,auVar198);
      lVar133 = (long)(int)uVar18 * 0x44;
      fVar221 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar133 + 0x908);
      fVar222 = *(float *)(bezier_basis0 + lVar133 + 0x90c);
      fVar224 = *(float *)(bezier_basis0 + lVar133 + 0x910);
      fVar226 = *(float *)(bezier_basis0 + lVar133 + 0x914);
      fVar230 = *(float *)(bezier_basis0 + lVar133 + 0x918);
      fVar239 = *(float *)(bezier_basis0 + lVar133 + 0x91c);
      fVar243 = *(float *)(bezier_basis0 + lVar133 + 0x920);
      auVar121 = *(undefined1 (*) [28])(bezier_basis0 + lVar133 + 0x908);
      auVar198 = vshufps_avx(auVar252,auVar252,0);
      register0x00001450 = auVar198;
      _local_540 = auVar198;
      auVar9 = vshufps_avx(auVar252,auVar252,0x55);
      register0x00001390 = auVar9;
      _local_680 = auVar9;
      register0x00001490 = auVar12;
      _local_140 = auVar12;
      fVar245 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar133 + 0xd8c);
      fVar246 = *(float *)(bezier_basis0 + lVar133 + 0xd90);
      fVar247 = *(float *)(bezier_basis0 + lVar133 + 0xd94);
      fVar248 = *(float *)(bezier_basis0 + lVar133 + 0xd98);
      fVar258 = *(float *)(bezier_basis0 + lVar133 + 0xd9c);
      fVar260 = *(float *)(bezier_basis0 + lVar133 + 0xda0);
      fVar262 = *(float *)(bezier_basis0 + lVar133 + 0xda4);
      auVar120 = *(undefined1 (*) [28])(bezier_basis0 + lVar133 + 0xd8c);
      auVar10 = vshufps_avx(auVar296,auVar296,0);
      register0x00001310 = auVar10;
      _local_480 = auVar10;
      auVar11 = vshufps_avx(auVar296,auVar296,0x55);
      register0x000015d0 = auVar11;
      _local_5e0 = auVar11;
      register0x000013d0 = auVar13;
      _local_1a0 = auVar13;
      fVar231 = auVar10._0_4_;
      fVar240 = auVar10._4_4_;
      fVar242 = auVar10._8_4_;
      fVar244 = auVar10._12_4_;
      fVar357 = auVar11._0_4_;
      fVar361 = auVar11._4_4_;
      fVar362 = auVar11._8_4_;
      fVar363 = auVar11._12_4_;
      fVar306 = auVar198._0_4_;
      fVar313 = auVar198._4_4_;
      fVar315 = auVar198._8_4_;
      fVar317 = auVar198._12_4_;
      fVar267 = auVar9._0_4_;
      fVar277 = auVar9._4_4_;
      fVar278 = auVar9._8_4_;
      fVar279 = auVar9._12_4_;
      fVar281 = auVar13._0_4_;
      fVar291 = auVar13._4_4_;
      fVar292 = auVar13._8_4_;
      fVar293 = auVar13._12_4_;
      fVar318 = auVar12._0_4_;
      fVar326 = auVar12._4_4_;
      fVar328 = auVar12._8_4_;
      auVar198 = vshufps_avx(auVar342,auVar342,0);
      register0x00001350 = auVar198;
      _local_660 = auVar198;
      fVar264 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar133 + 0x484);
      fVar265 = *(float *)(bezier_basis0 + lVar133 + 0x488);
      fVar266 = *(float *)(bezier_basis0 + lVar133 + 0x48c);
      fVar303 = *(float *)(bezier_basis0 + lVar133 + 0x490);
      fVar225 = *(float *)(bezier_basis0 + lVar133 + 0x494);
      fVar294 = *(float *)(bezier_basis0 + lVar133 + 0x498);
      fVar304 = *(float *)(bezier_basis0 + lVar133 + 0x49c);
      auVar122 = *(undefined1 (*) [28])(bezier_basis0 + lVar133 + 0x484);
      fVar305 = *(float *)(bezier_basis0 + lVar133 + 0x4a0);
      fVar249 = auVar198._0_4_;
      fVar259 = auVar198._4_4_;
      fVar261 = auVar198._8_4_;
      fVar263 = auVar198._12_4_;
      auVar198 = vshufps_avx(auVar342,auVar342,0x55);
      register0x00001550 = auVar198;
      _local_6a0 = auVar198;
      fVar341 = auVar198._0_4_;
      fVar347 = auVar198._4_4_;
      fVar348 = auVar198._8_4_;
      fVar349 = auVar198._12_4_;
      auVar198 = vshufps_avx(auVar118,auVar118,0xff);
      register0x00001590 = auVar198;
      _local_a0 = auVar198;
      fVar350 = auVar198._0_4_;
      fVar354 = auVar198._4_4_;
      fVar355 = auVar198._8_4_;
      fVar356 = auVar198._12_4_;
      fVar206 = *(float *)(bezier_basis0 + lVar133 + 0x924) + 0.0 + 0.0;
      auVar198 = vshufps_avx(auVar172,auVar172,0);
      local_160._16_16_ = auVar198;
      local_160._0_16_ = auVar198;
      fVar227 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar133);
      fVar295 = *(float *)(bezier_basis0 + lVar133 + 4);
      fVar168 = *(float *)(bezier_basis0 + lVar133 + 8);
      fVar280 = *(float *)(bezier_basis0 + lVar133 + 0xc);
      fVar229 = *(float *)(bezier_basis0 + lVar133 + 0x10);
      fVar331 = *(float *)(bezier_basis0 + lVar133 + 0x14);
      fVar138 = *(float *)(bezier_basis0 + lVar133 + 0x18);
      auVar123 = *(undefined1 (*) [28])(bezier_basis0 + lVar133);
      fVar208 = auVar198._0_4_;
      fVar223 = auVar198._4_4_;
      fVar228 = auVar198._8_4_;
      fVar241 = auVar198._12_4_;
      auVar336._0_4_ = fVar227 * fVar208 + fVar249 * fVar264 + fVar306 * fVar221 + fVar231 * fVar245
      ;
      auVar336._4_4_ = fVar295 * fVar223 + fVar259 * fVar265 + fVar313 * fVar222 + fVar240 * fVar246
      ;
      auVar336._8_4_ = fVar168 * fVar228 + fVar261 * fVar266 + fVar315 * fVar224 + fVar242 * fVar247
      ;
      auVar336._12_4_ =
           fVar280 * fVar241 + fVar263 * fVar303 + fVar317 * fVar226 + fVar244 * fVar248;
      auVar336._16_4_ =
           fVar229 * fVar208 + fVar249 * fVar225 + fVar306 * fVar230 + fVar231 * fVar258;
      auVar336._20_4_ =
           fVar331 * fVar223 + fVar259 * fVar294 + fVar313 * fVar239 + fVar240 * fVar260;
      auVar336._24_4_ =
           fVar138 * fVar228 + fVar261 * fVar304 + fVar315 * fVar243 + fVar242 * fVar262;
      auVar336._28_4_ = fVar305 + 0.0;
      auVar198 = vshufps_avx(auVar172,auVar172,0x55);
      register0x00001490 = auVar198;
      _local_180 = auVar198;
      fVar319 = auVar198._0_4_;
      fVar327 = auVar198._4_4_;
      fVar329 = auVar198._8_4_;
      fVar330 = auVar198._12_4_;
      auVar299._0_4_ = fVar319 * fVar227 + fVar341 * fVar264 + fVar267 * fVar221 + fVar357 * fVar245
      ;
      auVar299._4_4_ = fVar327 * fVar295 + fVar347 * fVar265 + fVar277 * fVar222 + fVar361 * fVar246
      ;
      auVar299._8_4_ = fVar329 * fVar168 + fVar348 * fVar266 + fVar278 * fVar224 + fVar362 * fVar247
      ;
      auVar299._12_4_ =
           fVar330 * fVar280 + fVar349 * fVar303 + fVar279 * fVar226 + fVar363 * fVar248;
      auVar299._16_4_ =
           fVar319 * fVar229 + fVar341 * fVar225 + fVar267 * fVar230 + fVar357 * fVar258;
      auVar299._20_4_ =
           fVar327 * fVar331 + fVar347 * fVar294 + fVar277 * fVar239 + fVar361 * fVar260;
      auVar299._24_4_ =
           fVar329 * fVar138 + fVar348 * fVar304 + fVar278 * fVar243 + fVar362 * fVar262;
      auVar299._28_4_ = 0;
      auVar198 = vpermilps_avx(auVar27,0xff);
      register0x00001450 = auVar198;
      _local_1c0 = auVar198;
      fVar307 = auVar198._0_4_;
      fVar314 = auVar198._4_4_;
      fVar316 = auVar198._8_4_;
      fVar169 = fVar307 * fVar227 + fVar350 * fVar264 + fVar318 * fVar221 + fVar281 * fVar245;
      fVar185 = fVar314 * fVar295 + fVar354 * fVar265 + fVar326 * fVar222 + fVar291 * fVar246;
      fVar186 = fVar316 * fVar168 + fVar355 * fVar266 + fVar328 * fVar224 + fVar292 * fVar247;
      fVar187 = auVar198._12_4_ * fVar280 +
                fVar356 * fVar303 + auVar12._12_4_ * fVar226 + fVar293 * fVar248;
      fVar188 = fVar307 * fVar229 + fVar350 * fVar225 + fVar318 * fVar230 + fVar281 * fVar258;
      fVar189 = fVar314 * fVar331 + fVar354 * fVar294 + fVar326 * fVar239 + fVar291 * fVar260;
      fVar190 = fVar316 * fVar138 + fVar355 * fVar304 + fVar328 * fVar243 + fVar292 * fVar262;
      fVar191 = fVar206 + 0.0;
      fVar264 = *(float *)(bezier_basis1 + lVar133 + 0x908);
      fVar265 = *(float *)(bezier_basis1 + lVar133 + 0x90c);
      fVar266 = *(float *)(bezier_basis1 + lVar133 + 0x910);
      fVar303 = *(float *)(bezier_basis1 + lVar133 + 0x914);
      fVar225 = *(float *)(bezier_basis1 + lVar133 + 0x918);
      fVar294 = *(float *)(bezier_basis1 + lVar133 + 0x91c);
      fVar304 = *(float *)(bezier_basis1 + lVar133 + 0x920);
      fVar227 = *(float *)(bezier_basis1 + lVar133 + 0xd8c);
      fVar295 = *(float *)(bezier_basis1 + lVar133 + 0xd90);
      fVar168 = *(float *)(bezier_basis1 + lVar133 + 0xd94);
      fVar280 = *(float *)(bezier_basis1 + lVar133 + 0xd98);
      fVar229 = *(float *)(bezier_basis1 + lVar133 + 0xd9c);
      fVar331 = *(float *)(bezier_basis1 + lVar133 + 0xda0);
      fVar138 = *(float *)(bezier_basis1 + lVar133 + 0xda4);
      fVar157 = *(float *)(bezier_basis1 + lVar133 + 0x484);
      fVar158 = *(float *)(bezier_basis1 + lVar133 + 0x488);
      fVar160 = *(float *)(bezier_basis1 + lVar133 + 0x48c);
      fVar162 = *(float *)(bezier_basis1 + lVar133 + 0x490);
      fVar164 = *(float *)(bezier_basis1 + lVar133 + 0x494);
      fVar166 = *(float *)(bezier_basis1 + lVar133 + 0x498);
      fVar139 = *(float *)(bezier_basis1 + lVar133 + 0x49c);
      fVar222 = fVar349 + fVar206 + 0.0;
      fVar206 = *(float *)(bezier_basis1 + lVar133);
      fVar159 = *(float *)(bezier_basis1 + lVar133 + 4);
      fVar161 = *(float *)(bezier_basis1 + lVar133 + 8);
      fVar163 = *(float *)(bezier_basis1 + lVar133 + 0xc);
      fVar165 = *(float *)(bezier_basis1 + lVar133 + 0x10);
      fVar167 = *(float *)(bezier_basis1 + lVar133 + 0x14);
      fVar207 = *(float *)(bezier_basis1 + lVar133 + 0x18);
      auVar234._0_4_ = fVar208 * fVar206 + fVar249 * fVar157 + fVar264 * fVar306 + fVar227 * fVar231
      ;
      auVar234._4_4_ = fVar223 * fVar159 + fVar259 * fVar158 + fVar265 * fVar313 + fVar295 * fVar240
      ;
      auVar234._8_4_ = fVar228 * fVar161 + fVar261 * fVar160 + fVar266 * fVar315 + fVar168 * fVar242
      ;
      auVar234._12_4_ =
           fVar241 * fVar163 + fVar263 * fVar162 + fVar303 * fVar317 + fVar280 * fVar244;
      auVar234._16_4_ =
           fVar208 * fVar165 + fVar249 * fVar164 + fVar225 * fVar306 + fVar229 * fVar231;
      auVar234._20_4_ =
           fVar223 * fVar167 + fVar259 * fVar166 + fVar294 * fVar313 + fVar331 * fVar240;
      auVar234._24_4_ =
           fVar228 * fVar207 + fVar261 * fVar139 + fVar304 * fVar315 + fVar138 * fVar242;
      auVar234._28_4_ = fVar356 + fVar222;
      local_600._0_4_ =
           fVar319 * fVar206 + fVar341 * fVar157 + fVar264 * fVar267 + fVar357 * fVar227;
      local_600._4_4_ =
           fVar327 * fVar159 + fVar347 * fVar158 + fVar265 * fVar277 + fVar361 * fVar295;
      fStack_5f8 = fVar329 * fVar161 + fVar348 * fVar160 + fVar266 * fVar278 + fVar362 * fVar168;
      fStack_5f4 = fVar330 * fVar163 + fVar349 * fVar162 + fVar303 * fVar279 + fVar363 * fVar280;
      fStack_5f0 = fVar319 * fVar165 + fVar341 * fVar164 + fVar225 * fVar267 + fVar357 * fVar229;
      fStack_5ec = fVar327 * fVar167 + fVar347 * fVar166 + fVar294 * fVar277 + fVar361 * fVar331;
      fStack_5e8 = fVar329 * fVar207 + fVar348 * fVar139 + fVar304 * fVar278 + fVar362 * fVar138;
      fStack_5e4 = fVar222 + fVar349 + fVar305 + 0.0;
      auVar255._0_4_ = fVar350 * fVar157 + fVar264 * fVar318 + fVar227 * fVar281 + fVar307 * fVar206
      ;
      auVar255._4_4_ = fVar354 * fVar158 + fVar265 * fVar326 + fVar295 * fVar291 + fVar314 * fVar159
      ;
      auVar255._8_4_ = fVar355 * fVar160 + fVar266 * fVar328 + fVar168 * fVar292 + fVar316 * fVar161
      ;
      auVar255._12_4_ =
           fVar356 * fVar162 + fVar303 * auVar12._12_4_ + fVar280 * fVar293 +
           auVar198._12_4_ * fVar163;
      auVar255._16_4_ =
           fVar350 * fVar164 + fVar225 * fVar318 + fVar229 * fVar281 + fVar307 * fVar165;
      auVar255._20_4_ =
           fVar354 * fVar166 + fVar294 * fVar326 + fVar331 * fVar291 + fVar314 * fVar167;
      auVar255._24_4_ =
           fVar355 * fVar139 + fVar304 * fVar328 + fVar138 * fVar292 + fVar316 * fVar207;
      auVar255._28_4_ = fVar349 + fVar293 + fVar305 + fVar222;
      auVar23 = vsubps_avx(auVar234,auVar336);
      auVar322 = vsubps_avx(_local_600,auVar299);
      _auStack_4d0 = auVar322._16_16_;
      fVar221 = auVar23._0_4_;
      fVar224 = auVar23._4_4_;
      auVar30._4_4_ = auVar299._4_4_ * fVar224;
      auVar30._0_4_ = auVar299._0_4_ * fVar221;
      fVar230 = auVar23._8_4_;
      auVar30._8_4_ = auVar299._8_4_ * fVar230;
      fVar243 = auVar23._12_4_;
      auVar30._12_4_ = auVar299._12_4_ * fVar243;
      fVar246 = auVar23._16_4_;
      auVar30._16_4_ = auVar299._16_4_ * fVar246;
      fVar248 = auVar23._20_4_;
      auVar30._20_4_ = auVar299._20_4_ * fVar248;
      fVar260 = auVar23._24_4_;
      auVar30._24_4_ = auVar299._24_4_ * fVar260;
      auVar30._28_4_ = fVar222;
      fVar222 = auVar322._0_4_;
      fVar226 = auVar322._4_4_;
      auVar31._4_4_ = auVar336._4_4_ * fVar226;
      auVar31._0_4_ = auVar336._0_4_ * fVar222;
      fVar239 = auVar322._8_4_;
      auVar31._8_4_ = auVar336._8_4_ * fVar239;
      fVar245 = auVar322._12_4_;
      auVar31._12_4_ = auVar336._12_4_ * fVar245;
      fVar247 = auVar322._16_4_;
      auVar31._16_4_ = auVar336._16_4_ * fVar247;
      fVar258 = auVar322._20_4_;
      auVar31._20_4_ = auVar336._20_4_ * fVar258;
      fVar262 = auVar322._24_4_;
      auVar31._24_4_ = auVar336._24_4_ * fVar262;
      auVar31._28_4_ = fStack_5e4;
      auVar219 = vsubps_avx(auVar30,auVar31);
      auVar116._4_4_ = fVar185;
      auVar116._0_4_ = fVar169;
      auVar116._8_4_ = fVar186;
      auVar116._12_4_ = fVar187;
      auVar116._16_4_ = fVar188;
      auVar116._20_4_ = fVar189;
      auVar116._24_4_ = fVar190;
      auVar116._28_4_ = fVar191;
      auVar154 = vmaxps_avx(auVar116,auVar255);
      auVar32._4_4_ = auVar154._4_4_ * auVar154._4_4_ * (fVar224 * fVar224 + fVar226 * fVar226);
      auVar32._0_4_ = auVar154._0_4_ * auVar154._0_4_ * (fVar221 * fVar221 + fVar222 * fVar222);
      auVar32._8_4_ = auVar154._8_4_ * auVar154._8_4_ * (fVar230 * fVar230 + fVar239 * fVar239);
      auVar32._12_4_ = auVar154._12_4_ * auVar154._12_4_ * (fVar243 * fVar243 + fVar245 * fVar245);
      auVar32._16_4_ = auVar154._16_4_ * auVar154._16_4_ * (fVar246 * fVar246 + fVar247 * fVar247);
      auVar32._20_4_ = auVar154._20_4_ * auVar154._20_4_ * (fVar248 * fVar248 + fVar258 * fVar258);
      auVar32._24_4_ = auVar154._24_4_ * auVar154._24_4_ * (fVar260 * fVar260 + fVar262 * fVar262);
      auVar32._28_4_ = auVar322._28_4_ + fStack_5e4;
      auVar33._4_4_ = auVar219._4_4_ * auVar219._4_4_;
      auVar33._0_4_ = auVar219._0_4_ * auVar219._0_4_;
      auVar33._8_4_ = auVar219._8_4_ * auVar219._8_4_;
      auVar33._12_4_ = auVar219._12_4_ * auVar219._12_4_;
      auVar33._16_4_ = auVar219._16_4_ * auVar219._16_4_;
      auVar33._20_4_ = auVar219._20_4_ * auVar219._20_4_;
      auVar33._24_4_ = auVar219._24_4_ * auVar219._24_4_;
      auVar33._28_4_ = auVar219._28_4_;
      auVar154 = vcmpps_avx(auVar33,auVar32,2);
      fVar221 = auVar210._0_4_ * 4.7683716e-07;
      auVar302 = ZEXT464((uint)fVar221);
      local_4a0 = (float)(int)uVar18;
      fStack_49c = 0.0;
      fStack_498 = 0.0;
      fStack_494 = 0.0;
      auVar210 = vshufps_avx(ZEXT416((uint)local_4a0),ZEXT416((uint)local_4a0),0);
      auVar214._16_16_ = auVar210;
      auVar214._0_16_ = auVar210;
      auVar219 = vcmpps_avx(_DAT_01faff40,auVar214,1);
      auVar220 = ZEXT3264(auVar219);
      auVar210 = vpermilps_avx(auVar172,0xaa);
      register0x00001450 = auVar210;
      _local_560 = auVar210;
      auVar198 = vpermilps_avx(auVar342,0xaa);
      register0x00001550 = auVar198;
      _local_460 = auVar198;
      auVar9 = vpermilps_avx(auVar252,0xaa);
      register0x00001590 = auVar9;
      _local_c0 = auVar9;
      auVar10 = vpermilps_avx(auVar296,0xaa);
      register0x00001310 = auVar10;
      _local_800 = auVar10;
      auVar24 = auVar219 & auVar154;
      local_6c0._0_16_ = ZEXT416(*(uint *)(ray + k * 4 + 0x30));
      _local_780 = ZEXT416((uint)fVar221);
      local_850 = auVar233._0_4_;
      fStack_84c = auVar233._4_4_;
      fStack_848 = auVar233._8_4_;
      fStack_844 = auVar233._12_4_;
      local_270 = auVar233._0_8_;
      uVar127 = local_270;
      uStack_268 = auVar233._8_8_;
      uVar128 = uStack_268;
      local_860 = auVar196._0_4_;
      fStack_85c = auVar196._4_4_;
      fStack_858 = auVar196._8_4_;
      fStack_854 = auVar196._12_4_;
      local_260 = auVar196._0_8_;
      uVar129 = local_260;
      uStack_258 = auVar196._8_8_;
      uVar130 = uStack_258;
      local_8a0 = auVar27._0_4_;
      fStack_89c = auVar27._4_4_;
      fStack_898 = auVar27._8_4_;
      fStack_894 = auVar27._12_4_;
      fVar222 = fVar341;
      fVar224 = fVar347;
      fVar226 = fVar348;
      if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar24 >> 0x7f,0) == '\0') &&
            (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar24 >> 0xbf,0) == '\0') &&
          (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar24[0x1f])
      {
        auVar353 = ZEXT3264(auVar148);
        auVar290 = ZEXT3264(_local_660);
      }
      else {
        _local_340 = vandps_avx(auVar154,auVar219);
        fVar281 = auVar210._0_4_;
        fVar291 = auVar210._4_4_;
        fVar292 = auVar210._8_4_;
        fVar293 = auVar210._12_4_;
        fVar307 = auVar198._0_4_;
        fVar314 = auVar198._4_4_;
        fVar316 = auVar198._8_4_;
        fVar318 = auVar198._12_4_;
        fVar326 = auVar9._0_4_;
        fVar328 = auVar9._4_4_;
        fVar350 = auVar9._8_4_;
        fVar354 = auVar9._12_4_;
        fVar230 = auVar10._0_4_;
        fVar239 = auVar10._4_4_;
        fVar243 = auVar10._8_4_;
        fVar245 = auVar10._12_4_;
        local_360._0_4_ =
             fVar281 * fVar206 + fVar307 * fVar157 + fVar326 * fVar264 + fVar227 * fVar230;
        local_360._4_4_ =
             fVar291 * fVar159 + fVar314 * fVar158 + fVar328 * fVar265 + fVar295 * fVar239;
        fStack_358 = fVar292 * fVar161 + fVar316 * fVar160 + fVar350 * fVar266 + fVar168 * fVar243;
        fStack_354 = fVar293 * fVar163 + fVar318 * fVar162 + fVar354 * fVar303 + fVar280 * fVar245;
        fStack_350 = fVar281 * fVar165 + fVar307 * fVar164 + fVar326 * fVar225 + fVar229 * fVar230;
        fStack_34c = fVar291 * fVar167 + fVar314 * fVar166 + fVar328 * fVar294 + fVar331 * fVar239;
        fStack_348 = fVar292 * fVar207 + fVar316 * fVar139 + fVar350 * fVar304 + fVar138 * fVar243;
        fStack_344 = local_340._28_4_ +
                     auVar219._28_4_ + *(float *)(bezier_basis1 + lVar133 + 0x924) + 0.0;
        local_500._0_4_ = auVar123._0_4_;
        local_500._4_4_ = auVar123._4_4_;
        fStack_4f8 = auVar123._8_4_;
        fStack_4f4 = auVar123._12_4_;
        fStack_4f0 = auVar123._16_4_;
        fStack_4ec = auVar123._20_4_;
        fStack_4e8 = auVar123._24_4_;
        local_580._0_4_ = auVar122._0_4_;
        local_580._4_4_ = auVar122._4_4_;
        fStack_578 = auVar122._8_4_;
        fStack_574 = auVar122._12_4_;
        fStack_570 = auVar122._16_4_;
        fStack_56c = auVar122._20_4_;
        fStack_568 = auVar122._24_4_;
        local_620._0_4_ = auVar121._0_4_;
        local_620._4_4_ = auVar121._4_4_;
        fStack_618 = auVar121._8_4_;
        fStack_614 = auVar121._12_4_;
        fStack_610 = auVar121._16_4_;
        fStack_60c = auVar121._20_4_;
        fStack_608 = auVar121._24_4_;
        local_740._0_4_ = auVar120._0_4_;
        local_740._4_4_ = auVar120._4_4_;
        fStack_738 = auVar120._8_4_;
        fStack_734 = auVar120._12_4_;
        fStack_730 = auVar120._16_4_;
        fStack_72c = auVar120._20_4_;
        fStack_728 = auVar120._24_4_;
        local_620._0_4_ =
             fVar281 * (float)local_500._0_4_ +
             fVar307 * (float)local_580._0_4_ +
             fVar326 * (float)local_620._0_4_ + fVar230 * (float)local_740._0_4_;
        local_620._4_4_ =
             fVar291 * (float)local_500._4_4_ +
             fVar314 * (float)local_580._4_4_ +
             fVar328 * (float)local_620._4_4_ + fVar239 * (float)local_740._4_4_;
        fStack_618 = fVar292 * fStack_4f8 +
                     fVar316 * fStack_578 + fVar350 * fStack_618 + fVar243 * fStack_738;
        fStack_614 = fVar293 * fStack_4f4 +
                     fVar318 * fStack_574 + fVar354 * fStack_614 + fVar245 * fStack_734;
        fStack_610 = fVar281 * fStack_4f0 +
                     fVar307 * fStack_570 + fVar326 * fStack_610 + fVar230 * fStack_730;
        fStack_60c = fVar291 * fStack_4ec +
                     fVar314 * fStack_56c + fVar328 * fStack_60c + fVar239 * fStack_72c;
        fStack_608 = fVar292 * fStack_4e8 +
                     fVar316 * fStack_568 + fVar350 * fStack_608 + fVar243 * fStack_728;
        fStack_604 = fVar330 + fStack_344 + local_340._28_4_ + auVar219._28_4_;
        fVar246 = *(float *)(bezier_basis0 + lVar133 + 0x1210);
        fVar247 = *(float *)(bezier_basis0 + lVar133 + 0x1214);
        fVar248 = *(float *)(bezier_basis0 + lVar133 + 0x1218);
        fVar258 = *(float *)(bezier_basis0 + lVar133 + 0x121c);
        fVar260 = *(float *)(bezier_basis0 + lVar133 + 0x1220);
        fVar262 = *(float *)(bezier_basis0 + lVar133 + 0x1224);
        fVar264 = *(float *)(bezier_basis0 + lVar133 + 0x1228);
        fVar265 = *(float *)(bezier_basis0 + lVar133 + 0x1694);
        fVar266 = *(float *)(bezier_basis0 + lVar133 + 0x1698);
        fVar303 = *(float *)(bezier_basis0 + lVar133 + 0x169c);
        fVar225 = *(float *)(bezier_basis0 + lVar133 + 0x16a0);
        fVar294 = *(float *)(bezier_basis0 + lVar133 + 0x16a4);
        fVar304 = *(float *)(bezier_basis0 + lVar133 + 0x16a8);
        fVar305 = *(float *)(bezier_basis0 + lVar133 + 0x16ac);
        fVar227 = *(float *)(bezier_basis0 + lVar133 + 0x1b18);
        fVar295 = *(float *)(bezier_basis0 + lVar133 + 0x1b1c);
        fVar168 = *(float *)(bezier_basis0 + lVar133 + 0x1b20);
        fVar280 = *(float *)(bezier_basis0 + lVar133 + 0x1b24);
        fVar229 = *(float *)(bezier_basis0 + lVar133 + 0x1b28);
        fVar331 = *(float *)(bezier_basis0 + lVar133 + 0x1b2c);
        fVar138 = *(float *)(bezier_basis0 + lVar133 + 0x1b30);
        fVar157 = *(float *)(bezier_basis0 + lVar133 + 0x1f9c);
        fVar158 = *(float *)(bezier_basis0 + lVar133 + 0x1fa0);
        fVar160 = *(float *)(bezier_basis0 + lVar133 + 0x1fa4);
        fVar162 = *(float *)(bezier_basis0 + lVar133 + 0x1fa8);
        fVar164 = *(float *)(bezier_basis0 + lVar133 + 0x1fac);
        fVar166 = *(float *)(bezier_basis0 + lVar133 + 0x1fb0);
        fVar139 = *(float *)(bezier_basis0 + lVar133 + 0x1fb4);
        fVar206 = *(float *)(bezier_basis0 + lVar133 + 0x1b34) +
                  *(float *)(bezier_basis0 + lVar133 + 0x1fb8);
        fVar159 = *(float *)(bezier_basis0 + lVar133 + 0x16b0) + fVar206;
        local_580._4_4_ =
             fVar223 * fVar247 + fVar259 * fVar266 + fVar313 * fVar295 + fVar240 * fVar158;
        local_580._0_4_ =
             fVar208 * fVar246 + fVar249 * fVar265 + fVar306 * fVar227 + fVar231 * fVar157;
        fStack_578 = fVar228 * fVar248 + fVar261 * fVar303 + fVar315 * fVar168 + fVar242 * fVar160;
        fStack_574 = fVar241 * fVar258 + fVar263 * fVar225 + fVar317 * fVar280 + fVar244 * fVar162;
        fStack_570 = fVar208 * fVar260 + fVar249 * fVar294 + fVar306 * fVar229 + fVar231 * fVar164;
        fStack_56c = fVar223 * fVar262 + fVar259 * fVar304 + fVar313 * fVar331 + fVar240 * fVar166;
        fStack_568 = fVar228 * fVar264 + fVar261 * fVar305 + fVar315 * fVar138 + fVar242 * fVar139;
        fStack_564 = *(float *)(bezier_basis0 + lVar133 + 0x16b0) +
                     *(float *)(bezier_basis0 + lVar133 + 0x1fb8) +
                     fVar293 + *(float *)(bezier_basis1 + lVar133 + 0x4a0);
        auVar272._0_4_ =
             fVar319 * fVar246 + fVar341 * fVar265 + fVar267 * fVar227 + fVar357 * fVar157;
        auVar272._4_4_ =
             fVar327 * fVar247 + fVar347 * fVar266 + fVar277 * fVar295 + fVar361 * fVar158;
        auVar272._8_4_ =
             fVar329 * fVar248 + fVar348 * fVar303 + fVar278 * fVar168 + fVar362 * fVar160;
        auVar272._12_4_ =
             fVar330 * fVar258 + fVar349 * fVar225 + fVar279 * fVar280 + fVar363 * fVar162;
        auVar272._16_4_ =
             fVar319 * fVar260 + fVar341 * fVar294 + fVar267 * fVar229 + fVar357 * fVar164;
        auVar272._20_4_ =
             fVar327 * fVar262 + fVar347 * fVar304 + fVar277 * fVar331 + fVar361 * fVar166;
        auVar272._24_4_ =
             fVar329 * fVar264 + fVar348 * fVar305 + fVar278 * fVar138 + fVar362 * fVar139;
        auVar272._28_4_ =
             fVar206 + fVar293 + *(float *)(bezier_basis1 + lVar133 + 0x4a0) +
                       fVar293 + *(float *)(bezier_basis1 + lVar133 + 0x1c);
        local_500._4_4_ =
             fVar291 * fVar247 + fVar314 * fVar266 + fVar328 * fVar295 + fVar239 * fVar158;
        local_500._0_4_ =
             fVar281 * fVar246 + fVar307 * fVar265 + fVar326 * fVar227 + fVar230 * fVar157;
        fStack_4f8 = fVar292 * fVar248 + fVar316 * fVar303 + fVar350 * fVar168 + fVar243 * fVar160;
        fStack_4f4 = fVar293 * fVar258 + fVar318 * fVar225 + fVar354 * fVar280 + fVar245 * fVar162;
        fStack_4f0 = fVar281 * fVar260 + fVar307 * fVar294 + fVar326 * fVar229 + fVar230 * fVar164;
        fStack_4ec = fVar291 * fVar262 + fVar314 * fVar304 + fVar328 * fVar331 + fVar239 * fVar166;
        fStack_4e8 = fVar292 * fVar264 + fVar316 * fVar305 + fVar350 * fVar138 + fVar243 * fVar139;
        fStack_4e4 = *(float *)(bezier_basis0 + lVar133 + 0x122c) + fVar159;
        fVar246 = *(float *)(bezier_basis1 + lVar133 + 0x1b18);
        fVar247 = *(float *)(bezier_basis1 + lVar133 + 0x1b1c);
        fVar248 = *(float *)(bezier_basis1 + lVar133 + 0x1b20);
        fVar258 = *(float *)(bezier_basis1 + lVar133 + 0x1b24);
        fVar260 = *(float *)(bezier_basis1 + lVar133 + 0x1b28);
        fVar262 = *(float *)(bezier_basis1 + lVar133 + 0x1b2c);
        fVar264 = *(float *)(bezier_basis1 + lVar133 + 0x1b30);
        fVar265 = *(float *)(bezier_basis1 + lVar133 + 0x1f9c);
        fVar266 = *(float *)(bezier_basis1 + lVar133 + 0x1fa0);
        fVar303 = *(float *)(bezier_basis1 + lVar133 + 0x1fa4);
        fVar225 = *(float *)(bezier_basis1 + lVar133 + 0x1fa8);
        fVar294 = *(float *)(bezier_basis1 + lVar133 + 0x1fac);
        fVar304 = *(float *)(bezier_basis1 + lVar133 + 0x1fb0);
        fVar305 = *(float *)(bezier_basis1 + lVar133 + 0x1fb4);
        fVar227 = *(float *)(bezier_basis1 + lVar133 + 0x1694);
        fVar295 = *(float *)(bezier_basis1 + lVar133 + 0x1698);
        fVar168 = *(float *)(bezier_basis1 + lVar133 + 0x169c);
        fVar280 = *(float *)(bezier_basis1 + lVar133 + 0x16a0);
        fVar229 = *(float *)(bezier_basis1 + lVar133 + 0x16a4);
        fVar331 = *(float *)(bezier_basis1 + lVar133 + 0x16a8);
        fVar138 = *(float *)(bezier_basis1 + lVar133 + 0x16ac);
        fVar157 = *(float *)(bezier_basis1 + lVar133 + 0x1210);
        fVar158 = *(float *)(bezier_basis1 + lVar133 + 0x1214);
        fVar160 = *(float *)(bezier_basis1 + lVar133 + 0x1218);
        fVar162 = *(float *)(bezier_basis1 + lVar133 + 0x121c);
        fVar164 = *(float *)(bezier_basis1 + lVar133 + 0x1220);
        fVar166 = *(float *)(bezier_basis1 + lVar133 + 0x1224);
        fVar139 = *(float *)(bezier_basis1 + lVar133 + 0x1228);
        auVar288._0_4_ =
             fVar208 * fVar157 + fVar249 * fVar227 + fVar306 * fVar246 + fVar231 * fVar265;
        auVar288._4_4_ =
             fVar223 * fVar158 + fVar259 * fVar295 + fVar313 * fVar247 + fVar240 * fVar266;
        auVar288._8_4_ =
             fVar228 * fVar160 + fVar261 * fVar168 + fVar315 * fVar248 + fVar242 * fVar303;
        auVar288._12_4_ =
             fVar241 * fVar162 + fVar263 * fVar280 + fVar317 * fVar258 + fVar244 * fVar225;
        auVar288._16_4_ =
             fVar208 * fVar164 + fVar249 * fVar229 + fVar306 * fVar260 + fVar231 * fVar294;
        auVar288._20_4_ =
             fVar223 * fVar166 + fVar259 * fVar331 + fVar313 * fVar262 + fVar240 * fVar304;
        auVar288._24_4_ =
             fVar228 * fVar139 + fVar261 * fVar138 + fVar315 * fVar264 + fVar242 * fVar305;
        auVar288._28_4_ = fVar317 + fVar317 + fVar293 + fVar159;
        auVar309._0_4_ =
             fVar319 * fVar157 + fVar341 * fVar227 + fVar267 * fVar246 + fVar357 * fVar265;
        auVar309._4_4_ =
             fVar327 * fVar158 + fVar347 * fVar295 + fVar277 * fVar247 + fVar361 * fVar266;
        auVar309._8_4_ =
             fVar329 * fVar160 + fVar348 * fVar168 + fVar278 * fVar248 + fVar362 * fVar303;
        auVar309._12_4_ =
             fVar330 * fVar162 + fVar349 * fVar280 + fVar279 * fVar258 + fVar363 * fVar225;
        auVar309._16_4_ =
             fVar319 * fVar164 + fVar341 * fVar229 + fVar267 * fVar260 + fVar357 * fVar294;
        auVar309._20_4_ =
             fVar327 * fVar166 + fVar347 * fVar331 + fVar277 * fVar262 + fVar361 * fVar304;
        auVar309._24_4_ =
             fVar329 * fVar139 + fVar348 * fVar138 + fVar278 * fVar264 + fVar362 * fVar305;
        auVar309._28_4_ = fVar317 + fVar317 + fVar317 + fVar293;
        auVar204._0_4_ =
             fVar281 * fVar157 + fVar307 * fVar227 + fVar326 * fVar246 + fVar265 * fVar230;
        auVar204._4_4_ =
             fVar291 * fVar158 + fVar314 * fVar295 + fVar328 * fVar247 + fVar266 * fVar239;
        auVar204._8_4_ =
             fVar292 * fVar160 + fVar316 * fVar168 + fVar350 * fVar248 + fVar303 * fVar243;
        auVar204._12_4_ =
             fVar293 * fVar162 + fVar318 * fVar280 + fVar354 * fVar258 + fVar225 * fVar245;
        auVar204._16_4_ =
             fVar281 * fVar164 + fVar307 * fVar229 + fVar326 * fVar260 + fVar294 * fVar230;
        auVar204._20_4_ =
             fVar291 * fVar166 + fVar314 * fVar331 + fVar328 * fVar262 + fVar304 * fVar239;
        auVar204._24_4_ =
             fVar292 * fVar139 + fVar316 * fVar138 + fVar350 * fVar264 + fVar305 * fVar243;
        auVar204._28_4_ =
             *(float *)(bezier_basis1 + lVar133 + 0x122c) +
             *(float *)(bezier_basis1 + lVar133 + 0x16b0) +
             *(float *)(bezier_basis1 + lVar133 + 0x1b34) +
             *(float *)(bezier_basis1 + lVar133 + 0x1fb8);
        auVar235._8_4_ = 0x7fffffff;
        auVar235._0_8_ = 0x7fffffff7fffffff;
        auVar235._12_4_ = 0x7fffffff;
        auVar235._16_4_ = 0x7fffffff;
        auVar235._20_4_ = 0x7fffffff;
        auVar235._24_4_ = 0x7fffffff;
        auVar235._28_4_ = 0x7fffffff;
        auVar154 = vandps_avx(_local_580,auVar235);
        auVar219 = vandps_avx(auVar272,auVar235);
        auVar219 = vmaxps_avx(auVar154,auVar219);
        auVar154 = vandps_avx(auVar235,_local_500);
        auVar154 = vmaxps_avx(auVar219,auVar154);
        auVar233 = vpermilps_avx(ZEXT416((uint)fVar221),0);
        auVar273._16_16_ = auVar233;
        auVar273._0_16_ = auVar233;
        auVar154 = vcmpps_avx(auVar154,auVar273,1);
        auVar24 = vblendvps_avx(_local_580,auVar23,auVar154);
        auVar360 = vblendvps_avx(auVar272,auVar322,auVar154);
        auVar154 = vandps_avx(auVar288,auVar235);
        auVar219 = vandps_avx(auVar309,auVar235);
        auVar25 = vmaxps_avx(auVar154,auVar219);
        auVar154 = vandps_avx(auVar204,auVar235);
        auVar154 = vmaxps_avx(auVar25,auVar154);
        auVar25 = vcmpps_avx(auVar154,auVar273,1);
        auVar154 = vblendvps_avx(auVar288,auVar23,auVar25);
        auVar23 = vblendvps_avx(auVar309,auVar322,auVar25);
        fVar138 = auVar24._0_4_;
        fVar157 = auVar24._4_4_;
        fVar158 = auVar24._8_4_;
        fVar160 = auVar24._12_4_;
        fVar162 = auVar24._16_4_;
        fVar164 = auVar24._20_4_;
        fVar166 = auVar24._24_4_;
        fVar139 = auVar154._0_4_;
        fVar206 = auVar154._4_4_;
        fVar159 = auVar154._8_4_;
        fVar161 = auVar154._12_4_;
        fVar163 = auVar154._16_4_;
        fVar165 = auVar154._20_4_;
        fVar167 = auVar154._24_4_;
        fVar207 = -auVar154._28_4_;
        fVar208 = auVar360._0_4_;
        fVar230 = auVar360._4_4_;
        fVar245 = auVar360._8_4_;
        fVar258 = auVar360._12_4_;
        fVar265 = auVar360._16_4_;
        fVar294 = auVar360._20_4_;
        fVar295 = auVar360._24_4_;
        auVar144._0_4_ = fVar208 * fVar208 + fVar138 * fVar138;
        auVar144._4_4_ = fVar230 * fVar230 + fVar157 * fVar157;
        auVar144._8_4_ = fVar245 * fVar245 + fVar158 * fVar158;
        auVar144._12_4_ = fVar258 * fVar258 + fVar160 * fVar160;
        auVar144._16_4_ = fVar265 * fVar265 + fVar162 * fVar162;
        auVar144._20_4_ = fVar294 * fVar294 + fVar164 * fVar164;
        auVar144._24_4_ = fVar295 * fVar295 + fVar166 * fVar166;
        auVar144._28_4_ = auVar309._28_4_ + auVar24._28_4_;
        auVar322 = vrsqrtps_avx(auVar144);
        fVar221 = auVar322._0_4_;
        fVar223 = auVar322._4_4_;
        auVar34._4_4_ = fVar223 * 1.5;
        auVar34._0_4_ = fVar221 * 1.5;
        fVar228 = auVar322._8_4_;
        auVar34._8_4_ = fVar228 * 1.5;
        fVar239 = auVar322._12_4_;
        auVar34._12_4_ = fVar239 * 1.5;
        fVar241 = auVar322._16_4_;
        auVar34._16_4_ = fVar241 * 1.5;
        fVar243 = auVar322._20_4_;
        auVar34._20_4_ = fVar243 * 1.5;
        fVar246 = auVar322._24_4_;
        fVar331 = auVar219._28_4_;
        auVar34._24_4_ = fVar246 * 1.5;
        auVar34._28_4_ = fVar331;
        auVar35._4_4_ = fVar223 * fVar223 * fVar223 * auVar144._4_4_ * 0.5;
        auVar35._0_4_ = fVar221 * fVar221 * fVar221 * auVar144._0_4_ * 0.5;
        auVar35._8_4_ = fVar228 * fVar228 * fVar228 * auVar144._8_4_ * 0.5;
        auVar35._12_4_ = fVar239 * fVar239 * fVar239 * auVar144._12_4_ * 0.5;
        auVar35._16_4_ = fVar241 * fVar241 * fVar241 * auVar144._16_4_ * 0.5;
        auVar35._20_4_ = fVar243 * fVar243 * fVar243 * auVar144._20_4_ * 0.5;
        auVar35._24_4_ = fVar246 * fVar246 * fVar246 * auVar144._24_4_ * 0.5;
        auVar35._28_4_ = auVar144._28_4_;
        auVar219 = vsubps_avx(auVar34,auVar35);
        fVar221 = auVar219._0_4_;
        fVar239 = auVar219._4_4_;
        fVar246 = auVar219._8_4_;
        fVar260 = auVar219._12_4_;
        fVar266 = auVar219._16_4_;
        fVar304 = auVar219._20_4_;
        fVar168 = auVar219._24_4_;
        fVar223 = auVar23._0_4_;
        fVar241 = auVar23._4_4_;
        fVar247 = auVar23._8_4_;
        fVar262 = auVar23._12_4_;
        fVar303 = auVar23._16_4_;
        fVar305 = auVar23._20_4_;
        fVar280 = auVar23._24_4_;
        auVar145._0_4_ = fVar223 * fVar223 + fVar139 * fVar139;
        auVar145._4_4_ = fVar241 * fVar241 + fVar206 * fVar206;
        auVar145._8_4_ = fVar247 * fVar247 + fVar159 * fVar159;
        auVar145._12_4_ = fVar262 * fVar262 + fVar161 * fVar161;
        auVar145._16_4_ = fVar303 * fVar303 + fVar163 * fVar163;
        auVar145._20_4_ = fVar305 * fVar305 + fVar165 * fVar165;
        auVar145._24_4_ = fVar280 * fVar280 + fVar167 * fVar167;
        auVar145._28_4_ = auVar154._28_4_ + auVar219._28_4_;
        auVar154 = vrsqrtps_avx(auVar145);
        fVar228 = auVar154._0_4_;
        fVar243 = auVar154._4_4_;
        auVar36._4_4_ = fVar243 * 1.5;
        auVar36._0_4_ = fVar228 * 1.5;
        fVar248 = auVar154._8_4_;
        auVar36._8_4_ = fVar248 * 1.5;
        fVar264 = auVar154._12_4_;
        auVar36._12_4_ = fVar264 * 1.5;
        fVar225 = auVar154._16_4_;
        auVar36._16_4_ = fVar225 * 1.5;
        fVar227 = auVar154._20_4_;
        auVar36._20_4_ = fVar227 * 1.5;
        fVar229 = auVar154._24_4_;
        auVar36._24_4_ = fVar229 * 1.5;
        auVar36._28_4_ = fVar331;
        auVar37._4_4_ = fVar243 * fVar243 * fVar243 * auVar145._4_4_ * 0.5;
        auVar37._0_4_ = fVar228 * fVar228 * fVar228 * auVar145._0_4_ * 0.5;
        auVar37._8_4_ = fVar248 * fVar248 * fVar248 * auVar145._8_4_ * 0.5;
        auVar37._12_4_ = fVar264 * fVar264 * fVar264 * auVar145._12_4_ * 0.5;
        auVar37._16_4_ = fVar225 * fVar225 * fVar225 * auVar145._16_4_ * 0.5;
        auVar37._20_4_ = fVar227 * fVar227 * fVar227 * auVar145._20_4_ * 0.5;
        auVar37._24_4_ = fVar229 * fVar229 * fVar229 * auVar145._24_4_ * 0.5;
        auVar37._28_4_ = auVar145._28_4_;
        auVar154 = vsubps_avx(auVar36,auVar37);
        fVar228 = auVar154._0_4_;
        fVar243 = auVar154._4_4_;
        fVar248 = auVar154._8_4_;
        fVar264 = auVar154._12_4_;
        fVar225 = auVar154._16_4_;
        fVar227 = auVar154._20_4_;
        fVar229 = auVar154._24_4_;
        fVar208 = fVar169 * fVar208 * fVar221;
        fVar230 = fVar185 * fVar230 * fVar239;
        auVar38._4_4_ = fVar230;
        auVar38._0_4_ = fVar208;
        fVar245 = fVar186 * fVar245 * fVar246;
        auVar38._8_4_ = fVar245;
        fVar258 = fVar187 * fVar258 * fVar260;
        auVar38._12_4_ = fVar258;
        fVar265 = fVar188 * fVar265 * fVar266;
        auVar38._16_4_ = fVar265;
        fVar294 = fVar189 * fVar294 * fVar304;
        auVar38._20_4_ = fVar294;
        fVar295 = fVar190 * fVar295 * fVar168;
        auVar38._24_4_ = fVar295;
        auVar38._28_4_ = fVar207;
        local_740._4_4_ = auVar336._4_4_ + fVar230;
        local_740._0_4_ = auVar336._0_4_ + fVar208;
        fStack_738 = auVar336._8_4_ + fVar245;
        fStack_734 = auVar336._12_4_ + fVar258;
        fStack_730 = auVar336._16_4_ + fVar265;
        fStack_72c = auVar336._20_4_ + fVar294;
        fStack_728 = auVar336._24_4_ + fVar295;
        fStack_724 = auVar336._28_4_ + fVar207;
        fVar208 = fVar169 * fVar221 * -fVar138;
        fVar230 = fVar185 * fVar239 * -fVar157;
        auVar39._4_4_ = fVar230;
        auVar39._0_4_ = fVar208;
        fVar245 = fVar186 * fVar246 * -fVar158;
        auVar39._8_4_ = fVar245;
        fVar258 = fVar187 * fVar260 * -fVar160;
        auVar39._12_4_ = fVar258;
        fVar265 = fVar188 * fVar266 * -fVar162;
        auVar39._16_4_ = fVar265;
        fVar294 = fVar189 * fVar304 * -fVar164;
        auVar39._20_4_ = fVar294;
        fVar295 = fVar190 * fVar168 * -fVar166;
        auVar39._24_4_ = fVar295;
        auVar39._28_4_ = fVar331;
        local_4e0._4_4_ = fVar230 + auVar299._4_4_;
        local_4e0._0_4_ = fVar208 + auVar299._0_4_;
        fStack_4d8 = fVar245 + auVar299._8_4_;
        fStack_4d4 = fVar258 + auVar299._12_4_;
        auStack_4d0._0_4_ = fVar265 + auVar299._16_4_;
        auStack_4d0._4_4_ = fVar294 + auVar299._20_4_;
        fStack_4c8 = fVar295 + auVar299._24_4_;
        fStack_4c4 = fVar331 + 0.0;
        fVar208 = fVar169 * fVar221 * 0.0;
        fVar221 = fVar185 * fVar239 * 0.0;
        auVar40._4_4_ = fVar221;
        auVar40._0_4_ = fVar208;
        fVar230 = fVar186 * fVar246 * 0.0;
        auVar40._8_4_ = fVar230;
        fVar239 = fVar187 * fVar260 * 0.0;
        auVar40._12_4_ = fVar239;
        fVar245 = fVar188 * fVar266 * 0.0;
        auVar40._16_4_ = fVar245;
        fVar246 = fVar189 * fVar304 * 0.0;
        auVar40._20_4_ = fVar246;
        fVar258 = fVar190 * fVar168 * 0.0;
        auVar40._24_4_ = fVar258;
        auVar40._28_4_ = fVar263;
        auVar274._0_4_ = fVar208 + (float)local_620._0_4_;
        auVar274._4_4_ = fVar221 + (float)local_620._4_4_;
        auVar274._8_4_ = fVar230 + fStack_618;
        auVar274._12_4_ = fVar239 + fStack_614;
        auVar274._16_4_ = fVar245 + fStack_610;
        auVar274._20_4_ = fVar246 + fStack_60c;
        auVar274._24_4_ = fVar258 + fStack_608;
        auVar274._28_4_ = fVar263 + fStack_604;
        fVar208 = auVar255._0_4_ * fVar223 * fVar228;
        fVar221 = auVar255._4_4_ * fVar241 * fVar243;
        auVar41._4_4_ = fVar221;
        auVar41._0_4_ = fVar208;
        fVar223 = auVar255._8_4_ * fVar247 * fVar248;
        auVar41._8_4_ = fVar223;
        fVar230 = auVar255._12_4_ * fVar262 * fVar264;
        auVar41._12_4_ = fVar230;
        fVar239 = auVar255._16_4_ * fVar303 * fVar225;
        auVar41._16_4_ = fVar239;
        fVar241 = auVar255._20_4_ * fVar305 * fVar227;
        auVar41._20_4_ = fVar241;
        fVar245 = auVar255._24_4_ * fVar280 * fVar229;
        auVar41._24_4_ = fVar245;
        auVar41._28_4_ = auVar23._28_4_;
        auVar25 = vsubps_avx(auVar336,auVar38);
        auVar310._0_4_ = auVar234._0_4_ + fVar208;
        auVar310._4_4_ = auVar234._4_4_ + fVar221;
        auVar310._8_4_ = auVar234._8_4_ + fVar223;
        auVar310._12_4_ = auVar234._12_4_ + fVar230;
        auVar310._16_4_ = auVar234._16_4_ + fVar239;
        auVar310._20_4_ = auVar234._20_4_ + fVar241;
        auVar310._24_4_ = auVar234._24_4_ + fVar245;
        auVar310._28_4_ = auVar234._28_4_ + auVar23._28_4_;
        fVar208 = auVar255._0_4_ * fVar228 * -fVar139;
        fVar221 = auVar255._4_4_ * fVar243 * -fVar206;
        auVar42._4_4_ = fVar221;
        auVar42._0_4_ = fVar208;
        fVar223 = auVar255._8_4_ * fVar248 * -fVar159;
        auVar42._8_4_ = fVar223;
        fVar230 = auVar255._12_4_ * fVar264 * -fVar161;
        auVar42._12_4_ = fVar230;
        fVar239 = auVar255._16_4_ * fVar225 * -fVar163;
        auVar42._16_4_ = fVar239;
        fVar241 = auVar255._20_4_ * fVar227 * -fVar165;
        auVar42._20_4_ = fVar241;
        fVar245 = auVar255._24_4_ * fVar229 * -fVar167;
        auVar42._24_4_ = fVar245;
        auVar42._28_4_ = fVar318;
        auVar26 = vsubps_avx(auVar299,auVar39);
        auVar321._0_4_ = fVar208 + (float)local_600._0_4_;
        auVar321._4_4_ = fVar221 + (float)local_600._4_4_;
        auVar321._8_4_ = fVar223 + fStack_5f8;
        auVar321._12_4_ = fVar230 + fStack_5f4;
        auVar321._16_4_ = fVar239 + fStack_5f0;
        auVar321._20_4_ = fVar241 + fStack_5ec;
        auVar321._24_4_ = fVar245 + fStack_5e8;
        auVar321._28_4_ = fVar318 + fStack_5e4;
        fVar208 = auVar255._0_4_ * fVar228 * 0.0;
        fVar221 = auVar255._4_4_ * fVar243 * 0.0;
        auVar43._4_4_ = fVar221;
        auVar43._0_4_ = fVar208;
        fVar223 = auVar255._8_4_ * fVar248 * 0.0;
        auVar43._8_4_ = fVar223;
        fVar228 = auVar255._12_4_ * fVar264 * 0.0;
        auVar43._12_4_ = fVar228;
        fVar230 = auVar255._16_4_ * fVar225 * 0.0;
        auVar43._16_4_ = fVar230;
        fVar239 = auVar255._20_4_ * fVar227 * 0.0;
        auVar43._20_4_ = fVar239;
        fVar241 = auVar255._24_4_ * fVar229 * 0.0;
        auVar43._24_4_ = fVar241;
        auVar43._28_4_ = 0x3f000000;
        auVar28 = vsubps_avx(_local_620,auVar40);
        auVar352._0_4_ = fVar208 + (float)local_360._0_4_;
        auVar352._4_4_ = fVar221 + (float)local_360._4_4_;
        auVar352._8_4_ = fVar223 + fStack_358;
        auVar352._12_4_ = fVar228 + fStack_354;
        auVar352._16_4_ = fVar230 + fStack_350;
        auVar352._20_4_ = fVar239 + fStack_34c;
        auVar352._24_4_ = fVar241 + fStack_348;
        auVar352._28_4_ = fStack_344 + 0.5;
        auVar154 = vsubps_avx(auVar234,auVar41);
        auVar219 = vsubps_avx(_local_600,auVar42);
        auVar142 = vsubps_avx(_local_360,auVar43);
        auVar23 = vsubps_avx(auVar321,auVar26);
        auVar322 = vsubps_avx(auVar352,auVar28);
        auVar44._4_4_ = auVar28._4_4_ * auVar23._4_4_;
        auVar44._0_4_ = auVar28._0_4_ * auVar23._0_4_;
        auVar44._8_4_ = auVar28._8_4_ * auVar23._8_4_;
        auVar44._12_4_ = auVar28._12_4_ * auVar23._12_4_;
        auVar44._16_4_ = auVar28._16_4_ * auVar23._16_4_;
        auVar44._20_4_ = auVar28._20_4_ * auVar23._20_4_;
        auVar44._24_4_ = auVar28._24_4_ * auVar23._24_4_;
        auVar44._28_4_ = fVar244;
        auVar45._4_4_ = auVar26._4_4_ * auVar322._4_4_;
        auVar45._0_4_ = auVar26._0_4_ * auVar322._0_4_;
        auVar45._8_4_ = auVar26._8_4_ * auVar322._8_4_;
        auVar45._12_4_ = auVar26._12_4_ * auVar322._12_4_;
        auVar45._16_4_ = auVar26._16_4_ * auVar322._16_4_;
        auVar45._20_4_ = auVar26._20_4_ * auVar322._20_4_;
        auVar45._24_4_ = auVar26._24_4_ * auVar322._24_4_;
        auVar45._28_4_ = fStack_5e4;
        auVar24 = vsubps_avx(auVar45,auVar44);
        auVar46._4_4_ = auVar25._4_4_ * auVar322._4_4_;
        auVar46._0_4_ = auVar25._0_4_ * auVar322._0_4_;
        auVar46._8_4_ = auVar25._8_4_ * auVar322._8_4_;
        auVar46._12_4_ = auVar25._12_4_ * auVar322._12_4_;
        auVar46._16_4_ = auVar25._16_4_ * auVar322._16_4_;
        auVar46._20_4_ = auVar25._20_4_ * auVar322._20_4_;
        auVar46._24_4_ = auVar25._24_4_ * auVar322._24_4_;
        auVar46._28_4_ = auVar322._28_4_;
        auVar360 = vsubps_avx(auVar310,auVar25);
        auVar47._4_4_ = auVar28._4_4_ * auVar360._4_4_;
        auVar47._0_4_ = auVar28._0_4_ * auVar360._0_4_;
        auVar47._8_4_ = auVar28._8_4_ * auVar360._8_4_;
        auVar47._12_4_ = auVar28._12_4_ * auVar360._12_4_;
        auVar47._16_4_ = auVar28._16_4_ * auVar360._16_4_;
        auVar47._20_4_ = auVar28._20_4_ * auVar360._20_4_;
        auVar47._24_4_ = auVar28._24_4_ * auVar360._24_4_;
        auVar47._28_4_ = auVar234._28_4_;
        auVar29 = vsubps_avx(auVar47,auVar46);
        auVar48._4_4_ = auVar360._4_4_ * auVar26._4_4_;
        auVar48._0_4_ = auVar360._0_4_ * auVar26._0_4_;
        auVar48._8_4_ = auVar360._8_4_ * auVar26._8_4_;
        auVar48._12_4_ = auVar360._12_4_ * auVar26._12_4_;
        auVar48._16_4_ = auVar360._16_4_ * auVar26._16_4_;
        auVar48._20_4_ = auVar360._20_4_ * auVar26._20_4_;
        auVar48._24_4_ = auVar360._24_4_ * auVar26._24_4_;
        auVar48._28_4_ = auVar322._28_4_;
        auVar49._4_4_ = auVar25._4_4_ * auVar23._4_4_;
        auVar49._0_4_ = auVar25._0_4_ * auVar23._0_4_;
        auVar49._8_4_ = auVar25._8_4_ * auVar23._8_4_;
        auVar49._12_4_ = auVar25._12_4_ * auVar23._12_4_;
        auVar49._16_4_ = auVar25._16_4_ * auVar23._16_4_;
        auVar49._20_4_ = auVar25._20_4_ * auVar23._20_4_;
        auVar49._24_4_ = auVar25._24_4_ * auVar23._24_4_;
        auVar49._28_4_ = auVar23._28_4_;
        auVar23 = vsubps_avx(auVar49,auVar48);
        auVar146._0_4_ = auVar24._0_4_ * 0.0 + auVar23._0_4_ + auVar29._0_4_ * 0.0;
        auVar146._4_4_ = auVar24._4_4_ * 0.0 + auVar23._4_4_ + auVar29._4_4_ * 0.0;
        auVar146._8_4_ = auVar24._8_4_ * 0.0 + auVar23._8_4_ + auVar29._8_4_ * 0.0;
        auVar146._12_4_ = auVar24._12_4_ * 0.0 + auVar23._12_4_ + auVar29._12_4_ * 0.0;
        auVar146._16_4_ = auVar24._16_4_ * 0.0 + auVar23._16_4_ + auVar29._16_4_ * 0.0;
        auVar146._20_4_ = auVar24._20_4_ * 0.0 + auVar23._20_4_ + auVar29._20_4_ * 0.0;
        auVar146._24_4_ = auVar24._24_4_ * 0.0 + auVar23._24_4_ + auVar29._24_4_ * 0.0;
        auVar146._28_4_ = auVar23._28_4_ + auVar23._28_4_ + auVar29._28_4_;
        auVar29 = vcmpps_avx(auVar146,ZEXT432(0) << 0x20,2);
        auVar154 = vblendvps_avx(auVar154,_local_740,auVar29);
        auVar219 = vblendvps_avx(auVar219,_local_4e0,auVar29);
        auVar23 = vblendvps_avx(auVar142,auVar274,auVar29);
        auVar322 = vblendvps_avx(auVar25,auVar310,auVar29);
        auVar24 = vblendvps_avx(auVar26,auVar321,auVar29);
        auVar360 = vblendvps_avx(auVar28,auVar352,auVar29);
        auVar25 = vblendvps_avx(auVar310,auVar25,auVar29);
        auVar26 = vblendvps_avx(auVar321,auVar26,auVar29);
        auVar233 = vpackssdw_avx(local_340._0_16_,local_340._16_16_);
        _auStack_6d0 = auVar336._16_16_;
        auVar28 = vblendvps_avx(auVar352,auVar28,auVar29);
        auVar25 = vsubps_avx(auVar25,auVar154);
        auVar143 = vsubps_avx(auVar26,auVar219);
        auVar28 = vsubps_avx(auVar28,auVar23);
        auVar175 = vsubps_avx(auVar219,auVar24);
        fVar208 = auVar143._0_4_;
        fVar166 = auVar23._0_4_;
        fVar239 = auVar143._4_4_;
        fVar139 = auVar23._4_4_;
        auVar50._4_4_ = fVar139 * fVar239;
        auVar50._0_4_ = fVar166 * fVar208;
        fVar247 = auVar143._8_4_;
        fVar206 = auVar23._8_4_;
        auVar50._8_4_ = fVar206 * fVar247;
        fVar264 = auVar143._12_4_;
        fVar159 = auVar23._12_4_;
        auVar50._12_4_ = fVar159 * fVar264;
        fVar294 = auVar143._16_4_;
        fVar161 = auVar23._16_4_;
        auVar50._16_4_ = fVar161 * fVar294;
        fVar168 = auVar143._20_4_;
        fVar163 = auVar23._20_4_;
        auVar50._20_4_ = fVar163 * fVar168;
        fVar157 = auVar143._24_4_;
        fVar165 = auVar23._24_4_;
        auVar50._24_4_ = fVar165 * fVar157;
        auVar50._28_4_ = auVar26._28_4_;
        fVar221 = auVar219._0_4_;
        fVar259 = auVar28._0_4_;
        fVar241 = auVar219._4_4_;
        fVar261 = auVar28._4_4_;
        auVar51._4_4_ = fVar261 * fVar241;
        auVar51._0_4_ = fVar259 * fVar221;
        fVar248 = auVar219._8_4_;
        fVar263 = auVar28._8_4_;
        auVar51._8_4_ = fVar263 * fVar248;
        fVar265 = auVar219._12_4_;
        fVar267 = auVar28._12_4_;
        auVar51._12_4_ = fVar267 * fVar265;
        fVar304 = auVar219._16_4_;
        fVar277 = auVar28._16_4_;
        auVar51._16_4_ = fVar277 * fVar304;
        fVar280 = auVar219._20_4_;
        fVar278 = auVar28._20_4_;
        auVar51._20_4_ = fVar278 * fVar280;
        fVar158 = auVar219._24_4_;
        fVar279 = auVar28._24_4_;
        uVar8 = auVar142._28_4_;
        auVar51._24_4_ = fVar279 * fVar158;
        auVar51._28_4_ = uVar8;
        auVar26 = vsubps_avx(auVar51,auVar50);
        fVar223 = auVar154._0_4_;
        fVar243 = auVar154._4_4_;
        auVar52._4_4_ = fVar261 * fVar243;
        auVar52._0_4_ = fVar259 * fVar223;
        fVar258 = auVar154._8_4_;
        auVar52._8_4_ = fVar263 * fVar258;
        fVar266 = auVar154._12_4_;
        auVar52._12_4_ = fVar267 * fVar266;
        fVar305 = auVar154._16_4_;
        auVar52._16_4_ = fVar277 * fVar305;
        fVar229 = auVar154._20_4_;
        auVar52._20_4_ = fVar278 * fVar229;
        fVar160 = auVar154._24_4_;
        auVar52._24_4_ = fVar279 * fVar160;
        auVar52._28_4_ = uVar8;
        fVar228 = auVar25._0_4_;
        fVar245 = auVar25._4_4_;
        auVar53._4_4_ = fVar139 * fVar245;
        auVar53._0_4_ = fVar166 * fVar228;
        fVar260 = auVar25._8_4_;
        auVar53._8_4_ = fVar206 * fVar260;
        fVar303 = auVar25._12_4_;
        auVar53._12_4_ = fVar159 * fVar303;
        fVar227 = auVar25._16_4_;
        auVar53._16_4_ = fVar161 * fVar227;
        fVar331 = auVar25._20_4_;
        auVar53._20_4_ = fVar163 * fVar331;
        fVar162 = auVar25._24_4_;
        auVar53._24_4_ = fVar165 * fVar162;
        auVar53._28_4_ = auVar352._28_4_;
        auVar142 = vsubps_avx(auVar53,auVar52);
        auVar54._4_4_ = fVar241 * fVar245;
        auVar54._0_4_ = fVar221 * fVar228;
        auVar54._8_4_ = fVar248 * fVar260;
        auVar54._12_4_ = fVar265 * fVar303;
        auVar54._16_4_ = fVar304 * fVar227;
        auVar54._20_4_ = fVar280 * fVar331;
        auVar54._24_4_ = fVar158 * fVar162;
        auVar54._28_4_ = uVar8;
        auVar358._0_4_ = fVar223 * fVar208;
        auVar358._4_4_ = fVar243 * fVar239;
        auVar358._8_4_ = fVar258 * fVar247;
        auVar358._12_4_ = fVar266 * fVar264;
        auVar358._16_4_ = fVar305 * fVar294;
        auVar358._20_4_ = fVar229 * fVar168;
        auVar358._24_4_ = fVar160 * fVar157;
        auVar358._28_4_ = 0;
        auVar176 = vsubps_avx(auVar358,auVar54);
        auVar177 = vsubps_avx(auVar23,auVar360);
        fVar230 = auVar176._28_4_ + auVar142._28_4_;
        auVar179._0_4_ = auVar176._0_4_ + auVar142._0_4_ * 0.0 + auVar26._0_4_ * 0.0;
        auVar179._4_4_ = auVar176._4_4_ + auVar142._4_4_ * 0.0 + auVar26._4_4_ * 0.0;
        auVar179._8_4_ = auVar176._8_4_ + auVar142._8_4_ * 0.0 + auVar26._8_4_ * 0.0;
        auVar179._12_4_ = auVar176._12_4_ + auVar142._12_4_ * 0.0 + auVar26._12_4_ * 0.0;
        auVar179._16_4_ = auVar176._16_4_ + auVar142._16_4_ * 0.0 + auVar26._16_4_ * 0.0;
        auVar179._20_4_ = auVar176._20_4_ + auVar142._20_4_ * 0.0 + auVar26._20_4_ * 0.0;
        auVar179._24_4_ = auVar176._24_4_ + auVar142._24_4_ * 0.0 + auVar26._24_4_ * 0.0;
        auVar179._28_4_ = fVar230 + auVar26._28_4_;
        fVar167 = auVar175._0_4_;
        fVar207 = auVar175._4_4_;
        auVar55._4_4_ = fVar207 * auVar360._4_4_;
        auVar55._0_4_ = fVar167 * auVar360._0_4_;
        fVar231 = auVar175._8_4_;
        auVar55._8_4_ = fVar231 * auVar360._8_4_;
        fVar240 = auVar175._12_4_;
        auVar55._12_4_ = fVar240 * auVar360._12_4_;
        fVar242 = auVar175._16_4_;
        auVar55._16_4_ = fVar242 * auVar360._16_4_;
        fVar244 = auVar175._20_4_;
        auVar55._20_4_ = fVar244 * auVar360._20_4_;
        fVar249 = auVar175._24_4_;
        auVar55._24_4_ = fVar249 * auVar360._24_4_;
        auVar55._28_4_ = fVar230;
        fVar230 = auVar177._0_4_;
        fVar246 = auVar177._4_4_;
        auVar56._4_4_ = auVar24._4_4_ * fVar246;
        auVar56._0_4_ = auVar24._0_4_ * fVar230;
        fVar262 = auVar177._8_4_;
        auVar56._8_4_ = auVar24._8_4_ * fVar262;
        fVar225 = auVar177._12_4_;
        auVar56._12_4_ = auVar24._12_4_ * fVar225;
        fVar295 = auVar177._16_4_;
        auVar56._16_4_ = auVar24._16_4_ * fVar295;
        fVar138 = auVar177._20_4_;
        auVar56._20_4_ = auVar24._20_4_ * fVar138;
        fVar164 = auVar177._24_4_;
        auVar56._24_4_ = auVar24._24_4_ * fVar164;
        auVar56._28_4_ = auVar176._28_4_;
        auVar142 = vsubps_avx(auVar56,auVar55);
        auVar175 = vsubps_avx(auVar154,auVar322);
        fVar281 = auVar175._0_4_;
        fVar291 = auVar175._4_4_;
        auVar57._4_4_ = fVar291 * auVar360._4_4_;
        auVar57._0_4_ = fVar281 * auVar360._0_4_;
        fVar292 = auVar175._8_4_;
        auVar57._8_4_ = fVar292 * auVar360._8_4_;
        fVar293 = auVar175._12_4_;
        auVar57._12_4_ = fVar293 * auVar360._12_4_;
        fVar306 = auVar175._16_4_;
        auVar57._16_4_ = fVar306 * auVar360._16_4_;
        fVar307 = auVar175._20_4_;
        auVar57._20_4_ = fVar307 * auVar360._20_4_;
        fVar313 = auVar175._24_4_;
        auVar57._24_4_ = fVar313 * auVar360._24_4_;
        auVar57._28_4_ = auVar360._28_4_;
        auVar58._4_4_ = auVar322._4_4_ * fVar246;
        auVar58._0_4_ = auVar322._0_4_ * fVar230;
        auVar58._8_4_ = auVar322._8_4_ * fVar262;
        auVar58._12_4_ = auVar322._12_4_ * fVar225;
        auVar58._16_4_ = auVar322._16_4_ * fVar295;
        auVar58._20_4_ = auVar322._20_4_ * fVar138;
        auVar58._24_4_ = auVar322._24_4_ * fVar164;
        auVar58._28_4_ = auVar26._28_4_;
        auVar26 = vsubps_avx(auVar57,auVar58);
        auVar59._4_4_ = auVar24._4_4_ * fVar291;
        auVar59._0_4_ = auVar24._0_4_ * fVar281;
        auVar59._8_4_ = auVar24._8_4_ * fVar292;
        auVar59._12_4_ = auVar24._12_4_ * fVar293;
        auVar59._16_4_ = auVar24._16_4_ * fVar306;
        auVar59._20_4_ = auVar24._20_4_ * fVar307;
        auVar59._24_4_ = auVar24._24_4_ * fVar313;
        auVar59._28_4_ = auVar360._28_4_;
        auVar60._4_4_ = auVar322._4_4_ * fVar207;
        auVar60._0_4_ = auVar322._0_4_ * fVar167;
        auVar60._8_4_ = auVar322._8_4_ * fVar231;
        auVar60._12_4_ = auVar322._12_4_ * fVar240;
        auVar60._16_4_ = auVar322._16_4_ * fVar242;
        auVar60._20_4_ = auVar322._20_4_ * fVar244;
        auVar60._24_4_ = auVar322._24_4_ * fVar249;
        auVar60._28_4_ = auVar322._28_4_;
        auVar322 = vsubps_avx(auVar60,auVar59);
        auVar325 = ZEXT864(0) << 0x20;
        auVar236._0_4_ = auVar142._0_4_ * 0.0 + auVar322._0_4_ + auVar26._0_4_ * 0.0;
        auVar236._4_4_ = auVar142._4_4_ * 0.0 + auVar322._4_4_ + auVar26._4_4_ * 0.0;
        auVar236._8_4_ = auVar142._8_4_ * 0.0 + auVar322._8_4_ + auVar26._8_4_ * 0.0;
        auVar236._12_4_ = auVar142._12_4_ * 0.0 + auVar322._12_4_ + auVar26._12_4_ * 0.0;
        auVar236._16_4_ = auVar142._16_4_ * 0.0 + auVar322._16_4_ + auVar26._16_4_ * 0.0;
        auVar236._20_4_ = auVar142._20_4_ * 0.0 + auVar322._20_4_ + auVar26._20_4_ * 0.0;
        auVar236._24_4_ = auVar142._24_4_ * 0.0 + auVar322._24_4_ + auVar26._24_4_ * 0.0;
        auVar236._28_4_ = auVar322._28_4_ + auVar322._28_4_ + auVar26._28_4_;
        auVar322 = vmaxps_avx(auVar179,auVar236);
        auVar322 = vcmpps_avx(auVar322,ZEXT832(0) << 0x20,2);
        auVar196 = vpackssdw_avx(auVar322._0_16_,auVar322._16_16_);
        auVar233 = vpand_avx(auVar196,auVar233);
        auVar196 = vpmovsxwd_avx(auVar233);
        auVar210 = vpunpckhwd_avx(auVar233,auVar233);
        auVar215._16_16_ = auVar210;
        auVar215._0_16_ = auVar196;
        if ((((((((auVar215 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar215 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar215 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar215 >> 0x7f,0) == '\0') &&
              (auVar215 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar210 >> 0x3f,0) == '\0') &&
            (auVar215 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar210[0xf]) {
LAB_010b6fba:
          auVar353 = ZEXT3264(auVar148);
          auVar220 = ZEXT3264(auVar215);
          auVar156 = ZEXT3264(CONCAT824(local_5c0[1]._24_8_,
                                        CONCAT816(local_5c0[1]._16_8_,
                                                  CONCAT88(local_5c0[1]._8_8_,local_5c0[1]._0_8_))))
          ;
          auVar302 = ZEXT3264(CONCAT428(fVar191,CONCAT424(fVar190,CONCAT420(fVar189,CONCAT416(
                                                  fVar188,CONCAT412(fVar187,CONCAT48(fVar186,
                                                  CONCAT44(fVar185,fVar169))))))));
        }
        else {
          auVar61._4_4_ = fVar246 * fVar239;
          auVar61._0_4_ = fVar230 * fVar208;
          auVar61._8_4_ = fVar262 * fVar247;
          auVar61._12_4_ = fVar225 * fVar264;
          auVar61._16_4_ = fVar295 * fVar294;
          auVar61._20_4_ = fVar138 * fVar168;
          auVar61._24_4_ = fVar164 * fVar157;
          auVar61._28_4_ = auVar210._12_4_;
          auVar337._0_4_ = fVar167 * fVar259;
          auVar337._4_4_ = fVar207 * fVar261;
          auVar337._8_4_ = fVar231 * fVar263;
          auVar337._12_4_ = fVar240 * fVar267;
          auVar337._16_4_ = fVar242 * fVar277;
          auVar337._20_4_ = fVar244 * fVar278;
          auVar337._24_4_ = fVar249 * fVar279;
          auVar337._28_4_ = 0;
          auVar322 = vsubps_avx(auVar337,auVar61);
          auVar62._4_4_ = fVar291 * fVar261;
          auVar62._0_4_ = fVar281 * fVar259;
          auVar62._8_4_ = fVar292 * fVar263;
          auVar62._12_4_ = fVar293 * fVar267;
          auVar62._16_4_ = fVar306 * fVar277;
          auVar62._20_4_ = fVar307 * fVar278;
          auVar62._24_4_ = fVar313 * fVar279;
          auVar62._28_4_ = auVar28._28_4_;
          auVar63._4_4_ = fVar246 * fVar245;
          auVar63._0_4_ = fVar230 * fVar228;
          auVar63._8_4_ = fVar262 * fVar260;
          auVar63._12_4_ = fVar225 * fVar303;
          auVar63._16_4_ = fVar295 * fVar227;
          auVar63._20_4_ = fVar138 * fVar331;
          auVar63._24_4_ = fVar164 * fVar162;
          auVar63._28_4_ = auVar177._28_4_;
          auVar360 = vsubps_avx(auVar63,auVar62);
          auVar64._4_4_ = fVar207 * fVar245;
          auVar64._0_4_ = fVar167 * fVar228;
          auVar64._8_4_ = fVar231 * fVar260;
          auVar64._12_4_ = fVar240 * fVar303;
          auVar64._16_4_ = fVar242 * fVar227;
          auVar64._20_4_ = fVar244 * fVar331;
          auVar64._24_4_ = fVar249 * fVar162;
          auVar64._28_4_ = auVar179._28_4_;
          auVar65._4_4_ = fVar291 * fVar239;
          auVar65._0_4_ = fVar281 * fVar208;
          auVar65._8_4_ = fVar292 * fVar247;
          auVar65._12_4_ = fVar293 * fVar264;
          auVar65._16_4_ = fVar306 * fVar294;
          auVar65._20_4_ = fVar307 * fVar168;
          auVar65._24_4_ = fVar313 * fVar157;
          auVar65._28_4_ = auVar143._28_4_;
          auVar26 = vsubps_avx(auVar65,auVar64);
          auVar289._0_4_ = auVar322._0_4_ * 0.0 + auVar26._0_4_ + auVar360._0_4_ * 0.0;
          auVar289._4_4_ = auVar322._4_4_ * 0.0 + auVar26._4_4_ + auVar360._4_4_ * 0.0;
          auVar289._8_4_ = auVar322._8_4_ * 0.0 + auVar26._8_4_ + auVar360._8_4_ * 0.0;
          auVar289._12_4_ = auVar322._12_4_ * 0.0 + auVar26._12_4_ + auVar360._12_4_ * 0.0;
          auVar289._16_4_ = auVar322._16_4_ * 0.0 + auVar26._16_4_ + auVar360._16_4_ * 0.0;
          auVar289._20_4_ = auVar322._20_4_ * 0.0 + auVar26._20_4_ + auVar360._20_4_ * 0.0;
          auVar289._24_4_ = auVar322._24_4_ * 0.0 + auVar26._24_4_ + auVar360._24_4_ * 0.0;
          auVar289._28_4_ = auVar143._28_4_ + auVar26._28_4_ + auVar179._28_4_;
          auVar24 = vrcpps_avx(auVar289);
          fVar208 = auVar24._0_4_;
          fVar228 = auVar24._4_4_;
          auVar66._4_4_ = auVar289._4_4_ * fVar228;
          auVar66._0_4_ = auVar289._0_4_ * fVar208;
          fVar230 = auVar24._8_4_;
          auVar66._8_4_ = auVar289._8_4_ * fVar230;
          fVar239 = auVar24._12_4_;
          auVar66._12_4_ = auVar289._12_4_ * fVar239;
          fVar245 = auVar24._16_4_;
          auVar66._16_4_ = auVar289._16_4_ * fVar245;
          fVar246 = auVar24._20_4_;
          auVar66._20_4_ = auVar289._20_4_ * fVar246;
          fVar247 = auVar24._24_4_;
          auVar66._24_4_ = auVar289._24_4_ * fVar247;
          auVar66._28_4_ = auVar177._28_4_;
          auVar338._8_4_ = 0x3f800000;
          auVar338._0_8_ = 0x3f8000003f800000;
          auVar338._12_4_ = 0x3f800000;
          auVar338._16_4_ = 0x3f800000;
          auVar338._20_4_ = 0x3f800000;
          auVar338._24_4_ = 0x3f800000;
          auVar338._28_4_ = 0x3f800000;
          auVar28 = vsubps_avx(auVar338,auVar66);
          fVar208 = auVar28._0_4_ * fVar208 + fVar208;
          fVar228 = auVar28._4_4_ * fVar228 + fVar228;
          fVar230 = auVar28._8_4_ * fVar230 + fVar230;
          fVar239 = auVar28._12_4_ * fVar239 + fVar239;
          fVar245 = auVar28._16_4_ * fVar245 + fVar245;
          fVar246 = auVar28._20_4_ * fVar246 + fVar246;
          fVar247 = auVar28._24_4_ * fVar247 + fVar247;
          auVar67._4_4_ =
               (auVar322._4_4_ * fVar243 + auVar360._4_4_ * fVar241 + auVar26._4_4_ * fVar139) *
               fVar228;
          auVar67._0_4_ =
               (auVar322._0_4_ * fVar223 + auVar360._0_4_ * fVar221 + auVar26._0_4_ * fVar166) *
               fVar208;
          auVar67._8_4_ =
               (auVar322._8_4_ * fVar258 + auVar360._8_4_ * fVar248 + auVar26._8_4_ * fVar206) *
               fVar230;
          auVar67._12_4_ =
               (auVar322._12_4_ * fVar266 + auVar360._12_4_ * fVar265 + auVar26._12_4_ * fVar159) *
               fVar239;
          auVar67._16_4_ =
               (auVar322._16_4_ * fVar305 + auVar360._16_4_ * fVar304 + auVar26._16_4_ * fVar161) *
               fVar245;
          auVar67._20_4_ =
               (auVar322._20_4_ * fVar229 + auVar360._20_4_ * fVar280 + auVar26._20_4_ * fVar163) *
               fVar246;
          auVar67._24_4_ =
               (auVar322._24_4_ * fVar160 + auVar360._24_4_ * fVar158 + auVar26._24_4_ * fVar165) *
               fVar247;
          auVar67._28_4_ = auVar25._28_4_ + auVar23._28_4_;
          auVar196 = vpermilps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x30)),0);
          auVar147._16_16_ = auVar196;
          auVar147._0_16_ = auVar196;
          auVar23 = vcmpps_avx(auVar147,auVar67,2);
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar216._4_4_ = uVar8;
          auVar216._0_4_ = uVar8;
          auVar216._8_4_ = uVar8;
          auVar216._12_4_ = uVar8;
          auVar216._16_4_ = uVar8;
          auVar216._20_4_ = uVar8;
          auVar216._24_4_ = uVar8;
          auVar216._28_4_ = uVar8;
          auVar322 = vcmpps_avx(auVar67,auVar216,2);
          auVar23 = vandps_avx(auVar322,auVar23);
          auVar196 = vpackssdw_avx(auVar23._0_16_,auVar23._16_16_);
          auVar233 = vpand_avx(auVar233,auVar196);
          auVar196 = vpmovsxwd_avx(auVar233);
          auVar210 = vpshufd_avx(auVar233,0xee);
          auVar210 = vpmovsxwd_avx(auVar210);
          auVar215._16_16_ = auVar210;
          auVar215._0_16_ = auVar196;
          auVar353 = ZEXT3264(auVar148);
          if ((((((((auVar215 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar215 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar215 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar215 >> 0x7f,0) == '\0') &&
                (auVar215 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar210 >> 0x3f,0) == '\0') &&
              (auVar215 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar210[0xf]) goto LAB_010b6fba;
          auVar148 = vcmpps_avx(ZEXT832(0) << 0x20,auVar289,4);
          auVar196 = vpackssdw_avx(auVar148._0_16_,auVar148._16_16_);
          auVar233 = vpand_avx(auVar233,auVar196);
          auVar196 = vpmovsxwd_avx(auVar233);
          auVar220 = ZEXT1664(auVar196);
          auVar233 = vpunpckhwd_avx(auVar233,auVar233);
          auVar275._16_16_ = auVar233;
          auVar275._0_16_ = auVar196;
          auVar156 = ZEXT3264(CONCAT824(local_5c0[1]._24_8_,
                                        CONCAT816(local_5c0[1]._16_8_,
                                                  CONCAT88(local_5c0[1]._8_8_,local_5c0[1]._0_8_))))
          ;
          auVar302 = ZEXT3264(CONCAT428(fVar191,CONCAT424(fVar190,CONCAT420(fVar189,CONCAT416(
                                                  fVar188,CONCAT412(fVar187,CONCAT48(fVar186,
                                                  CONCAT44(fVar185,fVar169))))))));
          if ((((((((auVar275 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar275 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar275 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar275 >> 0x7f,0) != '\0') ||
                (auVar275 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar233 >> 0x3f,0) != '\0') ||
              (auVar275 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar233[0xf] < '\0') {
            auVar68._4_4_ = auVar179._4_4_ * fVar228;
            auVar68._0_4_ = auVar179._0_4_ * fVar208;
            auVar68._8_4_ = auVar179._8_4_ * fVar230;
            auVar68._12_4_ = auVar179._12_4_ * fVar239;
            auVar68._16_4_ = auVar179._16_4_ * fVar245;
            auVar68._20_4_ = auVar179._20_4_ * fVar246;
            auVar68._24_4_ = auVar179._24_4_ * fVar247;
            auVar68._28_4_ = SUB84(local_5c0[1]._24_8_,4);
            auVar69._4_4_ = auVar236._4_4_ * fVar228;
            auVar69._0_4_ = auVar236._0_4_ * fVar208;
            auVar69._8_4_ = auVar236._8_4_ * fVar230;
            auVar69._12_4_ = auVar236._12_4_ * fVar239;
            auVar69._16_4_ = auVar236._16_4_ * fVar245;
            auVar69._20_4_ = auVar236._20_4_ * fVar246;
            auVar69._24_4_ = auVar236._24_4_ * fVar247;
            auVar69._28_4_ = auVar28._28_4_ + auVar24._28_4_;
            auVar237._8_4_ = 0x3f800000;
            auVar237._0_8_ = 0x3f8000003f800000;
            auVar237._12_4_ = 0x3f800000;
            auVar237._16_4_ = 0x3f800000;
            auVar237._20_4_ = 0x3f800000;
            auVar237._24_4_ = 0x3f800000;
            auVar237._28_4_ = 0x3f800000;
            auVar148 = vsubps_avx(auVar237,auVar68);
            auVar220 = ZEXT3264(auVar148);
            auVar148 = vblendvps_avx(auVar148,auVar68,auVar29);
            auVar353 = ZEXT3264(auVar148);
            auVar148 = vsubps_avx(auVar237,auVar69);
            _local_380 = vblendvps_avx(auVar148,auVar69,auVar29);
            auVar156 = ZEXT3264(auVar275);
            local_4c0 = auVar67;
          }
        }
        auVar290 = ZEXT3264(_local_660);
        auVar148 = auVar156._0_32_;
        if ((((((((auVar148 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar148 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar148 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar148 >> 0x7f,0) != '\0') ||
              (auVar156 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar148 >> 0xbf,0) != '\0') ||
            (auVar156 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar156[0x1f] < '\0') {
          auVar23 = vsubps_avx(auVar255,auVar302._0_32_);
          fVar221 = auVar302._0_4_ + auVar353._0_4_ * auVar23._0_4_;
          fVar223 = auVar302._4_4_ + auVar353._4_4_ * auVar23._4_4_;
          fVar228 = auVar302._8_4_ + auVar353._8_4_ * auVar23._8_4_;
          fVar230 = auVar302._12_4_ + auVar353._12_4_ * auVar23._12_4_;
          fVar239 = auVar302._16_4_ + auVar353._16_4_ * auVar23._16_4_;
          fVar241 = auVar302._20_4_ + auVar353._20_4_ * auVar23._20_4_;
          fVar243 = auVar302._24_4_ + auVar353._24_4_ * auVar23._24_4_;
          fVar245 = auVar302._28_4_ + auVar23._28_4_;
          fVar208 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          auVar70._4_4_ = (fVar223 + fVar223) * fVar208;
          auVar70._0_4_ = (fVar221 + fVar221) * fVar208;
          auVar70._8_4_ = (fVar228 + fVar228) * fVar208;
          auVar70._12_4_ = (fVar230 + fVar230) * fVar208;
          auVar70._16_4_ = (fVar239 + fVar239) * fVar208;
          auVar70._20_4_ = (fVar241 + fVar241) * fVar208;
          auVar70._24_4_ = (fVar243 + fVar243) * fVar208;
          auVar70._28_4_ = fVar245 + fVar245;
          auVar23 = vcmpps_avx(local_4c0,auVar70,6);
          auVar322 = auVar148 & auVar23;
          if ((((((((auVar322 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar322 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar322 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar322 >> 0x7f,0) != '\0') ||
                (auVar322 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar322 >> 0xbf,0) != '\0') ||
              (auVar322 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar322[0x1f] < '\0') {
            auVar220 = ZEXT3264(CONCAT428(0xbf800000,
                                          CONCAT424(0xbf800000,
                                                    CONCAT420(0xbf800000,
                                                              CONCAT416(0xbf800000,
                                                                        CONCAT412(0xbf800000,
                                                                                  CONCAT48(
                                                  0xbf800000,0xbf800000bf800000)))))));
            local_380._0_4_ = (float)local_380._0_4_ + (float)local_380._0_4_ + -1.0;
            local_380._4_4_ = (float)local_380._4_4_ + (float)local_380._4_4_ + -1.0;
            uStack_378._0_4_ = (float)uStack_378 + (float)uStack_378 + -1.0;
            uStack_378._4_4_ = uStack_378._4_4_ + uStack_378._4_4_ + -1.0;
            uStack_370._0_4_ = (float)uStack_370 + (float)uStack_370 + -1.0;
            uStack_370._4_4_ = uStack_370._4_4_ + uStack_370._4_4_ + -1.0;
            uStack_368._0_4_ = (float)uStack_368 + (float)uStack_368 + -1.0;
            uStack_368._4_4_ = uStack_368._4_4_ + uStack_368._4_4_ + -1.0;
            local_640 = auVar353._0_32_;
            local_300 = local_640;
            auVar126 = _local_380;
            auVar322 = _local_380;
            local_2e0 = (float)local_380._0_4_;
            fStack_2dc = (float)local_380._4_4_;
            fStack_2d8 = (float)uStack_378;
            fStack_2d4 = uStack_378._4_4_;
            fStack_2d0 = (float)uStack_370;
            fStack_2cc = uStack_370._4_4_;
            fStack_2c8 = (float)uStack_368;
            fStack_2c4 = uStack_368._4_4_;
            local_2c0 = local_4c0;
            local_2a0 = 0;
            local_29c = uVar18;
            local_290 = auVar27;
            local_280 = uVar114;
            uStack_278 = uVar115;
            _local_380 = auVar322;
            if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              local_5c0[0] = vandps_avx(auVar23,auVar148);
              auVar193._0_4_ = 1.0 / local_4a0;
              auVar193._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar233 = vshufps_avx(auVar193,auVar193,0);
              local_220[0] = auVar233._0_4_ * (auVar353._0_4_ + 0.0);
              local_220[1] = auVar233._4_4_ * (auVar353._4_4_ + 1.0);
              local_220[2] = auVar233._8_4_ * (auVar353._8_4_ + 2.0);
              local_220[3] = auVar233._12_4_ * (auVar353._12_4_ + 3.0);
              fStack_210 = auVar233._0_4_ * (auVar353._16_4_ + 4.0);
              fStack_20c = auVar233._4_4_ * (auVar353._20_4_ + 5.0);
              fStack_208 = auVar233._8_4_ * (auVar353._24_4_ + 6.0);
              fStack_204 = auVar353._28_4_ + 7.0;
              uStack_370 = auVar126._16_8_;
              uStack_368 = auVar322._24_8_;
              local_200 = local_380;
              uStack_1f8 = uStack_378;
              uStack_1f0 = uStack_370;
              uStack_1e8 = uStack_368;
              local_1e0 = local_4c0;
              auVar180._8_4_ = 0x7f800000;
              auVar180._0_8_ = 0x7f8000007f800000;
              auVar180._12_4_ = 0x7f800000;
              auVar180._16_4_ = 0x7f800000;
              auVar180._20_4_ = 0x7f800000;
              auVar180._24_4_ = 0x7f800000;
              auVar180._28_4_ = 0x7f800000;
              auVar148 = vblendvps_avx(auVar180,local_4c0,local_5c0[0]);
              auVar23 = vshufps_avx(auVar148,auVar148,0xb1);
              auVar23 = vminps_avx(auVar148,auVar23);
              auVar322 = vshufpd_avx(auVar23,auVar23,5);
              auVar23 = vminps_avx(auVar23,auVar322);
              auVar322 = vperm2f128_avx(auVar23,auVar23,1);
              auVar23 = vminps_avx(auVar23,auVar322);
              auVar23 = vcmpps_avx(auVar148,auVar23,0);
              auVar322 = local_5c0[0] & auVar23;
              auVar148 = local_5c0[0];
              if ((((((((auVar322 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar322 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar322 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar322 >> 0x7f,0) != '\0') ||
                    (auVar322 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar322 >> 0xbf,0) != '\0') ||
                  (auVar322 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar322[0x1f] < '\0') {
                auVar148 = vandps_avx(auVar23,local_5c0[0]);
              }
              uVar132 = vmovmskps_avx(auVar148);
              uVar22 = 0;
              if (uVar132 != 0) {
                for (; (uVar132 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                }
              }
              uVar134 = (ulong)uVar22;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar208 = local_220[uVar134];
                uVar8 = *(undefined4 *)((long)&local_200 + uVar134 * 4);
                fVar223 = 1.0 - fVar208;
                fVar221 = fVar208 * fVar223 + fVar208 * fVar223;
                auVar233 = ZEXT416((uint)(fVar208 * fVar208 * 3.0));
                auVar233 = vshufps_avx(auVar233,auVar233,0);
                auVar196 = ZEXT416((uint)((fVar221 - fVar208 * fVar208) * 3.0));
                auVar196 = vshufps_avx(auVar196,auVar196,0);
                auVar210 = ZEXT416((uint)((fVar223 * fVar223 - fVar221) * 3.0));
                auVar210 = vshufps_avx(auVar210,auVar210,0);
                auVar198 = ZEXT416((uint)(fVar223 * fVar223 * -3.0));
                auVar198 = vshufps_avx(auVar198,auVar198,0);
                auVar194._0_4_ =
                     auVar198._0_4_ * local_8a0 +
                     auVar210._0_4_ * local_840 +
                     local_860 * auVar233._0_4_ + local_850 * auVar196._0_4_;
                auVar194._4_4_ =
                     auVar198._4_4_ * fStack_89c +
                     auVar210._4_4_ * fStack_83c +
                     fStack_85c * auVar233._4_4_ + fStack_84c * auVar196._4_4_;
                auVar194._8_4_ =
                     auVar198._8_4_ * fStack_898 +
                     auVar210._8_4_ * fStack_838 +
                     fStack_858 * auVar233._8_4_ + fStack_848 * auVar196._8_4_;
                auVar194._12_4_ =
                     auVar198._12_4_ * fStack_894 +
                     auVar210._12_4_ * fStack_834 +
                     fStack_854 * auVar233._12_4_ + fStack_844 * auVar196._12_4_;
                auVar220 = ZEXT464(*(uint *)(local_1e0 + uVar134 * 4));
                *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_1e0 + uVar134 * 4);
                *(float *)(ray + k * 4 + 0xc0) = auVar194._0_4_;
                uVar19 = vextractps_avx(auVar194,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar19;
                uVar19 = vextractps_avx(auVar194,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar19;
                *(float *)(ray + k * 4 + 0xf0) = fVar208;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar8;
                *(uint *)(ray + k * 4 + 0x110) = uVar17;
                *(uint *)(ray + k * 4 + 0x120) = uVar131;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                _local_6e0 = vshufps_avx(ZEXT416(uVar131),ZEXT416(uVar131),0);
                _local_700 = vshufps_avx(ZEXT416(uVar17),ZEXT416(uVar17),0);
                _auStack_6f0 = auVar154._16_16_;
                _auStack_710 = auVar219._16_16_;
                _local_720 = *local_748;
                auStack_790 = auVar255._16_16_;
                local_7a0 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                while( true ) {
                  local_400 = local_220[uVar134];
                  local_3f0 = *(undefined4 *)((long)&local_200 + uVar134 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1e0 + uVar134 * 4);
                  fVar221 = 1.0 - local_400;
                  fVar208 = local_400 * fVar221 + local_400 * fVar221;
                  auVar233 = ZEXT416((uint)(local_400 * local_400 * 3.0));
                  auVar233 = vshufps_avx(auVar233,auVar233,0);
                  auVar196 = ZEXT416((uint)((fVar208 - local_400 * local_400) * 3.0));
                  auVar196 = vshufps_avx(auVar196,auVar196,0);
                  auVar210 = ZEXT416((uint)((fVar221 * fVar221 - fVar208) * 3.0));
                  auVar210 = vshufps_avx(auVar210,auVar210,0);
                  local_7d0.context = context->user;
                  auVar198 = ZEXT416((uint)(fVar221 * fVar221 * -3.0));
                  auVar198 = vshufps_avx(auVar198,auVar198,0);
                  auVar200._0_4_ =
                       auVar198._0_4_ * local_8a0 +
                       auVar210._0_4_ * local_840 +
                       local_860 * auVar233._0_4_ + local_850 * auVar196._0_4_;
                  auVar200._4_4_ =
                       auVar198._4_4_ * fStack_89c +
                       auVar210._4_4_ * fStack_83c +
                       fStack_85c * auVar233._4_4_ + fStack_84c * auVar196._4_4_;
                  auVar200._8_4_ =
                       auVar198._8_4_ * fStack_898 +
                       auVar210._8_4_ * fStack_838 +
                       fStack_858 * auVar233._8_4_ + fStack_848 * auVar196._8_4_;
                  auVar200._12_4_ =
                       auVar198._12_4_ * fStack_894 +
                       auVar210._12_4_ * fStack_834 +
                       fStack_854 * auVar233._12_4_ + fStack_844 * auVar196._12_4_;
                  auVar233 = vshufps_avx(auVar200,auVar200,0);
                  local_430[0] = (RTCHitN)auVar233[0];
                  local_430[1] = (RTCHitN)auVar233[1];
                  local_430[2] = (RTCHitN)auVar233[2];
                  local_430[3] = (RTCHitN)auVar233[3];
                  local_430[4] = (RTCHitN)auVar233[4];
                  local_430[5] = (RTCHitN)auVar233[5];
                  local_430[6] = (RTCHitN)auVar233[6];
                  local_430[7] = (RTCHitN)auVar233[7];
                  local_430[8] = (RTCHitN)auVar233[8];
                  local_430[9] = (RTCHitN)auVar233[9];
                  local_430[10] = (RTCHitN)auVar233[10];
                  local_430[0xb] = (RTCHitN)auVar233[0xb];
                  local_430[0xc] = (RTCHitN)auVar233[0xc];
                  local_430[0xd] = (RTCHitN)auVar233[0xd];
                  local_430[0xe] = (RTCHitN)auVar233[0xe];
                  local_430[0xf] = (RTCHitN)auVar233[0xf];
                  auVar233 = vshufps_avx(auVar200,auVar200,0x55);
                  local_420 = auVar233;
                  local_410 = vshufps_avx(auVar200,auVar200,0xaa);
                  fStack_3fc = local_400;
                  fStack_3f8 = local_400;
                  fStack_3f4 = local_400;
                  uStack_3ec = local_3f0;
                  uStack_3e8 = local_3f0;
                  uStack_3e4 = local_3f0;
                  local_3e0 = local_700;
                  uStack_3d8 = uStack_6f8;
                  local_3d0 = local_6e0;
                  uStack_3c8 = uStack_6d8;
                  vcmpps_avx(auVar325._0_32_,auVar325._0_32_,0xf);
                  uStack_3bc = (local_7d0.context)->instID[0];
                  local_3c0 = uStack_3bc;
                  uStack_3b8 = uStack_3bc;
                  uStack_3b4 = uStack_3bc;
                  uStack_3b0 = (local_7d0.context)->instPrimID[0];
                  uStack_3ac = uStack_3b0;
                  uStack_3a8 = uStack_3b0;
                  uStack_3a4 = uStack_3b0;
                  local_830 = _local_720;
                  local_7d0.valid = (int *)local_830;
                  local_7d0.geometryUserPtr = pGVar20->userPtr;
                  local_7d0.hit = local_430;
                  local_7d0.N = 4;
                  local_7d0.ray = (RTCRayN *)ray;
                  if (pGVar20->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar302 = ZEXT1664(auVar302._0_16_);
                    (*pGVar20->intersectionFilterN)(&local_7d0);
                    auVar290 = ZEXT3264(_local_660);
                    auVar353 = ZEXT3264(local_640);
                    auVar325 = ZEXT1664(ZEXT816(0) << 0x40);
                    prim = local_808;
                    pLVar135 = local_818;
                    pre = local_810;
                    fVar341 = (float)local_6a0._0_4_;
                    fVar347 = (float)local_6a0._4_4_;
                    fVar348 = fStack_698;
                    fVar349 = fStack_694;
                    fVar222 = fStack_690;
                    fVar224 = fStack_68c;
                    fVar226 = fStack_688;
                  }
                  if (local_830 == (undefined1  [16])0x0) {
                    auVar233 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar233 = auVar233 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var21 = context->args->filter;
                    if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar302 = ZEXT1664(auVar302._0_16_);
                      (*p_Var21)(&local_7d0);
                      auVar290 = ZEXT3264(_local_660);
                      auVar353 = ZEXT3264(local_640);
                      auVar325 = ZEXT1664(ZEXT816(0) << 0x40);
                      prim = local_808;
                      pLVar135 = local_818;
                      pre = local_810;
                      fVar341 = (float)local_6a0._0_4_;
                      fVar347 = (float)local_6a0._4_4_;
                      fVar348 = fStack_698;
                      fVar349 = fStack_694;
                      fVar222 = fStack_690;
                      fVar224 = fStack_68c;
                      fVar226 = fStack_688;
                    }
                    auVar196 = vpcmpeqd_avx(local_830,_DAT_01f7aa10);
                    auVar210 = vpcmpeqd_avx(auVar233,auVar233);
                    auVar233 = auVar196 ^ auVar210;
                    if (local_830 != (undefined1  [16])0x0) {
                      auVar196 = auVar196 ^ auVar210;
                      auVar210 = vmaskmovps_avx(auVar196,*(undefined1 (*) [16])local_7d0.hit);
                      *(undefined1 (*) [16])(local_7d0.ray + 0xc0) = auVar210;
                      auVar210 = vmaskmovps_avx(auVar196,*(undefined1 (*) [16])
                                                          (local_7d0.hit + 0x10));
                      *(undefined1 (*) [16])(local_7d0.ray + 0xd0) = auVar210;
                      auVar210 = vmaskmovps_avx(auVar196,*(undefined1 (*) [16])
                                                          (local_7d0.hit + 0x20));
                      *(undefined1 (*) [16])(local_7d0.ray + 0xe0) = auVar210;
                      auVar210 = vmaskmovps_avx(auVar196,*(undefined1 (*) [16])
                                                          (local_7d0.hit + 0x30));
                      *(undefined1 (*) [16])(local_7d0.ray + 0xf0) = auVar210;
                      auVar210 = vmaskmovps_avx(auVar196,*(undefined1 (*) [16])
                                                          (local_7d0.hit + 0x40));
                      *(undefined1 (*) [16])(local_7d0.ray + 0x100) = auVar210;
                      auVar210 = vmaskmovps_avx(auVar196,*(undefined1 (*) [16])
                                                          (local_7d0.hit + 0x50));
                      *(undefined1 (*) [16])(local_7d0.ray + 0x110) = auVar210;
                      auVar210 = vmaskmovps_avx(auVar196,*(undefined1 (*) [16])
                                                          (local_7d0.hit + 0x60));
                      *(undefined1 (*) [16])(local_7d0.ray + 0x120) = auVar210;
                      auVar210 = vmaskmovps_avx(auVar196,*(undefined1 (*) [16])
                                                          (local_7d0.hit + 0x70));
                      *(undefined1 (*) [16])(local_7d0.ray + 0x130) = auVar210;
                      auVar196 = vmaskmovps_avx(auVar196,*(undefined1 (*) [16])
                                                          (local_7d0.hit + 0x80));
                      *(undefined1 (*) [16])(local_7d0.ray + 0x140) = auVar196;
                    }
                  }
                  auVar148 = local_4c0;
                  auVar174._8_8_ = 0x100000001;
                  auVar174._0_8_ = 0x100000001;
                  if ((auVar174 & auVar233) == (undefined1  [16])0x0) {
                    *(int *)(ray + k * 4 + 0x80) = local_7a0._0_4_;
                    auVar233 = local_7a0;
                  }
                  else {
                    auVar233 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                  }
                  auVar220 = ZEXT3264(local_4c0);
                  *(undefined4 *)(local_5c0[0] + uVar134 * 4) = 0;
                  local_7a0 = auVar233;
                  auVar233 = vshufps_avx(auVar233,auVar233,0);
                  auVar155._16_16_ = auVar233;
                  auVar155._0_16_ = auVar233;
                  auVar219 = vcmpps_avx(auVar148,auVar155,2);
                  auVar154 = vandps_avx(auVar219,local_5c0[0]);
                  local_5c0[0] = local_5c0[0] & auVar219;
                  if ((((((((local_5c0[0] >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                           && (local_5c0[0] >> 0x3f & (undefined1  [32])0x1) ==
                              (undefined1  [32])0x0) &&
                          (local_5c0[0] >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                         && SUB321(local_5c0[0] >> 0x7f,0) == '\0') &&
                        (local_5c0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_5c0[0] >> 0xbf,0) == '\0') &&
                      (local_5c0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_5c0[0][0x1f]) break;
                  auVar184._8_4_ = 0x7f800000;
                  auVar184._0_8_ = 0x7f8000007f800000;
                  auVar184._12_4_ = 0x7f800000;
                  auVar184._16_4_ = 0x7f800000;
                  auVar184._20_4_ = 0x7f800000;
                  auVar184._24_4_ = 0x7f800000;
                  auVar184._28_4_ = 0x7f800000;
                  auVar148 = vblendvps_avx(auVar184,auVar148,auVar154);
                  auVar219 = vshufps_avx(auVar148,auVar148,0xb1);
                  auVar219 = vminps_avx(auVar148,auVar219);
                  auVar23 = vshufpd_avx(auVar219,auVar219,5);
                  auVar219 = vminps_avx(auVar219,auVar23);
                  auVar23 = vperm2f128_avx(auVar219,auVar219,1);
                  auVar219 = vminps_avx(auVar219,auVar23);
                  auVar219 = vcmpps_avx(auVar148,auVar219,0);
                  auVar23 = auVar154 & auVar219;
                  auVar148 = auVar154;
                  if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar23 >> 0x7f,0) != '\0') ||
                        (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar23 >> 0xbf,0) != '\0') ||
                      (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar23[0x1f] < '\0') {
                    auVar148 = vandps_avx(auVar219,auVar154);
                  }
                  uVar132 = vmovmskps_avx(auVar148);
                  uVar22 = 0;
                  if (uVar132 != 0) {
                    for (; (uVar132 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                    }
                  }
                  uVar134 = (ulong)uVar22;
                  local_5c0[0] = auVar154;
                }
              }
            }
          }
        }
      }
      auVar325 = ZEXT3264(_local_540);
      if (8 < (int)uVar18) {
        _local_4e0 = vpshufd_avx(ZEXT416(uVar18),0);
        auVar233 = vshufps_avx(_local_780,_local_780,0);
        register0x00001210 = auVar233;
        _local_360 = auVar233;
        auVar233 = vpermilps_avx(local_6c0._0_16_,0);
        local_100._16_16_ = auVar233;
        local_100._0_16_ = auVar233;
        auVar141._0_4_ = 1.0 / local_4a0;
        auVar141._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar233 = vshufps_avx(auVar141,auVar141,0);
        register0x00001210 = auVar233;
        _local_120 = auVar233;
        local_310 = vshufps_avx(ZEXT416(uVar131),ZEXT416(uVar131),0);
        local_320 = vshufps_avx(ZEXT416(uVar17),ZEXT416(uVar17),0);
        auVar156 = ZEXT1664(local_320);
        lVar136 = 8;
        local_640 = auVar353._0_32_;
        _local_660 = auVar290._0_32_;
        fVar208 = (float)local_680._0_4_;
        fVar221 = (float)local_680._4_4_;
        fVar223 = fStack_678;
        fVar228 = fStack_674;
        fVar230 = fStack_670;
        fVar239 = fStack_66c;
        fVar241 = fStack_668;
        do {
          pauVar2 = (undefined1 (*) [28])(bezier_basis0 + lVar136 * 4 + lVar133);
          fVar245 = *(float *)*pauVar2;
          fVar246 = *(float *)(*pauVar2 + 4);
          fVar247 = *(float *)(*pauVar2 + 8);
          fVar248 = *(float *)(*pauVar2 + 0xc);
          fVar258 = *(float *)(*pauVar2 + 0x10);
          fVar260 = *(float *)(*pauVar2 + 0x14);
          fVar262 = *(float *)(*pauVar2 + 0x18);
          auVar123 = *pauVar2;
          pauVar4 = (undefined1 (*) [28])(lVar133 + 0x21aa768 + lVar136 * 4);
          fVar264 = *(float *)*pauVar4;
          fVar265 = *(float *)(*pauVar4 + 4);
          fVar266 = *(float *)(*pauVar4 + 8);
          fVar303 = *(float *)(*pauVar4 + 0xc);
          fVar225 = *(float *)(*pauVar4 + 0x10);
          fVar294 = *(float *)(*pauVar4 + 0x14);
          fVar304 = *(float *)(*pauVar4 + 0x18);
          auVar122 = *pauVar4;
          pauVar4 = (undefined1 (*) [28])(lVar133 + 0x21aabec + lVar136 * 4);
          fVar305 = *(float *)*pauVar4;
          fVar227 = *(float *)(*pauVar4 + 4);
          fVar295 = *(float *)(*pauVar4 + 8);
          fVar168 = *(float *)(*pauVar4 + 0xc);
          fVar280 = *(float *)(*pauVar4 + 0x10);
          fVar229 = *(float *)(*pauVar4 + 0x14);
          fVar331 = *(float *)(*pauVar4 + 0x18);
          auVar121 = *pauVar4;
          pauVar4 = (undefined1 (*) [28])(lVar133 + 0x21ab070 + lVar136 * 4);
          fVar138 = *(float *)*pauVar4;
          fVar157 = *(float *)(*pauVar4 + 4);
          fVar158 = *(float *)(*pauVar4 + 8);
          fVar160 = *(float *)(*pauVar4 + 0xc);
          fVar162 = *(float *)(*pauVar4 + 0x10);
          fVar164 = *(float *)(*pauVar4 + 0x14);
          fVar166 = *(float *)(*pauVar4 + 0x18);
          auVar120 = *pauVar4;
          fVar240 = auVar325._0_4_;
          fVar242 = auVar325._4_4_;
          fVar244 = auVar325._8_4_;
          fVar249 = auVar325._12_4_;
          fVar259 = auVar325._16_4_;
          fVar261 = auVar325._20_4_;
          fVar263 = auVar325._24_4_;
          fVar169 = auVar220._28_4_;
          fVar243 = auVar302._28_4_;
          fVar207 = fVar169 + *(float *)pauVar4[1];
          auVar302 = ZEXT3264(local_160);
          fVar186 = local_160._0_4_;
          fVar187 = local_160._4_4_;
          fVar188 = local_160._8_4_;
          fVar189 = local_160._12_4_;
          fVar190 = local_160._16_4_;
          fVar191 = local_160._20_4_;
          fVar231 = local_160._24_4_;
          local_780._0_4_ =
               fVar186 * fVar245 +
               auVar290._0_4_ * fVar264 + fVar240 * fVar305 + (float)local_480._0_4_ * fVar138;
          local_780._4_4_ =
               fVar187 * fVar246 +
               auVar290._4_4_ * fVar265 + fVar242 * fVar227 + (float)local_480._4_4_ * fVar157;
          fStack_778 = fVar188 * fVar247 +
                       auVar290._8_4_ * fVar266 + fVar244 * fVar295 + fStack_478 * fVar158;
          fStack_774 = fVar189 * fVar248 +
                       auVar290._12_4_ * fVar303 + fVar249 * fVar168 + fStack_474 * fVar160;
          fStack_770 = fVar190 * fVar258 +
                       auVar290._16_4_ * fVar225 + fVar259 * fVar280 + fStack_470 * fVar162;
          fStack_76c = fVar191 * fVar260 +
                       auVar290._20_4_ * fVar294 + fVar261 * fVar229 + fStack_46c * fVar164;
          fStack_768 = fVar231 * fVar262 +
                       auVar290._24_4_ * fVar304 + fVar263 * fVar331 + fStack_468 * fVar166;
          fStack_764 = fVar207 + fVar169 + fVar169 + auVar156._28_4_;
          auVar217._0_4_ =
               (float)local_5e0._0_4_ * fVar138 + fVar208 * fVar305 + fVar341 * fVar264 +
               (float)local_180._0_4_ * fVar245;
          auVar217._4_4_ =
               (float)local_5e0._4_4_ * fVar157 + fVar221 * fVar227 + fVar347 * fVar265 +
               (float)local_180._4_4_ * fVar246;
          auVar217._8_4_ =
               fStack_5d8 * fVar158 + fVar223 * fVar295 + fVar348 * fVar266 + fStack_178 * fVar247;
          auVar217._12_4_ =
               fStack_5d4 * fVar160 + fVar228 * fVar168 + fVar349 * fVar303 + fStack_174 * fVar248;
          auVar217._16_4_ =
               fStack_5d0 * fVar162 + fVar230 * fVar280 + fVar222 * fVar225 + fStack_170 * fVar258;
          auVar217._20_4_ =
               fStack_5cc * fVar164 + fVar239 * fVar229 + fVar224 * fVar294 + fStack_16c * fVar260;
          auVar217._24_4_ =
               fStack_5c8 * fVar166 + fVar241 * fVar331 + fVar226 * fVar304 + fStack_168 * fVar262;
          auVar217._28_4_ = fVar243 + fVar169 + fVar169 + fStack_764;
          fVar139 = fVar245 * (float)local_1c0._0_4_ +
                    (float)local_a0._0_4_ * fVar264 +
                    (float)local_140._0_4_ * fVar305 + fVar138 * (float)local_1a0._0_4_;
          fVar206 = fVar246 * (float)local_1c0._4_4_ +
                    (float)local_a0._4_4_ * fVar265 +
                    (float)local_140._4_4_ * fVar227 + fVar157 * (float)local_1a0._4_4_;
          fVar159 = fVar247 * fStack_1b8 +
                    fStack_98 * fVar266 + fStack_138 * fVar295 + fVar158 * fStack_198;
          fVar161 = fVar248 * fStack_1b4 +
                    fStack_94 * fVar303 + fStack_134 * fVar168 + fVar160 * fStack_194;
          fVar163 = fVar258 * fStack_1b0 +
                    fStack_90 * fVar225 + fStack_130 * fVar280 + fVar162 * fStack_190;
          fVar165 = fVar260 * fStack_1ac +
                    fStack_8c * fVar294 + fStack_12c * fVar229 + fVar164 * fStack_18c;
          fVar167 = fVar262 * fStack_1a8 +
                    fStack_88 * fVar304 + fStack_128 * fVar331 + fVar166 * fStack_188;
          fVar207 = fStack_764 + fVar169 + fVar207;
          pfVar3 = (float *)(bezier_basis1 + lVar136 * 4 + lVar133);
          fVar243 = *pfVar3;
          fVar245 = pfVar3[1];
          fVar246 = pfVar3[2];
          fVar247 = pfVar3[3];
          fVar248 = pfVar3[4];
          fVar258 = pfVar3[5];
          fVar260 = pfVar3[6];
          pfVar5 = (float *)(lVar133 + 0x21acb88 + lVar136 * 4);
          fVar262 = *pfVar5;
          fVar264 = pfVar5[1];
          fVar265 = pfVar5[2];
          fVar266 = pfVar5[3];
          fVar303 = pfVar5[4];
          fVar225 = pfVar5[5];
          fVar294 = pfVar5[6];
          pauVar4 = (undefined1 (*) [28])(lVar133 + 0x21ad00c + lVar136 * 4);
          fVar304 = *(float *)*pauVar4;
          fVar305 = *(float *)(*pauVar4 + 4);
          fVar227 = *(float *)(*pauVar4 + 8);
          fVar295 = *(float *)(*pauVar4 + 0xc);
          fVar168 = *(float *)(*pauVar4 + 0x10);
          fVar280 = *(float *)(*pauVar4 + 0x14);
          fVar229 = *(float *)(*pauVar4 + 0x18);
          auVar125 = *pauVar4;
          pauVar4 = (undefined1 (*) [28])(lVar133 + 0x21ad490 + lVar136 * 4);
          fVar331 = *(float *)*pauVar4;
          fVar138 = *(float *)(*pauVar4 + 4);
          fVar157 = *(float *)(*pauVar4 + 8);
          fVar158 = *(float *)(*pauVar4 + 0xc);
          fVar160 = *(float *)(*pauVar4 + 0x10);
          fVar162 = *(float *)(*pauVar4 + 0x14);
          fVar164 = *(float *)(*pauVar4 + 0x18);
          auVar124 = *pauVar4;
          fVar166 = *(float *)pauVar4[1];
          fVar185 = fVar166 + fStack_5c4;
          fVar169 = fVar166 + fVar166 + fStack_464;
          auVar322 = auVar325._0_32_;
          auVar344._0_4_ =
               fVar186 * fVar243 +
               fVar262 * auVar290._0_4_ + fVar240 * fVar304 + (float)local_480._0_4_ * fVar331;
          auVar344._4_4_ =
               fVar187 * fVar245 +
               fVar264 * auVar290._4_4_ + fVar242 * fVar305 + (float)local_480._4_4_ * fVar138;
          auVar344._8_4_ =
               fVar188 * fVar246 +
               fVar265 * auVar290._8_4_ + fVar244 * fVar227 + fStack_478 * fVar157;
          auVar344._12_4_ =
               fVar189 * fVar247 +
               fVar266 * auVar290._12_4_ + fVar249 * fVar295 + fStack_474 * fVar158;
          auVar344._16_4_ =
               fVar190 * fVar248 +
               fVar303 * auVar290._16_4_ + fVar259 * fVar168 + fStack_470 * fVar160;
          auVar344._20_4_ =
               fVar191 * fVar258 +
               fVar225 * auVar290._20_4_ + fVar261 * fVar280 + fStack_46c * fVar162;
          auVar344._24_4_ =
               fVar231 * fVar260 +
               fVar294 * auVar290._24_4_ + fVar263 * fVar229 + fStack_468 * fVar164;
          auVar344._28_4_ = fVar185 + fVar169;
          auVar256._0_4_ =
               fVar243 * (float)local_180._0_4_ +
               fVar341 * fVar262 + fVar208 * fVar304 + (float)local_5e0._0_4_ * fVar331;
          auVar256._4_4_ =
               fVar245 * (float)local_180._4_4_ +
               fVar347 * fVar264 + fVar221 * fVar305 + (float)local_5e0._4_4_ * fVar138;
          auVar256._8_4_ =
               fVar246 * fStack_178 + fVar348 * fVar265 + fVar223 * fVar227 + fStack_5d8 * fVar157;
          auVar256._12_4_ =
               fVar247 * fStack_174 + fVar349 * fVar266 + fVar228 * fVar295 + fStack_5d4 * fVar158;
          auVar256._16_4_ =
               fVar248 * fStack_170 + fVar222 * fVar303 + fVar230 * fVar168 + fStack_5d0 * fVar160;
          auVar256._20_4_ =
               fVar258 * fStack_16c + fVar224 * fVar225 + fVar239 * fVar280 + fStack_5cc * fVar162;
          auVar256._24_4_ =
               fVar260 * fStack_168 + fVar226 * fVar294 + fVar241 * fVar229 + fStack_5c8 * fVar164;
          auVar256._28_4_ = fVar169 + fVar166 + fVar166 + *(float *)pauVar2[1];
          local_580._0_4_ =
               (float)local_a0._0_4_ * fVar262 +
               (float)local_140._0_4_ * fVar304 + fVar331 * (float)local_1a0._0_4_ +
               fVar243 * (float)local_1c0._0_4_;
          local_580._4_4_ =
               (float)local_a0._4_4_ * fVar264 +
               (float)local_140._4_4_ * fVar305 + fVar138 * (float)local_1a0._4_4_ +
               fVar245 * (float)local_1c0._4_4_;
          fStack_578 = fStack_98 * fVar265 + fStack_138 * fVar227 + fVar157 * fStack_198 +
                       fVar246 * fStack_1b8;
          fStack_574 = fStack_94 * fVar266 + fStack_134 * fVar295 + fVar158 * fStack_194 +
                       fVar247 * fStack_1b4;
          fStack_570 = fStack_90 * fVar303 + fStack_130 * fVar168 + fVar160 * fStack_190 +
                       fVar248 * fStack_1b0;
          fStack_56c = fStack_8c * fVar225 + fStack_12c * fVar280 + fVar162 * fStack_18c +
                       fVar258 * fStack_1ac;
          fStack_568 = fStack_88 * fVar294 + fStack_128 * fVar229 + fVar164 * fStack_188 +
                       fVar260 * fStack_1a8;
          fStack_564 = fVar166 + fVar185 + fVar169;
          auVar219 = vsubps_avx(auVar344,_local_780);
          auVar148 = vsubps_avx(auVar256,auVar217);
          fVar230 = auVar219._0_4_;
          fVar239 = auVar219._4_4_;
          auVar71._4_4_ = fVar239 * auVar217._4_4_;
          auVar71._0_4_ = fVar230 * auVar217._0_4_;
          fVar241 = auVar219._8_4_;
          auVar71._8_4_ = fVar241 * auVar217._8_4_;
          fVar304 = auVar219._12_4_;
          auVar71._12_4_ = fVar304 * auVar217._12_4_;
          fVar305 = auVar219._16_4_;
          auVar71._16_4_ = fVar305 * auVar217._16_4_;
          fVar227 = auVar219._20_4_;
          auVar71._20_4_ = fVar227 * auVar217._20_4_;
          fVar295 = auVar219._24_4_;
          auVar71._24_4_ = fVar295 * auVar217._24_4_;
          auVar71._28_4_ = fVar169;
          fVar208 = auVar148._0_4_;
          fVar221 = auVar148._4_4_;
          auVar72._4_4_ = (float)local_780._4_4_ * fVar221;
          auVar72._0_4_ = (float)local_780._0_4_ * fVar208;
          fVar222 = auVar148._8_4_;
          auVar72._8_4_ = fStack_778 * fVar222;
          fVar223 = auVar148._12_4_;
          auVar72._12_4_ = fStack_774 * fVar223;
          fVar224 = auVar148._16_4_;
          auVar72._16_4_ = fStack_770 * fVar224;
          fVar226 = auVar148._20_4_;
          auVar72._20_4_ = fStack_76c * fVar226;
          fVar228 = auVar148._24_4_;
          auVar72._24_4_ = fStack_768 * fVar228;
          auVar72._28_4_ = auVar256._28_4_;
          auVar23 = vsubps_avx(auVar71,auVar72);
          auVar117._4_4_ = fVar206;
          auVar117._0_4_ = fVar139;
          auVar117._8_4_ = fVar159;
          auVar117._12_4_ = fVar161;
          auVar117._16_4_ = fVar163;
          auVar117._20_4_ = fVar165;
          auVar117._24_4_ = fVar167;
          auVar117._28_4_ = fVar207;
          auVar154 = vmaxps_avx(auVar117,_local_580);
          auVar73._4_4_ = auVar154._4_4_ * auVar154._4_4_ * (fVar239 * fVar239 + fVar221 * fVar221);
          auVar73._0_4_ = auVar154._0_4_ * auVar154._0_4_ * (fVar230 * fVar230 + fVar208 * fVar208);
          auVar73._8_4_ = auVar154._8_4_ * auVar154._8_4_ * (fVar241 * fVar241 + fVar222 * fVar222);
          auVar73._12_4_ =
               auVar154._12_4_ * auVar154._12_4_ * (fVar304 * fVar304 + fVar223 * fVar223);
          auVar73._16_4_ =
               auVar154._16_4_ * auVar154._16_4_ * (fVar305 * fVar305 + fVar224 * fVar224);
          auVar73._20_4_ =
               auVar154._20_4_ * auVar154._20_4_ * (fVar227 * fVar227 + fVar226 * fVar226);
          auVar73._24_4_ =
               auVar154._24_4_ * auVar154._24_4_ * (fVar295 * fVar295 + fVar228 * fVar228);
          auVar73._28_4_ = fVar185 + auVar256._28_4_;
          auVar74._4_4_ = auVar23._4_4_ * auVar23._4_4_;
          auVar74._0_4_ = auVar23._0_4_ * auVar23._0_4_;
          auVar74._8_4_ = auVar23._8_4_ * auVar23._8_4_;
          auVar74._12_4_ = auVar23._12_4_ * auVar23._12_4_;
          auVar74._16_4_ = auVar23._16_4_ * auVar23._16_4_;
          auVar74._20_4_ = auVar23._20_4_ * auVar23._20_4_;
          auVar74._24_4_ = auVar23._24_4_ * auVar23._24_4_;
          auVar74._28_4_ = auVar23._28_4_;
          auVar154 = vcmpps_avx(auVar74,auVar73,2);
          local_2a0 = (uint)lVar136;
          auVar196 = vpshufd_avx(ZEXT416(local_2a0),0);
          auVar233 = vpor_avx(auVar196,_DAT_01f7fcf0);
          auVar196 = vpor_avx(auVar196,_DAT_01fafea0);
          auVar233 = vpcmpgtd_avx(_local_4e0,auVar233);
          auVar196 = vpcmpgtd_avx(_local_4e0,auVar196);
          auVar205._16_16_ = auVar196;
          auVar205._0_16_ = auVar233;
          auVar23 = auVar205 & auVar154;
          local_6c0 = auVar217;
          if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar23 >> 0x7f,0) == '\0') &&
                (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar23 >> 0xbf,0) == '\0') &&
              (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar23[0x1f]) {
LAB_010b61e8:
            auVar156 = ZEXT3264(auVar148);
            auVar220 = ZEXT3264(auVar217);
            auVar325 = ZEXT3264(auVar322);
            fVar208 = (float)local_680._0_4_;
            fVar221 = (float)local_680._4_4_;
            fVar223 = fStack_678;
            fVar228 = fStack_674;
            fVar230 = fStack_670;
            fVar239 = fStack_66c;
            fVar241 = fStack_668;
          }
          else {
            local_620._0_4_ = auVar125._0_4_;
            local_620._4_4_ = auVar125._4_4_;
            fStack_618 = auVar125._8_4_;
            fStack_614 = auVar125._12_4_;
            fStack_610 = auVar125._16_4_;
            fStack_60c = auVar125._20_4_;
            fStack_608 = auVar125._24_4_;
            local_740._0_4_ = auVar124._0_4_;
            local_740._4_4_ = auVar124._4_4_;
            fStack_738 = auVar124._8_4_;
            fStack_734 = auVar124._12_4_;
            fStack_730 = auVar124._16_4_;
            fStack_72c = auVar124._20_4_;
            fStack_728 = auVar124._24_4_;
            local_740._0_4_ =
                 fVar243 * (float)local_560._0_4_ +
                 fVar262 * (float)local_460._0_4_ +
                 (float)local_c0._0_4_ * (float)local_620._0_4_ +
                 (float)local_800._0_4_ * (float)local_740._0_4_;
            local_740._4_4_ =
                 fVar245 * (float)local_560._4_4_ +
                 fVar264 * (float)local_460._4_4_ +
                 (float)local_c0._4_4_ * (float)local_620._4_4_ +
                 (float)local_800._4_4_ * (float)local_740._4_4_;
            fStack_738 = fVar246 * fStack_558 +
                         fVar265 * fStack_458 + fStack_b8 * fStack_618 + fStack_7f8 * fStack_738;
            fStack_734 = fVar247 * fStack_554 +
                         fVar266 * fStack_454 + fStack_b4 * fStack_614 + fStack_7f4 * fStack_734;
            fStack_730 = fVar248 * fStack_550 +
                         fVar303 * fStack_450 + fStack_b0 * fStack_610 + fStack_7f0 * fStack_730;
            fStack_72c = fVar258 * fStack_54c +
                         fVar225 * fStack_44c + fStack_ac * fStack_60c + fStack_7ec * fStack_72c;
            fStack_728 = fVar260 * fStack_548 +
                         fVar294 * fStack_448 + fStack_a8 * fStack_608 + fStack_7e8 * fStack_728;
            fStack_724 = auVar325._28_4_ + auVar148._28_4_ + fVar207 + 0.0;
            local_700._0_4_ = auVar122._0_4_;
            local_700._4_4_ = auVar122._4_4_;
            uStack_6f8._0_4_ = auVar122._8_4_;
            uStack_6f8._4_4_ = auVar122._12_4_;
            auStack_6f0._0_4_ = auVar122._16_4_;
            auStack_6f0._4_4_ = auVar122._20_4_;
            fStack_6e8 = auVar122._24_4_;
            local_720._0_4_ = auVar121._0_4_;
            local_720._4_4_ = auVar121._4_4_;
            fStack_718 = auVar121._8_4_;
            fStack_714 = auVar121._12_4_;
            auStack_710._0_4_ = auVar121._16_4_;
            auStack_710._4_4_ = auVar121._20_4_;
            fStack_708 = auVar121._24_4_;
            local_600._0_4_ = auVar120._0_4_;
            local_600._4_4_ = auVar120._4_4_;
            fStack_5f8 = auVar120._8_4_;
            fStack_5f4 = auVar120._12_4_;
            fStack_5f0 = auVar120._16_4_;
            fStack_5ec = auVar120._20_4_;
            fStack_5e8 = auVar120._24_4_;
            pfVar5 = (float *)(lVar133 + 0x21abdfc + lVar136 * 4);
            fVar208 = *pfVar5;
            fVar221 = pfVar5[1];
            fVar222 = pfVar5[2];
            fVar223 = pfVar5[3];
            fVar224 = pfVar5[4];
            fVar226 = pfVar5[5];
            fVar228 = pfVar5[6];
            pfVar6 = (float *)(lVar133 + 0x21ac280 + lVar136 * 4);
            fVar230 = *pfVar6;
            fVar239 = pfVar6[1];
            fVar241 = pfVar6[2];
            fVar243 = pfVar6[3];
            fVar245 = pfVar6[4];
            fVar246 = pfVar6[5];
            fVar247 = pfVar6[6];
            fVar280 = pfVar3[7] + 0.0;
            pfVar7 = (float *)(lVar133 + 0x21ab978 + lVar136 * 4);
            fVar248 = *pfVar7;
            fVar258 = pfVar7[1];
            fVar260 = pfVar7[2];
            fVar262 = pfVar7[3];
            fVar264 = pfVar7[4];
            fVar265 = pfVar7[5];
            fVar266 = pfVar7[6];
            fVar168 = pfVar5[7] + pfVar6[7];
            fStack_324 = pfVar6[7] + fVar280;
            fVar280 = pfVar3[7] + auVar344._28_4_ + fVar280;
            pfVar3 = (float *)(lVar133 + 0x21ab4f4 + lVar136 * 4);
            fVar303 = *pfVar3;
            fVar225 = pfVar3[1];
            fVar294 = pfVar3[2];
            fVar304 = pfVar3[3];
            fVar305 = pfVar3[4];
            fVar227 = pfVar3[5];
            fVar295 = pfVar3[6];
            local_4a0 = fVar186 * fVar303 +
                        fVar248 * (float)local_660._0_4_ +
                        fVar240 * fVar208 + (float)local_480._0_4_ * fVar230;
            fStack_49c = fVar187 * fVar225 +
                         fVar258 * (float)local_660._4_4_ +
                         fVar242 * fVar221 + (float)local_480._4_4_ * fVar239;
            fStack_498 = fVar188 * fVar294 +
                         fVar260 * fStack_658 + fVar244 * fVar222 + fStack_478 * fVar241;
            fStack_494 = fVar189 * fVar304 +
                         fVar262 * fStack_654 + fVar249 * fVar223 + fStack_474 * fVar243;
            fStack_490 = fVar190 * fVar305 +
                         fVar264 * fStack_650 + fVar259 * fVar224 + fStack_470 * fVar245;
            fStack_48c = fVar191 * fVar227 +
                         fVar265 * fStack_64c + fVar261 * fVar226 + fStack_46c * fVar246;
            fStack_488 = fVar231 * fVar295 +
                         fVar266 * fStack_648 + fVar263 * fVar228 + fStack_468 * fVar247;
            fStack_484 = fVar168 + fStack_324;
            fStack_324 = fStack_324 + fVar280;
            local_340._4_4_ =
                 (float)local_180._4_4_ * fVar225 +
                 (float)local_680._4_4_ * fVar221 + (float)local_5e0._4_4_ * fVar239 +
                 fVar258 * (float)local_6a0._4_4_;
            local_340._0_4_ =
                 (float)local_180._0_4_ * fVar303 +
                 (float)local_680._0_4_ * fVar208 + (float)local_5e0._0_4_ * fVar230 +
                 fVar248 * (float)local_6a0._0_4_;
            fStack_338 = fStack_178 * fVar294 +
                         fStack_678 * fVar222 + fStack_5d8 * fVar241 + fVar260 * fStack_698;
            fStack_334 = fStack_174 * fVar304 +
                         fStack_674 * fVar223 + fStack_5d4 * fVar243 + fVar262 * fStack_694;
            fStack_330 = fStack_170 * fVar305 +
                         fStack_670 * fVar224 + fStack_5d0 * fVar245 + fVar264 * fStack_690;
            fStack_32c = fStack_16c * fVar227 +
                         fStack_66c * fVar226 + fStack_5cc * fVar246 + fVar265 * fStack_68c;
            fStack_328 = fStack_168 * fVar295 +
                         fStack_668 * fVar228 + fStack_5c8 * fVar247 + fVar266 * fStack_688;
            auVar345._0_4_ =
                 (float)local_460._0_4_ * fVar248 +
                 (float)local_c0._0_4_ * fVar208 + (float)local_800._0_4_ * fVar230 +
                 fVar303 * (float)local_560._0_4_;
            auVar345._4_4_ =
                 (float)local_460._4_4_ * fVar258 +
                 (float)local_c0._4_4_ * fVar221 + (float)local_800._4_4_ * fVar239 +
                 fVar225 * (float)local_560._4_4_;
            auVar345._8_4_ =
                 fStack_458 * fVar260 + fStack_b8 * fVar222 + fStack_7f8 * fVar241 +
                 fVar294 * fStack_558;
            auVar345._12_4_ =
                 fStack_454 * fVar262 + fStack_b4 * fVar223 + fStack_7f4 * fVar243 +
                 fVar304 * fStack_554;
            auVar345._16_4_ =
                 fStack_450 * fVar264 + fStack_b0 * fVar224 + fStack_7f0 * fVar245 +
                 fVar305 * fStack_550;
            auVar345._20_4_ =
                 fStack_44c * fVar265 + fStack_ac * fVar226 + fStack_7ec * fVar246 +
                 fVar227 * fStack_54c;
            auVar345._24_4_ =
                 fStack_448 * fVar266 + fStack_a8 * fVar228 + fStack_7e8 * fVar247 +
                 fVar295 * fStack_548;
            auVar345._28_4_ = pfVar7[7] + fVar168 + fVar280;
            pfVar3 = (float *)(lVar133 + 0x21ae21c + lVar136 * 4);
            fVar208 = *pfVar3;
            fVar221 = pfVar3[1];
            fVar222 = pfVar3[2];
            fVar223 = pfVar3[3];
            fVar224 = pfVar3[4];
            fVar226 = pfVar3[5];
            fVar228 = pfVar3[6];
            pfVar5 = (float *)(lVar133 + 0x21ae6a0 + lVar136 * 4);
            fVar230 = *pfVar5;
            fVar239 = pfVar5[1];
            fVar241 = pfVar5[2];
            fVar243 = pfVar5[3];
            fVar245 = pfVar5[4];
            fVar246 = pfVar5[5];
            fVar247 = pfVar5[6];
            pfVar6 = (float *)(lVar133 + 0x21add98 + lVar136 * 4);
            fVar248 = *pfVar6;
            fVar258 = pfVar6[1];
            fVar260 = pfVar6[2];
            fVar262 = pfVar6[3];
            fVar264 = pfVar6[4];
            fVar265 = pfVar6[5];
            fVar266 = pfVar6[6];
            pfVar7 = (float *)(lVar133 + 0x21ad914 + lVar136 * 4);
            fVar303 = *pfVar7;
            fVar225 = pfVar7[1];
            fVar294 = pfVar7[2];
            fVar304 = pfVar7[3];
            fVar305 = pfVar7[4];
            fVar227 = pfVar7[5];
            fVar295 = pfVar7[6];
            auVar311._0_4_ =
                 fVar186 * fVar303 +
                 fVar248 * (float)local_660._0_4_ +
                 fVar208 * (float)local_540._0_4_ + (float)local_480._0_4_ * fVar230;
            auVar311._4_4_ =
                 fVar187 * fVar225 +
                 fVar258 * (float)local_660._4_4_ +
                 fVar221 * (float)local_540._4_4_ + (float)local_480._4_4_ * fVar239;
            auVar311._8_4_ =
                 fVar188 * fVar294 +
                 fVar260 * fStack_658 + fVar222 * fStack_538 + fStack_478 * fVar241;
            auVar311._12_4_ =
                 fVar189 * fVar304 +
                 fVar262 * fStack_654 + fVar223 * fStack_534 + fStack_474 * fVar243;
            auVar311._16_4_ =
                 fVar190 * fVar305 +
                 fVar264 * fStack_650 + fVar224 * fStack_530 + fStack_470 * fVar245;
            auVar311._20_4_ =
                 fVar191 * fVar227 +
                 fVar265 * fStack_64c + fVar226 * fStack_52c + fStack_46c * fVar246;
            auVar311._24_4_ =
                 fVar231 * fVar295 +
                 fVar266 * fStack_648 + fVar228 * fStack_528 + fStack_468 * fVar247;
            auVar311._28_4_ = fStack_5c4 + fStack_5c4 + fStack_464 + fStack_324;
            auVar339._0_4_ =
                 (float)local_180._0_4_ * fVar303 +
                 fVar248 * (float)local_6a0._0_4_ +
                 (float)local_680._0_4_ * fVar208 + (float)local_5e0._0_4_ * fVar230;
            auVar339._4_4_ =
                 (float)local_180._4_4_ * fVar225 +
                 fVar258 * (float)local_6a0._4_4_ +
                 (float)local_680._4_4_ * fVar221 + (float)local_5e0._4_4_ * fVar239;
            auVar339._8_4_ =
                 fStack_178 * fVar294 +
                 fVar260 * fStack_698 + fStack_678 * fVar222 + fStack_5d8 * fVar241;
            auVar339._12_4_ =
                 fStack_174 * fVar304 +
                 fVar262 * fStack_694 + fStack_674 * fVar223 + fStack_5d4 * fVar243;
            auVar339._16_4_ =
                 fStack_170 * fVar305 +
                 fVar264 * fStack_690 + fStack_670 * fVar224 + fStack_5d0 * fVar245;
            auVar339._20_4_ =
                 fStack_16c * fVar227 +
                 fVar265 * fStack_68c + fStack_66c * fVar226 + fStack_5cc * fVar246;
            auVar339._24_4_ =
                 fStack_168 * fVar295 +
                 fVar266 * fStack_688 + fStack_668 * fVar228 + fStack_5c8 * fVar247;
            auVar339._28_4_ = fStack_5c4 + fStack_5c4 + fStack_444 + fStack_5c4;
            auVar257._8_4_ = 0x7fffffff;
            auVar257._0_8_ = 0x7fffffff7fffffff;
            auVar257._12_4_ = 0x7fffffff;
            auVar257._16_4_ = 0x7fffffff;
            auVar257._20_4_ = 0x7fffffff;
            auVar257._24_4_ = 0x7fffffff;
            auVar257._28_4_ = 0x7fffffff;
            auVar119._4_4_ = fStack_49c;
            auVar119._0_4_ = local_4a0;
            auVar119._8_4_ = fStack_498;
            auVar119._12_4_ = fStack_494;
            auVar119._16_4_ = fStack_490;
            auVar119._20_4_ = fStack_48c;
            auVar119._24_4_ = fStack_488;
            auVar119._28_4_ = fStack_484;
            auVar23 = vandps_avx(auVar119,auVar257);
            auVar322 = vandps_avx(_local_340,auVar257);
            auVar322 = vmaxps_avx(auVar23,auVar322);
            auVar23 = vandps_avx(auVar345,auVar257);
            auVar322 = vmaxps_avx(auVar322,auVar23);
            auVar322 = vcmpps_avx(auVar322,_local_360,1);
            auVar24 = vblendvps_avx(auVar119,auVar219,auVar322);
            auVar150._0_4_ =
                 fVar303 * (float)local_560._0_4_ +
                 fVar248 * (float)local_460._0_4_ +
                 fVar230 * (float)local_800._0_4_ + (float)local_c0._0_4_ * fVar208;
            auVar150._4_4_ =
                 fVar225 * (float)local_560._4_4_ +
                 fVar258 * (float)local_460._4_4_ +
                 fVar239 * (float)local_800._4_4_ + (float)local_c0._4_4_ * fVar221;
            auVar150._8_4_ =
                 fVar294 * fStack_558 +
                 fVar260 * fStack_458 + fVar241 * fStack_7f8 + fStack_b8 * fVar222;
            auVar150._12_4_ =
                 fVar304 * fStack_554 +
                 fVar262 * fStack_454 + fVar243 * fStack_7f4 + fStack_b4 * fVar223;
            auVar150._16_4_ =
                 fVar305 * fStack_550 +
                 fVar264 * fStack_450 + fVar245 * fStack_7f0 + fStack_b0 * fVar224;
            auVar150._20_4_ =
                 fVar227 * fStack_54c +
                 fVar265 * fStack_44c + fVar246 * fStack_7ec + fStack_ac * fVar226;
            auVar150._24_4_ =
                 fVar295 * fStack_548 +
                 fVar266 * fStack_448 + fVar247 * fStack_7e8 + fStack_a8 * fVar228;
            auVar150._28_4_ = auVar23._28_4_ + pfVar6[7] + pfVar5[7] + pfVar3[7];
            auVar360 = vblendvps_avx(_local_340,auVar148,auVar322);
            auVar23 = vandps_avx(auVar311,auVar257);
            auVar322 = vandps_avx(auVar339,auVar257);
            auVar25 = vmaxps_avx(auVar23,auVar322);
            auVar23 = vandps_avx(auVar150,auVar257);
            auVar23 = vmaxps_avx(auVar25,auVar23);
            local_6e0._0_4_ = auVar123._0_4_;
            local_6e0._4_4_ = auVar123._4_4_;
            uStack_6d8._0_4_ = auVar123._8_4_;
            uStack_6d8._4_4_ = auVar123._12_4_;
            auStack_6d0._0_4_ = auVar123._16_4_;
            auStack_6d0._4_4_ = auVar123._20_4_;
            fStack_6c8 = auVar123._24_4_;
            auVar322 = vcmpps_avx(auVar23,_local_360,1);
            auVar23 = vblendvps_avx(auVar311,auVar219,auVar322);
            auVar151._0_4_ =
                 (float)local_560._0_4_ * (float)local_6e0._0_4_ +
                 (float)local_460._0_4_ * (float)local_700._0_4_ +
                 (float)local_c0._0_4_ * (float)local_720._0_4_ +
                 (float)local_800._0_4_ * (float)local_600._0_4_;
            auVar151._4_4_ =
                 (float)local_560._4_4_ * (float)local_6e0._4_4_ +
                 (float)local_460._4_4_ * (float)local_700._4_4_ +
                 (float)local_c0._4_4_ * (float)local_720._4_4_ +
                 (float)local_800._4_4_ * (float)local_600._4_4_;
            auVar151._8_4_ =
                 fStack_558 * (float)uStack_6d8 +
                 fStack_458 * (float)uStack_6f8 + fStack_b8 * fStack_718 + fStack_7f8 * fStack_5f8;
            auVar151._12_4_ =
                 fStack_554 * uStack_6d8._4_4_ +
                 fStack_454 * uStack_6f8._4_4_ + fStack_b4 * fStack_714 + fStack_7f4 * fStack_5f4;
            auVar151._16_4_ =
                 fStack_550 * (float)auStack_6d0._0_4_ +
                 fStack_450 * (float)auStack_6f0._0_4_ +
                 fStack_b0 * (float)auStack_710._0_4_ + fStack_7f0 * fStack_5f0;
            auVar151._20_4_ =
                 fStack_54c * (float)auStack_6d0._4_4_ +
                 fStack_44c * (float)auStack_6f0._4_4_ +
                 fStack_ac * (float)auStack_710._4_4_ + fStack_7ec * fStack_5ec;
            auVar151._24_4_ =
                 fStack_548 * fStack_6c8 +
                 fStack_448 * fStack_6e8 + fStack_a8 * fStack_708 + fStack_7e8 * fStack_5e8;
            auVar151._28_4_ = auVar25._28_4_ + fStack_724 + fVar207 + 0.0;
            auVar322 = vblendvps_avx(auVar339,auVar148,auVar322);
            fVar160 = auVar24._0_4_;
            fVar162 = auVar24._4_4_;
            fVar164 = auVar24._8_4_;
            fVar166 = auVar24._12_4_;
            fVar341 = auVar24._16_4_;
            fVar347 = auVar24._20_4_;
            fVar348 = auVar24._24_4_;
            fVar349 = auVar24._28_4_;
            fVar248 = auVar23._0_4_;
            fVar260 = auVar23._4_4_;
            fVar264 = auVar23._8_4_;
            fVar266 = auVar23._12_4_;
            fVar225 = auVar23._16_4_;
            fVar304 = auVar23._20_4_;
            fVar227 = auVar23._24_4_;
            fVar208 = auVar360._0_4_;
            fVar222 = auVar360._4_4_;
            fVar224 = auVar360._8_4_;
            fVar228 = auVar360._12_4_;
            fVar239 = auVar360._16_4_;
            fVar243 = auVar360._20_4_;
            fVar246 = auVar360._24_4_;
            auVar323._0_4_ = fVar208 * fVar208 + fVar160 * fVar160;
            auVar323._4_4_ = fVar222 * fVar222 + fVar162 * fVar162;
            auVar323._8_4_ = fVar224 * fVar224 + fVar164 * fVar164;
            auVar323._12_4_ = fVar228 * fVar228 + fVar166 * fVar166;
            auVar323._16_4_ = fVar239 * fVar239 + fVar341 * fVar341;
            auVar323._20_4_ = fVar243 * fVar243 + fVar347 * fVar347;
            auVar323._24_4_ = fVar246 * fVar246 + fVar348 * fVar348;
            auVar323._28_4_ = fStack_164 + auVar219._28_4_;
            auVar219 = vrsqrtps_avx(auVar323);
            fVar221 = auVar219._0_4_;
            fVar223 = auVar219._4_4_;
            auVar75._4_4_ = fVar223 * 1.5;
            auVar75._0_4_ = fVar221 * 1.5;
            fVar226 = auVar219._8_4_;
            auVar75._8_4_ = fVar226 * 1.5;
            fVar230 = auVar219._12_4_;
            auVar75._12_4_ = fVar230 * 1.5;
            fVar241 = auVar219._16_4_;
            auVar75._16_4_ = fVar241 * 1.5;
            fVar245 = auVar219._20_4_;
            auVar75._20_4_ = fVar245 * 1.5;
            fVar247 = auVar219._24_4_;
            auVar75._24_4_ = fVar247 * 1.5;
            auVar75._28_4_ = auVar339._28_4_;
            auVar76._4_4_ = fVar223 * fVar223 * fVar223 * auVar323._4_4_ * 0.5;
            auVar76._0_4_ = fVar221 * fVar221 * fVar221 * auVar323._0_4_ * 0.5;
            auVar76._8_4_ = fVar226 * fVar226 * fVar226 * auVar323._8_4_ * 0.5;
            auVar76._12_4_ = fVar230 * fVar230 * fVar230 * auVar323._12_4_ * 0.5;
            auVar76._16_4_ = fVar241 * fVar241 * fVar241 * auVar323._16_4_ * 0.5;
            auVar76._20_4_ = fVar245 * fVar245 * fVar245 * auVar323._20_4_ * 0.5;
            auVar76._24_4_ = fVar247 * fVar247 * fVar247 * auVar323._24_4_ * 0.5;
            auVar76._28_4_ = auVar323._28_4_;
            auVar24 = vsubps_avx(auVar75,auVar76);
            fVar168 = auVar24._0_4_;
            fVar280 = auVar24._4_4_;
            fVar229 = auVar24._8_4_;
            fVar331 = auVar24._12_4_;
            fVar138 = auVar24._16_4_;
            fVar157 = auVar24._20_4_;
            fVar158 = auVar24._24_4_;
            fVar221 = auVar322._0_4_;
            fVar223 = auVar322._4_4_;
            fVar226 = auVar322._8_4_;
            fVar230 = auVar322._12_4_;
            fVar241 = auVar322._16_4_;
            fVar245 = auVar322._20_4_;
            fVar247 = auVar322._24_4_;
            auVar300._0_4_ = fVar221 * fVar221 + fVar248 * fVar248;
            auVar300._4_4_ = fVar223 * fVar223 + fVar260 * fVar260;
            auVar300._8_4_ = fVar226 * fVar226 + fVar264 * fVar264;
            auVar300._12_4_ = fVar230 * fVar230 + fVar266 * fVar266;
            auVar300._16_4_ = fVar241 * fVar241 + fVar225 * fVar225;
            auVar300._20_4_ = fVar245 * fVar245 + fVar304 * fVar304;
            auVar300._24_4_ = fVar247 * fVar247 + fVar227 * fVar227;
            auVar300._28_4_ = auVar219._28_4_ + auVar23._28_4_;
            auVar219 = vrsqrtps_avx(auVar300);
            fVar258 = auVar219._0_4_;
            fVar262 = auVar219._4_4_;
            auVar77._4_4_ = fVar262 * 1.5;
            auVar77._0_4_ = fVar258 * 1.5;
            fVar265 = auVar219._8_4_;
            auVar77._8_4_ = fVar265 * 1.5;
            fVar303 = auVar219._12_4_;
            auVar77._12_4_ = fVar303 * 1.5;
            fVar294 = auVar219._16_4_;
            auVar77._16_4_ = fVar294 * 1.5;
            fVar305 = auVar219._20_4_;
            auVar77._20_4_ = fVar305 * 1.5;
            fVar295 = auVar219._24_4_;
            auVar77._24_4_ = fVar295 * 1.5;
            auVar77._28_4_ = auVar339._28_4_;
            auVar78._4_4_ = fVar262 * fVar262 * fVar262 * auVar300._4_4_ * 0.5;
            auVar78._0_4_ = fVar258 * fVar258 * fVar258 * auVar300._0_4_ * 0.5;
            auVar78._8_4_ = fVar265 * fVar265 * fVar265 * auVar300._8_4_ * 0.5;
            auVar78._12_4_ = fVar303 * fVar303 * fVar303 * auVar300._12_4_ * 0.5;
            auVar78._16_4_ = fVar294 * fVar294 * fVar294 * auVar300._16_4_ * 0.5;
            auVar78._20_4_ = fVar305 * fVar305 * fVar305 * auVar300._20_4_ * 0.5;
            auVar78._24_4_ = fVar295 * fVar295 * fVar295 * auVar300._24_4_ * 0.5;
            auVar78._28_4_ = auVar300._28_4_;
            auVar23 = vsubps_avx(auVar77,auVar78);
            fVar258 = auVar23._0_4_;
            fVar262 = auVar23._4_4_;
            fVar265 = auVar23._8_4_;
            fVar303 = auVar23._12_4_;
            fVar294 = auVar23._16_4_;
            fVar305 = auVar23._20_4_;
            fVar295 = auVar23._24_4_;
            fVar208 = fVar139 * fVar168 * fVar208;
            fVar222 = fVar206 * fVar280 * fVar222;
            auVar79._4_4_ = fVar222;
            auVar79._0_4_ = fVar208;
            fVar224 = fVar159 * fVar229 * fVar224;
            auVar79._8_4_ = fVar224;
            fVar228 = fVar161 * fVar331 * fVar228;
            auVar79._12_4_ = fVar228;
            fVar239 = fVar163 * fVar138 * fVar239;
            auVar79._16_4_ = fVar239;
            fVar243 = fVar165 * fVar157 * fVar243;
            auVar79._20_4_ = fVar243;
            fVar246 = fVar167 * fVar158 * fVar246;
            auVar79._24_4_ = fVar246;
            auVar79._28_4_ = auVar219._28_4_;
            local_6e0._4_4_ = fVar222 + (float)local_780._4_4_;
            local_6e0._0_4_ = fVar208 + (float)local_780._0_4_;
            uStack_6d8._0_4_ = fVar224 + fStack_778;
            uStack_6d8._4_4_ = fVar228 + fStack_774;
            auStack_6d0._0_4_ = fVar239 + fStack_770;
            auStack_6d0._4_4_ = fVar243 + fStack_76c;
            fStack_6c8 = fVar246 + fStack_768;
            fStack_6c4 = auVar219._28_4_ + fStack_764;
            fVar208 = fVar139 * fVar168 * -fVar160;
            fVar222 = fVar206 * fVar280 * -fVar162;
            auVar80._4_4_ = fVar222;
            auVar80._0_4_ = fVar208;
            fVar224 = fVar159 * fVar229 * -fVar164;
            auVar80._8_4_ = fVar224;
            fVar228 = fVar161 * fVar331 * -fVar166;
            auVar80._12_4_ = fVar228;
            fVar239 = fVar163 * fVar138 * -fVar341;
            auVar80._16_4_ = fVar239;
            fVar243 = fVar165 * fVar157 * -fVar347;
            auVar80._20_4_ = fVar243;
            fVar246 = fVar167 * fVar158 * -fVar348;
            auVar80._24_4_ = fVar246;
            auVar80._28_4_ = -fVar349;
            local_600._4_4_ = auVar217._4_4_ + fVar222;
            local_600._0_4_ = auVar217._0_4_ + fVar208;
            fStack_5f8 = auVar217._8_4_ + fVar224;
            fStack_5f4 = auVar217._12_4_ + fVar228;
            fStack_5f0 = auVar217._16_4_ + fVar239;
            fStack_5ec = auVar217._20_4_ + fVar243;
            fStack_5e8 = auVar217._24_4_ + fVar246;
            fStack_5e4 = auVar217._28_4_ + -fVar349;
            fVar208 = fVar168 * 0.0 * fVar139;
            fVar222 = fVar280 * 0.0 * fVar206;
            auVar81._4_4_ = fVar222;
            auVar81._0_4_ = fVar208;
            fVar224 = fVar229 * 0.0 * fVar159;
            auVar81._8_4_ = fVar224;
            fVar228 = fVar331 * 0.0 * fVar161;
            auVar81._12_4_ = fVar228;
            fVar239 = fVar138 * 0.0 * fVar163;
            auVar81._16_4_ = fVar239;
            fVar243 = fVar157 * 0.0 * fVar165;
            auVar81._20_4_ = fVar243;
            fVar246 = fVar158 * 0.0 * fVar167;
            auVar81._24_4_ = fVar246;
            auVar81._28_4_ = fVar349;
            auVar26 = vsubps_avx(_local_780,auVar79);
            auVar359._0_4_ = fVar208 + auVar151._0_4_;
            auVar359._4_4_ = fVar222 + auVar151._4_4_;
            auVar359._8_4_ = fVar224 + auVar151._8_4_;
            auVar359._12_4_ = fVar228 + auVar151._12_4_;
            auVar359._16_4_ = fVar239 + auVar151._16_4_;
            auVar359._20_4_ = fVar243 + auVar151._20_4_;
            auVar359._24_4_ = fVar246 + auVar151._24_4_;
            auVar359._28_4_ = fVar349 + auVar151._28_4_;
            fVar208 = (float)local_580._0_4_ * fVar258 * fVar221;
            fVar221 = (float)local_580._4_4_ * fVar262 * fVar223;
            auVar82._4_4_ = fVar221;
            auVar82._0_4_ = fVar208;
            fVar222 = fStack_578 * fVar265 * fVar226;
            auVar82._8_4_ = fVar222;
            fVar223 = fStack_574 * fVar303 * fVar230;
            auVar82._12_4_ = fVar223;
            fVar224 = fStack_570 * fVar294 * fVar241;
            auVar82._16_4_ = fVar224;
            fVar226 = fStack_56c * fVar305 * fVar245;
            auVar82._20_4_ = fVar226;
            fVar228 = fStack_568 * fVar295 * fVar247;
            auVar82._24_4_ = fVar228;
            auVar82._28_4_ = fStack_764;
            auVar143 = vsubps_avx(auVar217,auVar80);
            auVar346._0_4_ = auVar344._0_4_ + fVar208;
            auVar346._4_4_ = auVar344._4_4_ + fVar221;
            auVar346._8_4_ = auVar344._8_4_ + fVar222;
            auVar346._12_4_ = auVar344._12_4_ + fVar223;
            auVar346._16_4_ = auVar344._16_4_ + fVar224;
            auVar346._20_4_ = auVar344._20_4_ + fVar226;
            auVar346._24_4_ = auVar344._24_4_ + fVar228;
            auVar346._28_4_ = auVar344._28_4_ + fStack_764;
            fVar208 = fVar258 * -fVar248 * (float)local_580._0_4_;
            fVar221 = fVar262 * -fVar260 * (float)local_580._4_4_;
            auVar83._4_4_ = fVar221;
            auVar83._0_4_ = fVar208;
            fVar222 = fVar265 * -fVar264 * fStack_578;
            auVar83._8_4_ = fVar222;
            fVar223 = fVar303 * -fVar266 * fStack_574;
            auVar83._12_4_ = fVar223;
            fVar224 = fVar294 * -fVar225 * fStack_570;
            auVar83._16_4_ = fVar224;
            fVar226 = fVar305 * -fVar304 * fStack_56c;
            auVar83._20_4_ = fVar226;
            fVar228 = fVar295 * -fVar227 * fStack_568;
            auVar83._24_4_ = fVar228;
            auVar83._28_4_ = fVar207;
            auVar175 = vsubps_avx(auVar151,auVar81);
            auVar238._0_4_ = auVar256._0_4_ + fVar208;
            auVar238._4_4_ = auVar256._4_4_ + fVar221;
            auVar238._8_4_ = auVar256._8_4_ + fVar222;
            auVar238._12_4_ = auVar256._12_4_ + fVar223;
            auVar238._16_4_ = auVar256._16_4_ + fVar224;
            auVar238._20_4_ = auVar256._20_4_ + fVar226;
            auVar238._24_4_ = auVar256._24_4_ + fVar228;
            auVar238._28_4_ = auVar256._28_4_ + fVar207;
            fVar208 = fVar258 * 0.0 * (float)local_580._0_4_;
            fVar221 = fVar262 * 0.0 * (float)local_580._4_4_;
            auVar84._4_4_ = fVar221;
            auVar84._0_4_ = fVar208;
            fVar222 = fVar265 * 0.0 * fStack_578;
            auVar84._8_4_ = fVar222;
            fVar223 = fVar303 * 0.0 * fStack_574;
            auVar84._12_4_ = fVar223;
            fVar224 = fVar294 * 0.0 * fStack_570;
            auVar84._16_4_ = fVar224;
            fVar226 = fVar305 * 0.0 * fStack_56c;
            auVar84._20_4_ = fVar226;
            fVar228 = fVar295 * 0.0 * fStack_568;
            auVar84._24_4_ = fVar228;
            auVar84._28_4_ = auVar151._28_4_;
            auVar219 = vsubps_avx(auVar344,auVar82);
            auVar312._0_4_ = (float)local_740._0_4_ + fVar208;
            auVar312._4_4_ = (float)local_740._4_4_ + fVar221;
            auVar312._8_4_ = fStack_738 + fVar222;
            auVar312._12_4_ = fStack_734 + fVar223;
            auVar312._16_4_ = fStack_730 + fVar224;
            auVar312._20_4_ = fStack_72c + fVar226;
            auVar312._24_4_ = fStack_728 + fVar228;
            auVar312._28_4_ = fStack_724 + auVar151._28_4_;
            auVar322 = vsubps_avx(auVar256,auVar83);
            auVar24 = vsubps_avx(_local_740,auVar84);
            auVar360 = vsubps_avx(auVar238,auVar143);
            auVar25 = vsubps_avx(auVar312,auVar175);
            auVar85._4_4_ = auVar175._4_4_ * auVar360._4_4_;
            auVar85._0_4_ = auVar175._0_4_ * auVar360._0_4_;
            auVar85._8_4_ = auVar175._8_4_ * auVar360._8_4_;
            auVar85._12_4_ = auVar175._12_4_ * auVar360._12_4_;
            auVar85._16_4_ = auVar175._16_4_ * auVar360._16_4_;
            auVar85._20_4_ = auVar175._20_4_ * auVar360._20_4_;
            auVar85._24_4_ = auVar175._24_4_ * auVar360._24_4_;
            auVar85._28_4_ = auVar339._28_4_;
            auVar86._4_4_ = auVar143._4_4_ * auVar25._4_4_;
            auVar86._0_4_ = auVar143._0_4_ * auVar25._0_4_;
            auVar86._8_4_ = auVar143._8_4_ * auVar25._8_4_;
            auVar86._12_4_ = auVar143._12_4_ * auVar25._12_4_;
            auVar86._16_4_ = auVar143._16_4_ * auVar25._16_4_;
            auVar86._20_4_ = auVar143._20_4_ * auVar25._20_4_;
            auVar86._24_4_ = auVar143._24_4_ * auVar25._24_4_;
            auVar86._28_4_ = auVar256._28_4_;
            auVar28 = vsubps_avx(auVar86,auVar85);
            auVar87._4_4_ = auVar26._4_4_ * auVar25._4_4_;
            auVar87._0_4_ = auVar26._0_4_ * auVar25._0_4_;
            auVar87._8_4_ = auVar26._8_4_ * auVar25._8_4_;
            auVar87._12_4_ = auVar26._12_4_ * auVar25._12_4_;
            auVar87._16_4_ = auVar26._16_4_ * auVar25._16_4_;
            auVar87._20_4_ = auVar26._20_4_ * auVar25._20_4_;
            auVar87._24_4_ = auVar26._24_4_ * auVar25._24_4_;
            auVar87._28_4_ = auVar25._28_4_;
            auVar25 = vsubps_avx(auVar346,auVar26);
            auVar88._4_4_ = auVar175._4_4_ * auVar25._4_4_;
            auVar88._0_4_ = auVar175._0_4_ * auVar25._0_4_;
            auVar88._8_4_ = auVar175._8_4_ * auVar25._8_4_;
            auVar88._12_4_ = auVar175._12_4_ * auVar25._12_4_;
            auVar88._16_4_ = auVar175._16_4_ * auVar25._16_4_;
            auVar88._20_4_ = auVar175._20_4_ * auVar25._20_4_;
            auVar88._24_4_ = auVar175._24_4_ * auVar25._24_4_;
            auVar88._28_4_ = auVar23._28_4_;
            auVar29 = vsubps_avx(auVar88,auVar87);
            auVar89._4_4_ = auVar143._4_4_ * auVar25._4_4_;
            auVar89._0_4_ = auVar143._0_4_ * auVar25._0_4_;
            auVar89._8_4_ = auVar143._8_4_ * auVar25._8_4_;
            auVar89._12_4_ = auVar143._12_4_ * auVar25._12_4_;
            auVar89._16_4_ = auVar143._16_4_ * auVar25._16_4_;
            auVar89._20_4_ = auVar143._20_4_ * auVar25._20_4_;
            auVar89._24_4_ = auVar143._24_4_ * auVar25._24_4_;
            auVar89._28_4_ = auVar23._28_4_;
            auVar90._4_4_ = auVar26._4_4_ * auVar360._4_4_;
            auVar90._0_4_ = auVar26._0_4_ * auVar360._0_4_;
            auVar90._8_4_ = auVar26._8_4_ * auVar360._8_4_;
            auVar90._12_4_ = auVar26._12_4_ * auVar360._12_4_;
            auVar90._16_4_ = auVar26._16_4_ * auVar360._16_4_;
            auVar90._20_4_ = auVar26._20_4_ * auVar360._20_4_;
            auVar90._24_4_ = auVar26._24_4_ * auVar360._24_4_;
            auVar90._28_4_ = auVar360._28_4_;
            auVar23 = vsubps_avx(auVar90,auVar89);
            auVar181._0_4_ = auVar28._0_4_ * 0.0 + auVar23._0_4_ + auVar29._0_4_ * 0.0;
            auVar181._4_4_ = auVar28._4_4_ * 0.0 + auVar23._4_4_ + auVar29._4_4_ * 0.0;
            auVar181._8_4_ = auVar28._8_4_ * 0.0 + auVar23._8_4_ + auVar29._8_4_ * 0.0;
            auVar181._12_4_ = auVar28._12_4_ * 0.0 + auVar23._12_4_ + auVar29._12_4_ * 0.0;
            auVar181._16_4_ = auVar28._16_4_ * 0.0 + auVar23._16_4_ + auVar29._16_4_ * 0.0;
            auVar181._20_4_ = auVar28._20_4_ * 0.0 + auVar23._20_4_ + auVar29._20_4_ * 0.0;
            auVar181._24_4_ = auVar28._24_4_ * 0.0 + auVar23._24_4_ + auVar29._24_4_ * 0.0;
            auVar181._28_4_ = auVar28._28_4_ + auVar23._28_4_ + auVar29._28_4_;
            auVar142 = vcmpps_avx(auVar181,ZEXT832(0) << 0x20,2);
            auVar219 = vblendvps_avx(auVar219,_local_6e0,auVar142);
            auVar23 = vblendvps_avx(auVar322,_local_600,auVar142);
            auVar322 = vblendvps_avx(auVar24,auVar359,auVar142);
            auVar24 = vblendvps_avx(auVar26,auVar346,auVar142);
            auVar360 = vblendvps_avx(auVar143,auVar238,auVar142);
            auVar25 = vblendvps_avx(auVar175,auVar312,auVar142);
            auVar26 = vblendvps_avx(auVar346,auVar26,auVar142);
            auVar28 = vblendvps_avx(auVar238,auVar143,auVar142);
            auVar29 = vblendvps_avx(auVar312,auVar175,auVar142);
            _local_780 = vandps_avx(auVar154,auVar205);
            auVar26 = vsubps_avx(auVar26,auVar219);
            auVar176 = vsubps_avx(auVar28,auVar23);
            auVar29 = vsubps_avx(auVar29,auVar322);
            auVar177 = vsubps_avx(auVar23,auVar360);
            fVar208 = auVar176._0_4_;
            fVar190 = auVar322._0_4_;
            fVar230 = auVar176._4_4_;
            fVar191 = auVar322._4_4_;
            auVar91._4_4_ = fVar191 * fVar230;
            auVar91._0_4_ = fVar190 * fVar208;
            fVar248 = auVar176._8_4_;
            fVar231 = auVar322._8_4_;
            auVar91._8_4_ = fVar231 * fVar248;
            fVar303 = auVar176._12_4_;
            fVar240 = auVar322._12_4_;
            auVar91._12_4_ = fVar240 * fVar303;
            fVar168 = auVar176._16_4_;
            fVar242 = auVar322._16_4_;
            auVar91._16_4_ = fVar242 * fVar168;
            fVar160 = auVar176._20_4_;
            fVar244 = auVar322._20_4_;
            auVar91._20_4_ = fVar244 * fVar160;
            fVar349 = auVar176._24_4_;
            fVar249 = auVar322._24_4_;
            auVar91._24_4_ = fVar249 * fVar349;
            auVar91._28_4_ = auVar28._28_4_;
            fVar221 = auVar23._0_4_;
            fVar259 = auVar29._0_4_;
            fVar239 = auVar23._4_4_;
            fVar261 = auVar29._4_4_;
            auVar92._4_4_ = fVar261 * fVar239;
            auVar92._0_4_ = fVar259 * fVar221;
            fVar258 = auVar23._8_4_;
            fVar263 = auVar29._8_4_;
            auVar92._8_4_ = fVar263 * fVar258;
            fVar225 = auVar23._12_4_;
            fVar267 = auVar29._12_4_;
            auVar92._12_4_ = fVar267 * fVar225;
            fVar280 = auVar23._16_4_;
            fVar277 = auVar29._16_4_;
            auVar92._16_4_ = fVar277 * fVar280;
            fVar162 = auVar23._20_4_;
            fVar278 = auVar29._20_4_;
            auVar92._20_4_ = fVar278 * fVar162;
            fVar169 = auVar23._24_4_;
            fVar279 = auVar29._24_4_;
            uVar8 = auVar143._28_4_;
            auVar92._24_4_ = fVar279 * fVar169;
            auVar92._28_4_ = uVar8;
            auVar28 = vsubps_avx(auVar92,auVar91);
            fVar222 = auVar219._0_4_;
            fVar241 = auVar219._4_4_;
            auVar93._4_4_ = fVar261 * fVar241;
            auVar93._0_4_ = fVar259 * fVar222;
            fVar260 = auVar219._8_4_;
            auVar93._8_4_ = fVar263 * fVar260;
            fVar294 = auVar219._12_4_;
            auVar93._12_4_ = fVar267 * fVar294;
            fVar229 = auVar219._16_4_;
            auVar93._16_4_ = fVar277 * fVar229;
            fVar164 = auVar219._20_4_;
            auVar93._20_4_ = fVar278 * fVar164;
            fVar185 = auVar219._24_4_;
            auVar93._24_4_ = fVar279 * fVar185;
            auVar93._28_4_ = uVar8;
            fVar223 = auVar26._0_4_;
            fVar243 = auVar26._4_4_;
            auVar94._4_4_ = fVar191 * fVar243;
            auVar94._0_4_ = fVar190 * fVar223;
            fVar262 = auVar26._8_4_;
            auVar94._8_4_ = fVar231 * fVar262;
            fVar304 = auVar26._12_4_;
            auVar94._12_4_ = fVar240 * fVar304;
            fVar331 = auVar26._16_4_;
            auVar94._16_4_ = fVar242 * fVar331;
            fVar166 = auVar26._20_4_;
            auVar94._20_4_ = fVar244 * fVar166;
            fVar186 = auVar26._24_4_;
            auVar94._24_4_ = fVar249 * fVar186;
            auVar94._28_4_ = auVar346._28_4_;
            auVar143 = vsubps_avx(auVar94,auVar93);
            auVar95._4_4_ = fVar239 * fVar243;
            auVar95._0_4_ = fVar221 * fVar223;
            auVar95._8_4_ = fVar258 * fVar262;
            auVar95._12_4_ = fVar225 * fVar304;
            auVar95._16_4_ = fVar280 * fVar331;
            auVar95._20_4_ = fVar162 * fVar166;
            auVar95._24_4_ = fVar169 * fVar186;
            auVar95._28_4_ = uVar8;
            auVar96._4_4_ = fVar241 * fVar230;
            auVar96._0_4_ = fVar222 * fVar208;
            auVar96._8_4_ = fVar260 * fVar248;
            auVar96._12_4_ = fVar294 * fVar303;
            auVar96._16_4_ = fVar229 * fVar168;
            auVar96._20_4_ = fVar164 * fVar160;
            auVar96._24_4_ = fVar185 * fVar349;
            auVar96._28_4_ = auVar175._28_4_;
            auVar175 = vsubps_avx(auVar96,auVar95);
            auVar322 = vsubps_avx(auVar322,auVar25);
            fVar226 = auVar175._28_4_ + auVar143._28_4_;
            auVar324._0_4_ = auVar175._0_4_ + auVar143._0_4_ * 0.0 + auVar28._0_4_ * 0.0;
            auVar324._4_4_ = auVar175._4_4_ + auVar143._4_4_ * 0.0 + auVar28._4_4_ * 0.0;
            auVar324._8_4_ = auVar175._8_4_ + auVar143._8_4_ * 0.0 + auVar28._8_4_ * 0.0;
            auVar324._12_4_ = auVar175._12_4_ + auVar143._12_4_ * 0.0 + auVar28._12_4_ * 0.0;
            auVar324._16_4_ = auVar175._16_4_ + auVar143._16_4_ * 0.0 + auVar28._16_4_ * 0.0;
            auVar324._20_4_ = auVar175._20_4_ + auVar143._20_4_ * 0.0 + auVar28._20_4_ * 0.0;
            auVar324._24_4_ = auVar175._24_4_ + auVar143._24_4_ * 0.0 + auVar28._24_4_ * 0.0;
            auVar324._28_4_ = fVar226 + auVar28._28_4_;
            fVar224 = auVar177._0_4_;
            fVar245 = auVar177._4_4_;
            auVar97._4_4_ = auVar25._4_4_ * fVar245;
            auVar97._0_4_ = auVar25._0_4_ * fVar224;
            fVar264 = auVar177._8_4_;
            auVar97._8_4_ = auVar25._8_4_ * fVar264;
            fVar305 = auVar177._12_4_;
            auVar97._12_4_ = auVar25._12_4_ * fVar305;
            fVar138 = auVar177._16_4_;
            auVar97._16_4_ = auVar25._16_4_ * fVar138;
            fVar341 = auVar177._20_4_;
            auVar97._20_4_ = auVar25._20_4_ * fVar341;
            fVar187 = auVar177._24_4_;
            auVar97._24_4_ = auVar25._24_4_ * fVar187;
            auVar97._28_4_ = fVar226;
            fVar226 = auVar322._0_4_;
            fVar246 = auVar322._4_4_;
            auVar98._4_4_ = auVar360._4_4_ * fVar246;
            auVar98._0_4_ = auVar360._0_4_ * fVar226;
            fVar265 = auVar322._8_4_;
            auVar98._8_4_ = auVar360._8_4_ * fVar265;
            fVar227 = auVar322._12_4_;
            auVar98._12_4_ = auVar360._12_4_ * fVar227;
            fVar157 = auVar322._16_4_;
            auVar98._16_4_ = auVar360._16_4_ * fVar157;
            fVar347 = auVar322._20_4_;
            auVar98._20_4_ = auVar360._20_4_ * fVar347;
            fVar188 = auVar322._24_4_;
            auVar98._24_4_ = auVar360._24_4_ * fVar188;
            auVar98._28_4_ = auVar175._28_4_;
            auVar143 = vsubps_avx(auVar98,auVar97);
            auVar219 = vsubps_avx(auVar219,auVar24);
            fVar228 = auVar219._0_4_;
            fVar247 = auVar219._4_4_;
            auVar99._4_4_ = auVar25._4_4_ * fVar247;
            auVar99._0_4_ = auVar25._0_4_ * fVar228;
            fVar266 = auVar219._8_4_;
            auVar99._8_4_ = auVar25._8_4_ * fVar266;
            fVar295 = auVar219._12_4_;
            auVar99._12_4_ = auVar25._12_4_ * fVar295;
            fVar158 = auVar219._16_4_;
            auVar99._16_4_ = auVar25._16_4_ * fVar158;
            fVar348 = auVar219._20_4_;
            auVar99._20_4_ = auVar25._20_4_ * fVar348;
            fVar189 = auVar219._24_4_;
            auVar99._24_4_ = auVar25._24_4_ * fVar189;
            auVar99._28_4_ = auVar25._28_4_;
            auVar100._4_4_ = fVar246 * auVar24._4_4_;
            auVar100._0_4_ = fVar226 * auVar24._0_4_;
            auVar100._8_4_ = fVar265 * auVar24._8_4_;
            auVar100._12_4_ = fVar227 * auVar24._12_4_;
            auVar100._16_4_ = fVar157 * auVar24._16_4_;
            auVar100._20_4_ = fVar347 * auVar24._20_4_;
            auVar100._24_4_ = fVar188 * auVar24._24_4_;
            auVar100._28_4_ = auVar28._28_4_;
            auVar219 = vsubps_avx(auVar99,auVar100);
            auVar353 = ZEXT1264(ZEXT412(0)) << 0x20;
            auVar101._4_4_ = auVar360._4_4_ * fVar247;
            auVar101._0_4_ = auVar360._0_4_ * fVar228;
            auVar101._8_4_ = auVar360._8_4_ * fVar266;
            auVar101._12_4_ = auVar360._12_4_ * fVar295;
            auVar101._16_4_ = auVar360._16_4_ * fVar158;
            auVar101._20_4_ = auVar360._20_4_ * fVar348;
            auVar101._24_4_ = auVar360._24_4_ * fVar189;
            auVar101._28_4_ = auVar360._28_4_;
            auVar102._4_4_ = fVar245 * auVar24._4_4_;
            auVar102._0_4_ = fVar224 * auVar24._0_4_;
            auVar102._8_4_ = fVar264 * auVar24._8_4_;
            auVar102._12_4_ = fVar305 * auVar24._12_4_;
            auVar102._16_4_ = fVar138 * auVar24._16_4_;
            auVar102._20_4_ = fVar341 * auVar24._20_4_;
            auVar102._24_4_ = fVar187 * auVar24._24_4_;
            auVar102._28_4_ = auVar24._28_4_;
            auVar24 = vsubps_avx(auVar102,auVar101);
            auVar360 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar152._0_4_ = auVar143._0_4_ * 0.0 + auVar24._0_4_ + auVar219._0_4_ * 0.0;
            auVar152._4_4_ = auVar143._4_4_ * 0.0 + auVar24._4_4_ + auVar219._4_4_ * 0.0;
            auVar152._8_4_ = auVar143._8_4_ * 0.0 + auVar24._8_4_ + auVar219._8_4_ * 0.0;
            auVar152._12_4_ = auVar143._12_4_ * 0.0 + auVar24._12_4_ + auVar219._12_4_ * 0.0;
            auVar152._16_4_ = auVar143._16_4_ * 0.0 + auVar24._16_4_ + auVar219._16_4_ * 0.0;
            auVar152._20_4_ = auVar143._20_4_ * 0.0 + auVar24._20_4_ + auVar219._20_4_ * 0.0;
            auVar152._24_4_ = auVar143._24_4_ * 0.0 + auVar24._24_4_ + auVar219._24_4_ * 0.0;
            auVar152._28_4_ = auVar219._28_4_ + auVar24._28_4_ + auVar219._28_4_;
            auVar156 = ZEXT3264(auVar152);
            auVar219 = vmaxps_avx(auVar324,auVar152);
            auVar219 = vcmpps_avx(auVar219,auVar360,2);
            auVar24 = _local_780 & auVar219;
            if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar24 >> 0x7f,0) == '\0') &&
                  (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar24 >> 0xbf,0) == '\0') &&
                (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar24[0x1f]) {
LAB_010b6b4f:
              auVar220 = ZEXT3264(CONCAT824(local_5c0[1]._24_8_,
                                            CONCAT816(local_5c0[1]._16_8_,
                                                      CONCAT88(local_5c0[1]._8_8_,local_5c0[1]._0_8_
                                                              ))));
              auVar334._4_4_ = fVar206;
              auVar334._0_4_ = fVar139;
              auVar334._8_4_ = fVar159;
              auVar334._12_4_ = fVar161;
              auVar334._16_4_ = fVar163;
              auVar334._20_4_ = fVar165;
              auVar334._24_4_ = fVar167;
              auVar334._28_4_ = fVar207;
            }
            else {
              auVar24 = vandps_avx(auVar219,_local_780);
              auVar103._4_4_ = fVar246 * fVar230;
              auVar103._0_4_ = fVar226 * fVar208;
              auVar103._8_4_ = fVar265 * fVar248;
              auVar103._12_4_ = fVar227 * fVar303;
              auVar103._16_4_ = fVar157 * fVar168;
              auVar103._20_4_ = fVar347 * fVar160;
              auVar103._24_4_ = fVar188 * fVar349;
              auVar103._28_4_ = local_780._28_4_;
              auVar104._4_4_ = fVar245 * fVar261;
              auVar104._0_4_ = fVar224 * fVar259;
              auVar104._8_4_ = fVar264 * fVar263;
              auVar104._12_4_ = fVar305 * fVar267;
              auVar104._16_4_ = fVar138 * fVar277;
              auVar104._20_4_ = fVar341 * fVar278;
              auVar104._24_4_ = fVar187 * fVar279;
              auVar104._28_4_ = auVar219._28_4_;
              auVar25 = vsubps_avx(auVar104,auVar103);
              auVar105._4_4_ = fVar247 * fVar261;
              auVar105._0_4_ = fVar228 * fVar259;
              auVar105._8_4_ = fVar266 * fVar263;
              auVar105._12_4_ = fVar295 * fVar267;
              auVar105._16_4_ = fVar158 * fVar277;
              auVar105._20_4_ = fVar348 * fVar278;
              auVar105._24_4_ = fVar189 * fVar279;
              auVar105._28_4_ = auVar29._28_4_;
              auVar106._4_4_ = fVar246 * fVar243;
              auVar106._0_4_ = fVar226 * fVar223;
              auVar106._8_4_ = fVar265 * fVar262;
              auVar106._12_4_ = fVar227 * fVar304;
              auVar106._16_4_ = fVar157 * fVar331;
              auVar106._20_4_ = fVar347 * fVar166;
              auVar106._24_4_ = fVar188 * fVar186;
              auVar106._28_4_ = auVar322._28_4_;
              auVar28 = vsubps_avx(auVar106,auVar105);
              auVar107._4_4_ = fVar245 * fVar243;
              auVar107._0_4_ = fVar224 * fVar223;
              auVar107._8_4_ = fVar264 * fVar262;
              auVar107._12_4_ = fVar305 * fVar304;
              auVar107._16_4_ = fVar138 * fVar331;
              auVar107._20_4_ = fVar341 * fVar166;
              auVar107._24_4_ = fVar187 * fVar186;
              auVar107._28_4_ = auVar26._28_4_;
              auVar108._4_4_ = fVar247 * fVar230;
              auVar108._0_4_ = fVar228 * fVar208;
              auVar108._8_4_ = fVar266 * fVar248;
              auVar108._12_4_ = fVar295 * fVar303;
              auVar108._16_4_ = fVar158 * fVar168;
              auVar108._20_4_ = fVar348 * fVar160;
              auVar108._24_4_ = fVar189 * fVar349;
              auVar108._28_4_ = auVar176._28_4_;
              auVar29 = vsubps_avx(auVar108,auVar107);
              auVar301._0_4_ = auVar25._0_4_ * 0.0 + auVar29._0_4_ + auVar28._0_4_ * 0.0;
              auVar301._4_4_ = auVar25._4_4_ * 0.0 + auVar29._4_4_ + auVar28._4_4_ * 0.0;
              auVar301._8_4_ = auVar25._8_4_ * 0.0 + auVar29._8_4_ + auVar28._8_4_ * 0.0;
              auVar301._12_4_ = auVar25._12_4_ * 0.0 + auVar29._12_4_ + auVar28._12_4_ * 0.0;
              auVar301._16_4_ = auVar25._16_4_ * 0.0 + auVar29._16_4_ + auVar28._16_4_ * 0.0;
              auVar301._20_4_ = auVar25._20_4_ * 0.0 + auVar29._20_4_ + auVar28._20_4_ * 0.0;
              auVar301._24_4_ = auVar25._24_4_ * 0.0 + auVar29._24_4_ + auVar28._24_4_ * 0.0;
              auVar301._28_4_ = auVar177._28_4_ + auVar29._28_4_ + auVar26._28_4_;
              auVar219 = vrcpps_avx(auVar301);
              fVar208 = auVar219._0_4_;
              fVar223 = auVar219._4_4_;
              auVar109._4_4_ = auVar301._4_4_ * fVar223;
              auVar109._0_4_ = auVar301._0_4_ * fVar208;
              fVar224 = auVar219._8_4_;
              auVar109._8_4_ = auVar301._8_4_ * fVar224;
              fVar226 = auVar219._12_4_;
              auVar109._12_4_ = auVar301._12_4_ * fVar226;
              fVar228 = auVar219._16_4_;
              auVar109._16_4_ = auVar301._16_4_ * fVar228;
              fVar230 = auVar219._20_4_;
              auVar109._20_4_ = auVar301._20_4_ * fVar230;
              fVar243 = auVar219._24_4_;
              auVar109._24_4_ = auVar301._24_4_ * fVar243;
              auVar109._28_4_ = auVar322._28_4_;
              auVar340._8_4_ = 0x3f800000;
              auVar340._0_8_ = 0x3f8000003f800000;
              auVar340._12_4_ = 0x3f800000;
              auVar340._16_4_ = 0x3f800000;
              auVar340._20_4_ = 0x3f800000;
              auVar340._24_4_ = 0x3f800000;
              auVar340._28_4_ = 0x3f800000;
              auVar219 = vsubps_avx(auVar340,auVar109);
              fVar208 = auVar219._0_4_ * fVar208 + fVar208;
              fVar223 = auVar219._4_4_ * fVar223 + fVar223;
              fVar224 = auVar219._8_4_ * fVar224 + fVar224;
              fVar226 = auVar219._12_4_ * fVar226 + fVar226;
              fVar228 = auVar219._16_4_ * fVar228 + fVar228;
              fVar230 = auVar219._20_4_ * fVar230 + fVar230;
              fVar243 = auVar219._24_4_ * fVar243 + fVar243;
              auVar110._4_4_ =
                   (fVar241 * auVar25._4_4_ + auVar28._4_4_ * fVar239 + fVar191 * auVar29._4_4_) *
                   fVar223;
              auVar110._0_4_ =
                   (fVar222 * auVar25._0_4_ + auVar28._0_4_ * fVar221 + fVar190 * auVar29._0_4_) *
                   fVar208;
              auVar110._8_4_ =
                   (fVar260 * auVar25._8_4_ + auVar28._8_4_ * fVar258 + fVar231 * auVar29._8_4_) *
                   fVar224;
              auVar110._12_4_ =
                   (fVar294 * auVar25._12_4_ + auVar28._12_4_ * fVar225 + fVar240 * auVar29._12_4_)
                   * fVar226;
              auVar110._16_4_ =
                   (fVar229 * auVar25._16_4_ + auVar28._16_4_ * fVar280 + fVar242 * auVar29._16_4_)
                   * fVar228;
              auVar110._20_4_ =
                   (fVar164 * auVar25._20_4_ + auVar28._20_4_ * fVar162 + fVar244 * auVar29._20_4_)
                   * fVar230;
              auVar110._24_4_ =
                   (fVar185 * auVar25._24_4_ + auVar28._24_4_ * fVar169 + fVar249 * auVar29._24_4_)
                   * fVar243;
              auVar110._28_4_ = auVar23._28_4_ + auVar29._28_4_;
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar218._4_4_ = uVar8;
              auVar218._0_4_ = uVar8;
              auVar218._8_4_ = uVar8;
              auVar218._12_4_ = uVar8;
              auVar218._16_4_ = uVar8;
              auVar218._20_4_ = uVar8;
              auVar218._24_4_ = uVar8;
              auVar218._28_4_ = uVar8;
              auVar23 = vcmpps_avx(local_100,auVar110,2);
              auVar219 = vcmpps_avx(auVar110,auVar218,2);
              auVar219 = vandps_avx(auVar23,auVar219);
              auVar322 = auVar24 & auVar219;
              if ((((((((auVar322 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar322 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar322 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar322 >> 0x7f,0) == '\0') &&
                    (auVar322 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar322 >> 0xbf,0) == '\0') &&
                  (auVar322 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar322[0x1f]) goto LAB_010b6b4f;
              auVar219 = vandps_avx(auVar24,auVar219);
              auVar322 = vcmpps_avx(auVar301,auVar360,4);
              auVar24 = auVar219 & auVar322;
              auVar220 = ZEXT3264(CONCAT824(local_5c0[1]._24_8_,
                                            CONCAT816(local_5c0[1]._16_8_,
                                                      CONCAT88(local_5c0[1]._8_8_,local_5c0[1]._0_8_
                                                              ))));
              auVar334._4_4_ = fVar206;
              auVar334._0_4_ = fVar139;
              auVar334._8_4_ = fVar159;
              auVar334._12_4_ = fVar161;
              auVar334._16_4_ = fVar163;
              auVar334._20_4_ = fVar165;
              auVar334._24_4_ = fVar167;
              auVar334._28_4_ = fVar207;
              if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar24 >> 0x7f,0) != '\0') ||
                    (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar24 >> 0xbf,0) != '\0') ||
                  (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar24[0x1f] < '\0') {
                auVar219 = vandps_avx(auVar322,auVar219);
                auVar220 = ZEXT3264(auVar219);
                auVar111._4_4_ = auVar324._4_4_ * fVar223;
                auVar111._0_4_ = auVar324._0_4_ * fVar208;
                auVar111._8_4_ = auVar324._8_4_ * fVar224;
                auVar111._12_4_ = auVar324._12_4_ * fVar226;
                auVar111._16_4_ = auVar324._16_4_ * fVar228;
                auVar111._20_4_ = auVar324._20_4_ * fVar230;
                auVar111._24_4_ = auVar324._24_4_ * fVar243;
                auVar111._28_4_ = auVar23._28_4_;
                auVar112._4_4_ = auVar152._4_4_ * fVar223;
                auVar112._0_4_ = auVar152._0_4_ * fVar208;
                auVar112._8_4_ = auVar152._8_4_ * fVar224;
                auVar112._12_4_ = auVar152._12_4_ * fVar226;
                auVar112._16_4_ = auVar152._16_4_ * fVar228;
                auVar112._20_4_ = auVar152._20_4_ * fVar230;
                auVar112._24_4_ = auVar152._24_4_ * fVar243;
                auVar112._28_4_ = auVar152._28_4_;
                auVar276._8_4_ = 0x3f800000;
                auVar276._0_8_ = 0x3f8000003f800000;
                auVar276._12_4_ = 0x3f800000;
                auVar276._16_4_ = 0x3f800000;
                auVar276._20_4_ = 0x3f800000;
                auVar276._24_4_ = 0x3f800000;
                auVar276._28_4_ = 0x3f800000;
                auVar219 = vsubps_avx(auVar276,auVar111);
                _local_e0 = vblendvps_avx(auVar219,auVar111,auVar142);
                auVar219 = vsubps_avx(auVar276,auVar112);
                _local_3a0 = vblendvps_avx(auVar219,auVar112,auVar142);
                auVar156 = ZEXT3264(_local_3a0);
                local_520 = auVar110;
              }
            }
            auVar302 = ZEXT1664(auVar27);
            auVar219 = auVar220._0_32_;
            auVar325 = ZEXT3264(_local_540);
            fVar208 = (float)local_680._0_4_;
            fVar221 = (float)local_680._4_4_;
            fVar223 = fStack_678;
            fVar228 = fStack_674;
            fVar230 = fStack_670;
            fVar239 = fStack_66c;
            fVar241 = fStack_668;
            if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar219 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar219 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar219 >> 0x7f,0) != '\0') ||
                  (auVar220 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar219 >> 0xbf,0) != '\0') ||
                (auVar220 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar220[0x1f] < '\0') {
              auVar23 = vsubps_avx(_local_580,auVar334);
              fVar224 = auVar334._0_4_ + auVar23._0_4_ * (float)local_e0._0_4_;
              fVar226 = auVar334._4_4_ + auVar23._4_4_ * (float)local_e0._4_4_;
              fVar243 = auVar334._8_4_ + auVar23._8_4_ * fStack_d8;
              fVar245 = auVar334._12_4_ + auVar23._12_4_ * fStack_d4;
              fVar246 = auVar334._16_4_ + auVar23._16_4_ * fStack_d0;
              fVar247 = auVar334._20_4_ + auVar23._20_4_ * fStack_cc;
              fVar248 = auVar334._24_4_ + auVar23._24_4_ * fStack_c8;
              fVar258 = auVar334._28_4_ + auVar23._28_4_;
              fVar222 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
              auVar113._4_4_ = (fVar226 + fVar226) * fVar222;
              auVar113._0_4_ = (fVar224 + fVar224) * fVar222;
              auVar113._8_4_ = (fVar243 + fVar243) * fVar222;
              auVar113._12_4_ = (fVar245 + fVar245) * fVar222;
              auVar113._16_4_ = (fVar246 + fVar246) * fVar222;
              auVar113._20_4_ = (fVar247 + fVar247) * fVar222;
              auVar113._24_4_ = (fVar248 + fVar248) * fVar222;
              auVar113._28_4_ = fVar258 + fVar258;
              auVar23 = vcmpps_avx(local_520,auVar113,6);
              auVar156 = ZEXT3264(auVar23);
              auVar322 = auVar219 & auVar23;
              if ((((((((auVar322 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar322 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar322 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar322 >> 0x7f,0) != '\0') ||
                    (auVar322 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar322 >> 0xbf,0) != '\0') ||
                  (auVar322 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar322[0x1f] < '\0') {
                local_3a0._0_4_ = (float)local_3a0._0_4_ + (float)local_3a0._0_4_ + -1.0;
                local_3a0._4_4_ = (float)local_3a0._4_4_ + (float)local_3a0._4_4_ + -1.0;
                uStack_398._0_4_ = (float)uStack_398 + (float)uStack_398 + -1.0;
                uStack_398._4_4_ = uStack_398._4_4_ + uStack_398._4_4_ + -1.0;
                uStack_390._0_4_ = (float)uStack_390 + (float)uStack_390 + -1.0;
                uStack_390._4_4_ = uStack_390._4_4_ + uStack_390._4_4_ + -1.0;
                uStack_388._0_4_ = (float)uStack_388 + (float)uStack_388 + -1.0;
                uStack_388._4_4_ = uStack_388._4_4_ + uStack_388._4_4_ + -1.0;
                local_300 = _local_e0;
                auVar126 = _local_3a0;
                auVar322 = _local_3a0;
                local_2e0 = (float)local_3a0._0_4_;
                fStack_2dc = (float)local_3a0._4_4_;
                fStack_2d8 = (float)uStack_398;
                fStack_2d4 = uStack_398._4_4_;
                fStack_2d0 = (float)uStack_390;
                fStack_2cc = uStack_390._4_4_;
                fStack_2c8 = (float)uStack_388;
                fStack_2c4 = uStack_388._4_4_;
                local_2c0 = local_520;
                local_29c = uVar18;
                local_290 = auVar27;
                local_280 = uVar114;
                uStack_278 = uVar115;
                local_270 = uVar127;
                uStack_268 = uVar128;
                local_260 = uVar129;
                uStack_258 = uVar130;
                pGVar20 = (context->scene->geometries).items[uVar131].ptr;
                _local_3a0 = auVar322;
                if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  local_5c0[0] = vandps_avx(auVar23,auVar219);
                  auVar195._0_4_ = (float)(int)local_2a0;
                  auVar195._4_8_ = SUB128(ZEXT812(0),4);
                  auVar195._12_4_ = 0;
                  auVar233 = vshufps_avx(auVar195,auVar195,0);
                  local_220[0] = (auVar233._0_4_ + (float)local_e0._0_4_ + 0.0) *
                                 (float)local_120._0_4_;
                  local_220[1] = (auVar233._4_4_ + (float)local_e0._4_4_ + 1.0) *
                                 (float)local_120._4_4_;
                  local_220[2] = (auVar233._8_4_ + fStack_d8 + 2.0) * fStack_118;
                  local_220[3] = (auVar233._12_4_ + fStack_d4 + 3.0) * fStack_114;
                  fStack_210 = (auVar233._0_4_ + fStack_d0 + 4.0) * fStack_110;
                  fStack_20c = (auVar233._4_4_ + fStack_cc + 5.0) * fStack_10c;
                  fStack_208 = (auVar233._8_4_ + fStack_c8 + 6.0) * fStack_108;
                  fStack_204 = auVar233._12_4_ + fStack_c4 + 7.0;
                  uStack_390 = auVar126._16_8_;
                  uStack_388 = auVar322._24_8_;
                  local_200 = local_3a0;
                  uStack_1f8 = uStack_398;
                  uStack_1f0 = uStack_390;
                  uStack_1e8 = uStack_388;
                  local_1e0 = local_520;
                  auVar182._8_4_ = 0x7f800000;
                  auVar182._0_8_ = 0x7f8000007f800000;
                  auVar182._12_4_ = 0x7f800000;
                  auVar182._16_4_ = 0x7f800000;
                  auVar182._20_4_ = 0x7f800000;
                  auVar182._24_4_ = 0x7f800000;
                  auVar182._28_4_ = 0x7f800000;
                  auVar219 = vblendvps_avx(auVar182,local_520,local_5c0[0]);
                  auVar23 = vshufps_avx(auVar219,auVar219,0xb1);
                  auVar23 = vminps_avx(auVar219,auVar23);
                  auVar322 = vshufpd_avx(auVar23,auVar23,5);
                  auVar23 = vminps_avx(auVar23,auVar322);
                  auVar322 = vperm2f128_avx(auVar23,auVar23,1);
                  auVar23 = vminps_avx(auVar23,auVar322);
                  auVar23 = vcmpps_avx(auVar219,auVar23,0);
                  auVar322 = local_5c0[0] & auVar23;
                  auVar219 = local_5c0[0];
                  if ((((((((auVar322 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar322 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar322 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar322 >> 0x7f,0) != '\0') ||
                        (auVar322 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar322 >> 0xbf,0) != '\0') ||
                      (auVar322 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar322[0x1f] < '\0') {
                    auVar219 = vandps_avx(auVar23,local_5c0[0]);
                  }
                  uVar132 = vmovmskps_avx(auVar219);
                  uVar22 = 0;
                  if (uVar132 != 0) {
                    for (; (uVar132 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                    }
                  }
                  uVar134 = (ulong)uVar22;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar20->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    auStack_790 = auVar256._16_16_;
                    local_7a0 = *local_748;
                    local_6c0._16_16_ = auVar217._16_16_;
                    local_6c0._0_16_ = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                    _local_720 = auVar344;
                    _local_700 = auVar154;
                    _local_620 = auVar205;
                    _local_500 = auVar148;
                    while( true ) {
                      local_400 = local_220[uVar134];
                      local_780 = (undefined1  [8])uVar134;
                      local_3f0 = *(undefined4 *)((long)&local_200 + uVar134 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1e0 + uVar134 * 4)
                      ;
                      fVar221 = 1.0 - local_400;
                      fVar208 = local_400 * fVar221 + local_400 * fVar221;
                      auVar233 = ZEXT416((uint)(local_400 * local_400 * 3.0));
                      auVar233 = vshufps_avx(auVar233,auVar233,0);
                      auVar196 = ZEXT416((uint)((fVar208 - local_400 * local_400) * 3.0));
                      auVar196 = vshufps_avx(auVar196,auVar196,0);
                      auVar210 = ZEXT416((uint)((fVar221 * fVar221 - fVar208) * 3.0));
                      auVar210 = vshufps_avx(auVar210,auVar210,0);
                      local_7d0.context = context->user;
                      auVar198 = ZEXT416((uint)(fVar221 * fVar221 * -3.0));
                      auVar198 = vshufps_avx(auVar198,auVar198,0);
                      auVar199._0_4_ =
                           local_8a0 * auVar198._0_4_ +
                           auVar210._0_4_ * local_840 +
                           auVar233._0_4_ * local_860 + auVar196._0_4_ * local_850;
                      auVar199._4_4_ =
                           fStack_89c * auVar198._4_4_ +
                           auVar210._4_4_ * fStack_83c +
                           auVar233._4_4_ * fStack_85c + auVar196._4_4_ * fStack_84c;
                      auVar199._8_4_ =
                           fStack_898 * auVar198._8_4_ +
                           auVar210._8_4_ * fStack_838 +
                           auVar233._8_4_ * fStack_858 + auVar196._8_4_ * fStack_848;
                      auVar199._12_4_ =
                           fStack_894 * auVar198._12_4_ +
                           auVar210._12_4_ * fStack_834 +
                           auVar233._12_4_ * fStack_854 + auVar196._12_4_ * fStack_844;
                      auVar233 = vshufps_avx(auVar199,auVar199,0);
                      local_430[0] = (RTCHitN)auVar233[0];
                      local_430[1] = (RTCHitN)auVar233[1];
                      local_430[2] = (RTCHitN)auVar233[2];
                      local_430[3] = (RTCHitN)auVar233[3];
                      local_430[4] = (RTCHitN)auVar233[4];
                      local_430[5] = (RTCHitN)auVar233[5];
                      local_430[6] = (RTCHitN)auVar233[6];
                      local_430[7] = (RTCHitN)auVar233[7];
                      local_430[8] = (RTCHitN)auVar233[8];
                      local_430[9] = (RTCHitN)auVar233[9];
                      local_430[10] = (RTCHitN)auVar233[10];
                      local_430[0xb] = (RTCHitN)auVar233[0xb];
                      local_430[0xc] = (RTCHitN)auVar233[0xc];
                      local_430[0xd] = (RTCHitN)auVar233[0xd];
                      local_430[0xe] = (RTCHitN)auVar233[0xe];
                      local_430[0xf] = (RTCHitN)auVar233[0xf];
                      auVar233 = vshufps_avx(auVar199,auVar199,0x55);
                      local_420 = auVar233;
                      local_410 = vshufps_avx(auVar199,auVar199,0xaa);
                      fStack_3fc = local_400;
                      fStack_3f8 = local_400;
                      fStack_3f4 = local_400;
                      uStack_3ec = local_3f0;
                      uStack_3e8 = local_3f0;
                      uStack_3e4 = local_3f0;
                      local_3e0 = local_320._0_8_;
                      uStack_3d8 = local_320._8_8_;
                      local_3d0 = local_310._0_8_;
                      uStack_3c8 = local_310._8_8_;
                      vcmpps_avx(auVar353._0_32_,auVar353._0_32_,0xf);
                      uStack_3bc = (local_7d0.context)->instID[0];
                      local_3c0 = uStack_3bc;
                      uStack_3b8 = uStack_3bc;
                      uStack_3b4 = uStack_3bc;
                      uStack_3b0 = (local_7d0.context)->instPrimID[0];
                      uStack_3ac = uStack_3b0;
                      uStack_3a8 = uStack_3b0;
                      uStack_3a4 = uStack_3b0;
                      local_830 = local_7a0;
                      local_7d0.valid = (int *)local_830;
                      local_7d0.geometryUserPtr = pGVar20->userPtr;
                      local_7d0.hit = local_430;
                      local_7d0.N = 4;
                      local_7d0.ray = (RTCRayN *)ray;
                      if (pGVar20->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar20->intersectionFilterN)(&local_7d0);
                        auVar353 = ZEXT1664(ZEXT816(0) << 0x40);
                      }
                      if (local_830 == (undefined1  [16])0x0) {
                        auVar233 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                        auVar233 = auVar233 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var21 = context->args->filter;
                        if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var21)(&local_7d0);
                          auVar353 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        auVar196 = vpcmpeqd_avx(local_830,_DAT_01f7aa10);
                        auVar210 = vpcmpeqd_avx(auVar233,auVar233);
                        auVar233 = auVar196 ^ auVar210;
                        if (local_830 != (undefined1  [16])0x0) {
                          auVar196 = auVar196 ^ auVar210;
                          auVar210 = vmaskmovps_avx(auVar196,*(undefined1 (*) [16])local_7d0.hit);
                          *(undefined1 (*) [16])(local_7d0.ray + 0xc0) = auVar210;
                          auVar210 = vmaskmovps_avx(auVar196,*(undefined1 (*) [16])
                                                              (local_7d0.hit + 0x10));
                          *(undefined1 (*) [16])(local_7d0.ray + 0xd0) = auVar210;
                          auVar210 = vmaskmovps_avx(auVar196,*(undefined1 (*) [16])
                                                              (local_7d0.hit + 0x20));
                          *(undefined1 (*) [16])(local_7d0.ray + 0xe0) = auVar210;
                          auVar210 = vmaskmovps_avx(auVar196,*(undefined1 (*) [16])
                                                              (local_7d0.hit + 0x30));
                          *(undefined1 (*) [16])(local_7d0.ray + 0xf0) = auVar210;
                          auVar210 = vmaskmovps_avx(auVar196,*(undefined1 (*) [16])
                                                              (local_7d0.hit + 0x40));
                          *(undefined1 (*) [16])(local_7d0.ray + 0x100) = auVar210;
                          auVar210 = vmaskmovps_avx(auVar196,*(undefined1 (*) [16])
                                                              (local_7d0.hit + 0x50));
                          *(undefined1 (*) [16])(local_7d0.ray + 0x110) = auVar210;
                          auVar210 = vmaskmovps_avx(auVar196,*(undefined1 (*) [16])
                                                              (local_7d0.hit + 0x60));
                          *(undefined1 (*) [16])(local_7d0.ray + 0x120) = auVar210;
                          auVar210 = vmaskmovps_avx(auVar196,*(undefined1 (*) [16])
                                                              (local_7d0.hit + 0x70));
                          *(undefined1 (*) [16])(local_7d0.ray + 0x130) = auVar210;
                          auVar196 = vmaskmovps_avx(auVar196,*(undefined1 (*) [16])
                                                              (local_7d0.hit + 0x80));
                          *(undefined1 (*) [16])(local_7d0.ray + 0x140) = auVar196;
                        }
                      }
                      auVar217 = local_520;
                      auVar302 = ZEXT1664(auVar27);
                      auVar173._8_8_ = 0x100000001;
                      auVar173._0_8_ = 0x100000001;
                      if ((auVar173 & auVar233) == (undefined1  [16])0x0) {
                        *(int *)(ray + k * 4 + 0x80) = local_6c0._0_4_;
                        auVar233 = local_6c0._0_16_;
                      }
                      else {
                        auVar233 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                      }
                      *(undefined4 *)(local_5c0[0] + (long)local_780 * 4) = 0;
                      local_6c0._0_16_ = auVar233;
                      auVar233 = vshufps_avx(auVar233,auVar233,0);
                      auVar153._16_16_ = auVar233;
                      auVar153._0_16_ = auVar233;
                      auVar154 = vcmpps_avx(auVar217,auVar153,2);
                      auVar148 = vandps_avx(auVar154,local_5c0[0]);
                      local_5c0[0] = local_5c0[0] & auVar154;
                      prim = local_808;
                      pLVar135 = local_818;
                      pre = local_810;
                      auVar322 = _local_540;
                      if ((((((((local_5c0[0] >> 0x1f & (undefined1  [32])0x1) ==
                                (undefined1  [32])0x0 &&
                               (local_5c0[0] >> 0x3f & (undefined1  [32])0x1) ==
                               (undefined1  [32])0x0) &&
                              (local_5c0[0] >> 0x5f & (undefined1  [32])0x1) ==
                              (undefined1  [32])0x0) && SUB321(local_5c0[0] >> 0x7f,0) == '\0') &&
                            (local_5c0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                           && SUB321(local_5c0[0] >> 0xbf,0) == '\0') &&
                          (local_5c0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                          && -1 < local_5c0[0][0x1f]) break;
                      auVar183._8_4_ = 0x7f800000;
                      auVar183._0_8_ = 0x7f8000007f800000;
                      auVar183._12_4_ = 0x7f800000;
                      auVar183._16_4_ = 0x7f800000;
                      auVar183._20_4_ = 0x7f800000;
                      auVar183._24_4_ = 0x7f800000;
                      auVar183._28_4_ = 0x7f800000;
                      auVar154 = vblendvps_avx(auVar183,auVar217,auVar148);
                      auVar219 = vshufps_avx(auVar154,auVar154,0xb1);
                      auVar219 = vminps_avx(auVar154,auVar219);
                      auVar23 = vshufpd_avx(auVar219,auVar219,5);
                      auVar219 = vminps_avx(auVar219,auVar23);
                      auVar23 = vperm2f128_avx(auVar219,auVar219,1);
                      auVar219 = vminps_avx(auVar219,auVar23);
                      auVar219 = vcmpps_avx(auVar154,auVar219,0);
                      auVar23 = auVar148 & auVar219;
                      auVar154 = auVar148;
                      if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar23 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar23 >> 0x7f,0) != '\0') ||
                            (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar23 >> 0xbf,0) != '\0') ||
                          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar23[0x1f] < '\0') {
                        auVar154 = vandps_avx(auVar219,auVar148);
                      }
                      uVar132 = vmovmskps_avx(auVar154);
                      uVar22 = 0;
                      if (uVar132 != 0) {
                        for (; (uVar132 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                        }
                      }
                      uVar134 = (ulong)uVar22;
                      local_5c0[0] = auVar148;
                    }
                    goto LAB_010b61e8;
                  }
                  fVar222 = local_220[uVar134];
                  auVar156 = ZEXT464((uint)fVar222);
                  uVar8 = *(undefined4 *)((long)&local_200 + uVar134 * 4);
                  fVar226 = 1.0 - fVar222;
                  fVar224 = fVar222 * fVar226 + fVar222 * fVar226;
                  auVar233 = ZEXT416((uint)(fVar222 * fVar222 * 3.0));
                  auVar233 = vshufps_avx(auVar233,auVar233,0);
                  auVar196 = ZEXT416((uint)((fVar224 - fVar222 * fVar222) * 3.0));
                  auVar196 = vshufps_avx(auVar196,auVar196,0);
                  auVar210 = ZEXT416((uint)((fVar226 * fVar226 - fVar224) * 3.0));
                  auVar210 = vshufps_avx(auVar210,auVar210,0);
                  auVar198 = ZEXT416((uint)(fVar226 * fVar226 * -3.0));
                  auVar198 = vshufps_avx(auVar198,auVar198,0);
                  auVar197._0_4_ =
                       local_8a0 * auVar198._0_4_ +
                       auVar210._0_4_ * local_840 +
                       auVar233._0_4_ * local_860 + auVar196._0_4_ * local_850;
                  auVar197._4_4_ =
                       fStack_89c * auVar198._4_4_ +
                       auVar210._4_4_ * fStack_83c +
                       auVar233._4_4_ * fStack_85c + auVar196._4_4_ * fStack_84c;
                  auVar197._8_4_ =
                       fStack_898 * auVar198._8_4_ +
                       auVar210._8_4_ * fStack_838 +
                       auVar233._8_4_ * fStack_858 + auVar196._8_4_ * fStack_848;
                  auVar197._12_4_ =
                       fStack_894 * auVar198._12_4_ +
                       auVar210._12_4_ * fStack_834 +
                       auVar233._12_4_ * fStack_854 + auVar196._12_4_ * fStack_844;
                  auVar220 = ZEXT464(*(uint *)(local_1e0 + uVar134 * 4));
                  *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_1e0 + uVar134 * 4);
                  *(float *)(ray + k * 4 + 0xc0) = auVar197._0_4_;
                  uVar19 = vextractps_avx(auVar197,1);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar19;
                  uVar19 = vextractps_avx(auVar197,2);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar19;
                  *(float *)(ray + k * 4 + 0xf0) = fVar222;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar8;
                  *(uint *)(ray + k * 4 + 0x110) = uVar17;
                  *(uint *)(ray + k * 4 + 0x120) = uVar131;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
              }
            }
          }
          lVar136 = lVar136 + 8;
          auVar353 = ZEXT3264(local_640);
          auVar290 = ZEXT3264(_local_660);
          fVar341 = (float)local_6a0._0_4_;
          fVar347 = (float)local_6a0._4_4_;
          fVar348 = fStack_698;
          fVar349 = fStack_694;
          fVar222 = fStack_690;
          fVar224 = fStack_68c;
          fVar226 = fStack_688;
        } while ((int)lVar136 < (int)uVar18);
      }
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar149._4_4_ = uVar8;
      auVar149._0_4_ = uVar8;
      auVar149._8_4_ = uVar8;
      auVar149._12_4_ = uVar8;
      auVar149._16_4_ = uVar8;
      auVar149._20_4_ = uVar8;
      auVar149._24_4_ = uVar8;
      auVar149._28_4_ = uVar8;
      auVar148 = vcmpps_avx(local_80,auVar149,2);
      uVar131 = vmovmskps_avx(auVar148);
      uVar131 = (uint)uVar137 & uVar131;
    } while (uVar131 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }